

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx::CurveNiIntersector1<8>::
     occluded_t<embree::avx::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [28];
  float *pfVar2;
  undefined1 (*pauVar3) [28];
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined4 uVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Primitive PVar17;
  Geometry *pGVar18;
  __int_type_conflict _Var19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [28];
  undefined1 auVar121 [28];
  undefined1 auVar122 [28];
  undefined1 auVar123 [28];
  undefined1 auVar124 [28];
  undefined1 auVar125 [28];
  undefined1 auVar126 [24];
  uint uVar127;
  int iVar128;
  ulong uVar129;
  RTCIntersectArguments *pRVar130;
  long lVar131;
  ulong uVar132;
  RTCFilterFunctionN p_Var133;
  Geometry *geometry;
  float fVar170;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar169 [16];
  long lVar134;
  ulong uVar135;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar136;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar154;
  float fVar166;
  float fVar167;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar168;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  float fVar181;
  float fVar182;
  undefined1 auVar184 [16];
  float fVar183;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar196;
  float fVar198;
  float fVar202;
  float fVar205;
  float fVar208;
  undefined1 auVar189 [32];
  float fVar199;
  undefined1 auVar190 [32];
  float fVar211;
  undefined1 auVar191 [32];
  float fVar197;
  float fVar200;
  float fVar201;
  float fVar203;
  float fVar204;
  float fVar206;
  float fVar207;
  float fVar209;
  float fVar210;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [64];
  float fVar212;
  float fVar213;
  float fVar225;
  undefined1 auVar214 [16];
  float fVar221;
  float fVar223;
  float fVar227;
  float fVar228;
  float fVar229;
  undefined1 auVar215 [32];
  float fVar222;
  float fVar224;
  float fVar226;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  float fVar230;
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  float fVar231;
  float fVar242;
  float fVar244;
  undefined1 auVar233 [16];
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  undefined1 auVar236 [32];
  float fVar246;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar232;
  float fVar243;
  float fVar245;
  float fVar247;
  float fVar248;
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  float fVar264;
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar265;
  undefined1 auVar262 [32];
  undefined1 auVar263 [64];
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  float fVar285;
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [64];
  float fVar286;
  undefined1 auVar287 [16];
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar296;
  float fVar297;
  float fVar298;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  float fVar295;
  float fVar299;
  undefined1 auVar290 [32];
  float fVar300;
  float fVar301;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  float fVar315;
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  float fVar316;
  float fVar321;
  float fVar322;
  float fVar323;
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  float fVar328;
  float fVar329;
  float fVar330;
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [64];
  float fVar338;
  float in_register_0000151c;
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar339 [16];
  undefined1 auVar340 [32];
  float fVar343;
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  float in_register_0000159c;
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  float in_register_000015dc;
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  bool local_7f5;
  int local_7f4;
  RayQueryContext *local_7f0;
  Ray *local_7e8;
  undefined1 local_7e0 [8];
  undefined8 uStack_7d8;
  Precalculations *local_7c8;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  ulong local_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  undefined1 auStack_730 [8];
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  uint local_700;
  undefined4 uStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  RTCFilterFunctionNArguments local_6b0;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [8];
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [4];
  undefined1 auStack_65c [8];
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  undefined1 auStack_630 [8];
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 auStack_5d0 [8];
  float fStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined8 local_540;
  undefined4 local_538;
  float local_534;
  undefined4 local_530;
  undefined4 local_52c;
  undefined4 local_528;
  uint local_524;
  uint local_520;
  ulong local_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4d0 [16];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 auStack_450 [8];
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [8];
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  uint local_2a0;
  uint local_29c;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined1 local_240 [32];
  float local_220 [4];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  
  PVar17 = prim[1];
  uVar135 = (ulong)(byte)PVar17;
  lVar131 = uVar135 * 5;
  auVar174 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar135 * 0x19 + 6));
  fVar231 = *(float *)(prim + uVar135 * 0x19 + 0x12);
  auVar155._0_4_ = fVar231 * auVar174._0_4_;
  auVar155._4_4_ = fVar231 * auVar174._4_4_;
  auVar155._8_4_ = fVar231 * auVar174._8_4_;
  auVar155._12_4_ = fVar231 * auVar174._12_4_;
  auVar233._0_4_ = fVar231 * (ray->dir).field_0.m128[0];
  auVar233._4_4_ = fVar231 * (ray->dir).field_0.m128[1];
  auVar233._8_4_ = fVar231 * (ray->dir).field_0.m128[2];
  auVar233._12_4_ = fVar231 * (ray->dir).field_0.m128[3];
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 4 + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 4 + 10)));
  auVar139._16_16_ = auVar186;
  auVar139._0_16_ = auVar174;
  auVar139 = vcvtdq2ps_avx(auVar139);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar131 + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar131 + 10)));
  auVar176._16_16_ = auVar186;
  auVar176._0_16_ = auVar174;
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 6 + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 6 + 10)));
  auVar22 = vcvtdq2ps_avx(auVar176);
  auVar189._16_16_ = auVar186;
  auVar189._0_16_ = auVar174;
  auVar23 = vcvtdq2ps_avx(auVar189);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 0xb + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar135 * 0xb + 10)));
  auVar215._16_16_ = auVar186;
  auVar215._0_16_ = auVar174;
  uVar132 = (ulong)((uint)(byte)PVar17 * 0xc);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + 6)));
  auVar24 = vcvtdq2ps_avx(auVar215);
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + 10)));
  auVar255._16_16_ = auVar186;
  auVar255._0_16_ = auVar174;
  auVar25 = vcvtdq2ps_avx(auVar255);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + uVar135 + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + uVar135 + 10)));
  auVar266._16_16_ = auVar186;
  auVar266._0_16_ = auVar174;
  auVar26 = vcvtdq2ps_avx(auVar266);
  lVar134 = uVar135 * 9;
  uVar132 = (ulong)(uint)((int)lVar134 * 2);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + 10)));
  auVar288._16_16_ = auVar186;
  auVar288._0_16_ = auVar174;
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + uVar135 + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + uVar135 + 10)));
  auVar27 = vcvtdq2ps_avx(auVar288);
  auVar302._16_16_ = auVar186;
  auVar302._0_16_ = auVar174;
  auVar28 = vcvtdq2ps_avx(auVar302);
  uVar132 = (ulong)(uint)((int)lVar131 << 2);
  auVar174 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + 6)));
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar132 + 10)));
  auVar317._16_16_ = auVar186;
  auVar317._0_16_ = auVar174;
  auVar29 = vcvtdq2ps_avx(auVar317);
  auVar174 = vshufps_avx(auVar233,auVar233,0);
  auVar186 = vshufps_avx(auVar233,auVar233,0x55);
  auVar169 = vshufps_avx(auVar233,auVar233,0xaa);
  fVar231 = auVar169._0_4_;
  fVar242 = auVar169._4_4_;
  fVar244 = auVar169._8_4_;
  fVar246 = auVar169._12_4_;
  fVar249 = auVar186._0_4_;
  fVar251 = auVar186._4_4_;
  fVar252 = auVar186._8_4_;
  fVar182 = auVar186._12_4_;
  fVar196 = auVar174._0_4_;
  fVar198 = auVar174._4_4_;
  fVar199 = auVar174._8_4_;
  fVar202 = auVar174._12_4_;
  auVar331._0_4_ = fVar196 * auVar139._0_4_ + fVar249 * auVar22._0_4_ + fVar231 * auVar23._0_4_;
  auVar331._4_4_ = fVar198 * auVar139._4_4_ + fVar251 * auVar22._4_4_ + fVar242 * auVar23._4_4_;
  auVar331._8_4_ = fVar199 * auVar139._8_4_ + fVar252 * auVar22._8_4_ + fVar244 * auVar23._8_4_;
  auVar331._12_4_ = fVar202 * auVar139._12_4_ + fVar182 * auVar22._12_4_ + fVar246 * auVar23._12_4_;
  auVar331._16_4_ = fVar196 * auVar139._16_4_ + fVar249 * auVar22._16_4_ + fVar231 * auVar23._16_4_;
  auVar331._20_4_ = fVar198 * auVar139._20_4_ + fVar251 * auVar22._20_4_ + fVar242 * auVar23._20_4_;
  auVar331._24_4_ = fVar199 * auVar139._24_4_ + fVar252 * auVar22._24_4_ + fVar244 * auVar23._24_4_;
  auVar331._28_4_ = fVar182 + in_register_000015dc + in_register_0000151c;
  auVar324._0_4_ = fVar196 * auVar24._0_4_ + fVar249 * auVar25._0_4_ + fVar231 * auVar26._0_4_;
  auVar324._4_4_ = fVar198 * auVar24._4_4_ + fVar251 * auVar25._4_4_ + fVar242 * auVar26._4_4_;
  auVar324._8_4_ = fVar199 * auVar24._8_4_ + fVar252 * auVar25._8_4_ + fVar244 * auVar26._8_4_;
  auVar324._12_4_ = fVar202 * auVar24._12_4_ + fVar182 * auVar25._12_4_ + fVar246 * auVar26._12_4_;
  auVar324._16_4_ = fVar196 * auVar24._16_4_ + fVar249 * auVar25._16_4_ + fVar231 * auVar26._16_4_;
  auVar324._20_4_ = fVar198 * auVar24._20_4_ + fVar251 * auVar25._20_4_ + fVar242 * auVar26._20_4_;
  auVar324._24_4_ = fVar199 * auVar24._24_4_ + fVar252 * auVar25._24_4_ + fVar244 * auVar26._24_4_;
  auVar324._28_4_ = fVar182 + in_register_000015dc + in_register_0000159c;
  auVar236._0_4_ = fVar196 * auVar27._0_4_ + fVar249 * auVar28._0_4_ + auVar29._0_4_ * fVar231;
  auVar236._4_4_ = fVar198 * auVar27._4_4_ + fVar251 * auVar28._4_4_ + auVar29._4_4_ * fVar242;
  auVar236._8_4_ = fVar199 * auVar27._8_4_ + fVar252 * auVar28._8_4_ + auVar29._8_4_ * fVar244;
  auVar236._12_4_ = fVar202 * auVar27._12_4_ + fVar182 * auVar28._12_4_ + auVar29._12_4_ * fVar246;
  auVar236._16_4_ = fVar196 * auVar27._16_4_ + fVar249 * auVar28._16_4_ + auVar29._16_4_ * fVar231;
  auVar236._20_4_ = fVar198 * auVar27._20_4_ + fVar251 * auVar28._20_4_ + auVar29._20_4_ * fVar242;
  auVar236._24_4_ = fVar199 * auVar27._24_4_ + fVar252 * auVar28._24_4_ + auVar29._24_4_ * fVar244;
  auVar236._28_4_ = fVar202 + fVar182 + fVar246;
  auVar174 = vshufps_avx(auVar155,auVar155,0);
  auVar186 = vshufps_avx(auVar155,auVar155,0x55);
  auVar169 = vshufps_avx(auVar155,auVar155,0xaa);
  fVar242 = auVar169._0_4_;
  fVar244 = auVar169._4_4_;
  fVar246 = auVar169._8_4_;
  fVar249 = auVar169._12_4_;
  fVar198 = auVar186._0_4_;
  fVar199 = auVar186._4_4_;
  fVar202 = auVar186._8_4_;
  fVar205 = auVar186._12_4_;
  fVar251 = auVar174._0_4_;
  fVar252 = auVar174._4_4_;
  fVar182 = auVar174._8_4_;
  fVar196 = auVar174._12_4_;
  fVar231 = auVar139._28_4_;
  auVar256._0_4_ = fVar251 * auVar139._0_4_ + fVar198 * auVar22._0_4_ + fVar242 * auVar23._0_4_;
  auVar256._4_4_ = fVar252 * auVar139._4_4_ + fVar199 * auVar22._4_4_ + fVar244 * auVar23._4_4_;
  auVar256._8_4_ = fVar182 * auVar139._8_4_ + fVar202 * auVar22._8_4_ + fVar246 * auVar23._8_4_;
  auVar256._12_4_ = fVar196 * auVar139._12_4_ + fVar205 * auVar22._12_4_ + fVar249 * auVar23._12_4_;
  auVar256._16_4_ = fVar251 * auVar139._16_4_ + fVar198 * auVar22._16_4_ + fVar242 * auVar23._16_4_;
  auVar256._20_4_ = fVar252 * auVar139._20_4_ + fVar199 * auVar22._20_4_ + fVar244 * auVar23._20_4_;
  auVar256._24_4_ = fVar182 * auVar139._24_4_ + fVar202 * auVar22._24_4_ + fVar246 * auVar23._24_4_;
  auVar256._28_4_ = fVar231 + auVar22._28_4_ + auVar23._28_4_;
  auVar177._0_4_ = fVar251 * auVar24._0_4_ + fVar198 * auVar25._0_4_ + fVar242 * auVar26._0_4_;
  auVar177._4_4_ = fVar252 * auVar24._4_4_ + fVar199 * auVar25._4_4_ + fVar244 * auVar26._4_4_;
  auVar177._8_4_ = fVar182 * auVar24._8_4_ + fVar202 * auVar25._8_4_ + fVar246 * auVar26._8_4_;
  auVar177._12_4_ = fVar196 * auVar24._12_4_ + fVar205 * auVar25._12_4_ + fVar249 * auVar26._12_4_;
  auVar177._16_4_ = fVar251 * auVar24._16_4_ + fVar198 * auVar25._16_4_ + fVar242 * auVar26._16_4_;
  auVar177._20_4_ = fVar252 * auVar24._20_4_ + fVar199 * auVar25._20_4_ + fVar244 * auVar26._20_4_;
  auVar177._24_4_ = fVar182 * auVar24._24_4_ + fVar202 * auVar25._24_4_ + fVar246 * auVar26._24_4_;
  auVar177._28_4_ = fVar231 + auVar23._28_4_ + auVar26._28_4_;
  auVar140._0_4_ = fVar251 * auVar27._0_4_ + fVar198 * auVar28._0_4_ + auVar29._0_4_ * fVar242;
  auVar140._4_4_ = fVar252 * auVar27._4_4_ + fVar199 * auVar28._4_4_ + auVar29._4_4_ * fVar244;
  auVar140._8_4_ = fVar182 * auVar27._8_4_ + fVar202 * auVar28._8_4_ + auVar29._8_4_ * fVar246;
  auVar140._12_4_ = fVar196 * auVar27._12_4_ + fVar205 * auVar28._12_4_ + auVar29._12_4_ * fVar249;
  auVar140._16_4_ = fVar251 * auVar27._16_4_ + fVar198 * auVar28._16_4_ + auVar29._16_4_ * fVar242;
  auVar140._20_4_ = fVar252 * auVar27._20_4_ + fVar199 * auVar28._20_4_ + auVar29._20_4_ * fVar244;
  auVar140._24_4_ = fVar182 * auVar27._24_4_ + fVar202 * auVar28._24_4_ + auVar29._24_4_ * fVar246;
  auVar140._28_4_ = fVar231 + auVar25._28_4_ + fVar249;
  auVar267._8_4_ = 0x7fffffff;
  auVar267._0_8_ = 0x7fffffff7fffffff;
  auVar267._12_4_ = 0x7fffffff;
  auVar267._16_4_ = 0x7fffffff;
  auVar267._20_4_ = 0x7fffffff;
  auVar267._24_4_ = 0x7fffffff;
  auVar267._28_4_ = 0x7fffffff;
  auVar158._8_4_ = 0x219392ef;
  auVar158._0_8_ = 0x219392ef219392ef;
  auVar158._12_4_ = 0x219392ef;
  auVar158._16_4_ = 0x219392ef;
  auVar158._20_4_ = 0x219392ef;
  auVar158._24_4_ = 0x219392ef;
  auVar158._28_4_ = 0x219392ef;
  auVar139 = vandps_avx(auVar331,auVar267);
  auVar139 = vcmpps_avx(auVar139,auVar158,1);
  auVar22 = vblendvps_avx(auVar331,auVar158,auVar139);
  auVar139 = vandps_avx(auVar324,auVar267);
  auVar139 = vcmpps_avx(auVar139,auVar158,1);
  auVar23 = vblendvps_avx(auVar324,auVar158,auVar139);
  auVar139 = vandps_avx(auVar236,auVar267);
  auVar139 = vcmpps_avx(auVar139,auVar158,1);
  auVar139 = vblendvps_avx(auVar236,auVar158,auVar139);
  auVar24 = vrcpps_avx(auVar22);
  fVar231 = auVar24._0_4_;
  fVar242 = auVar24._4_4_;
  auVar25._4_4_ = auVar22._4_4_ * fVar242;
  auVar25._0_4_ = auVar22._0_4_ * fVar231;
  fVar244 = auVar24._8_4_;
  auVar25._8_4_ = auVar22._8_4_ * fVar244;
  fVar246 = auVar24._12_4_;
  auVar25._12_4_ = auVar22._12_4_ * fVar246;
  fVar249 = auVar24._16_4_;
  auVar25._16_4_ = auVar22._16_4_ * fVar249;
  fVar251 = auVar24._20_4_;
  auVar25._20_4_ = auVar22._20_4_ * fVar251;
  fVar252 = auVar24._24_4_;
  auVar25._24_4_ = auVar22._24_4_ * fVar252;
  auVar25._28_4_ = auVar22._28_4_;
  auVar268._8_4_ = 0x3f800000;
  auVar268._0_8_ = &DAT_3f8000003f800000;
  auVar268._12_4_ = 0x3f800000;
  auVar268._16_4_ = 0x3f800000;
  auVar268._20_4_ = 0x3f800000;
  auVar268._24_4_ = 0x3f800000;
  auVar268._28_4_ = 0x3f800000;
  auVar25 = vsubps_avx(auVar268,auVar25);
  fVar231 = fVar231 + fVar231 * auVar25._0_4_;
  fVar242 = fVar242 + fVar242 * auVar25._4_4_;
  fVar244 = fVar244 + fVar244 * auVar25._8_4_;
  fVar246 = fVar246 + fVar246 * auVar25._12_4_;
  fVar249 = fVar249 + fVar249 * auVar25._16_4_;
  fVar251 = fVar251 + fVar251 * auVar25._20_4_;
  fVar252 = fVar252 + fVar252 * auVar25._24_4_;
  auVar22 = vrcpps_avx(auVar23);
  fVar182 = auVar22._0_4_;
  fVar196 = auVar22._4_4_;
  auVar26._4_4_ = fVar196 * auVar23._4_4_;
  auVar26._0_4_ = fVar182 * auVar23._0_4_;
  fVar198 = auVar22._8_4_;
  auVar26._8_4_ = fVar198 * auVar23._8_4_;
  fVar199 = auVar22._12_4_;
  auVar26._12_4_ = fVar199 * auVar23._12_4_;
  fVar202 = auVar22._16_4_;
  auVar26._16_4_ = fVar202 * auVar23._16_4_;
  fVar205 = auVar22._20_4_;
  auVar26._20_4_ = fVar205 * auVar23._20_4_;
  fVar208 = auVar22._24_4_;
  auVar26._24_4_ = fVar208 * auVar23._24_4_;
  auVar26._28_4_ = auVar23._28_4_;
  auVar22 = vsubps_avx(auVar268,auVar26);
  fVar182 = fVar182 + fVar182 * auVar22._0_4_;
  fVar196 = fVar196 + fVar196 * auVar22._4_4_;
  fVar198 = fVar198 + fVar198 * auVar22._8_4_;
  fVar199 = fVar199 + fVar199 * auVar22._12_4_;
  fVar202 = fVar202 + fVar202 * auVar22._16_4_;
  fVar205 = fVar205 + fVar205 * auVar22._20_4_;
  fVar208 = fVar208 + fVar208 * auVar22._24_4_;
  auVar22 = vrcpps_avx(auVar139);
  fVar212 = auVar22._0_4_;
  fVar221 = auVar22._4_4_;
  auVar23._4_4_ = fVar221 * auVar139._4_4_;
  auVar23._0_4_ = fVar212 * auVar139._0_4_;
  fVar223 = auVar22._8_4_;
  auVar23._8_4_ = fVar223 * auVar139._8_4_;
  fVar225 = auVar22._12_4_;
  auVar23._12_4_ = fVar225 * auVar139._12_4_;
  fVar227 = auVar22._16_4_;
  auVar23._16_4_ = fVar227 * auVar139._16_4_;
  fVar228 = auVar22._20_4_;
  auVar23._20_4_ = fVar228 * auVar139._20_4_;
  fVar229 = auVar22._24_4_;
  auVar23._24_4_ = fVar229 * auVar139._24_4_;
  auVar23._28_4_ = auVar139._28_4_;
  auVar139 = vsubps_avx(auVar268,auVar23);
  auVar174._8_8_ = 0;
  auVar174._0_8_ = *(ulong *)(prim + uVar135 * 7 + 6);
  auVar174 = vpmovsxwd_avx(auVar174);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar135 * 7 + 0xe);
  auVar186 = vpmovsxwd_avx(auVar186);
  fVar212 = fVar212 + fVar212 * auVar139._0_4_;
  fVar221 = fVar221 + fVar221 * auVar139._4_4_;
  fVar223 = fVar223 + fVar223 * auVar139._8_4_;
  fVar225 = fVar225 + fVar225 * auVar139._12_4_;
  fVar227 = fVar227 + fVar227 * auVar139._16_4_;
  fVar228 = fVar228 + fVar228 * auVar139._20_4_;
  fVar229 = fVar229 + fVar229 * auVar139._24_4_;
  auVar159._16_16_ = auVar186;
  auVar159._0_16_ = auVar174;
  auVar139 = vcvtdq2ps_avx(auVar159);
  auVar139 = vsubps_avx(auVar139,auVar256);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + lVar134 + 6);
  auVar174 = vpmovsxwd_avx(auVar169);
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + lVar134 + 0xe);
  auVar186 = vpmovsxwd_avx(auVar187);
  auVar156._0_4_ = fVar231 * auVar139._0_4_;
  auVar156._4_4_ = fVar242 * auVar139._4_4_;
  auVar156._8_4_ = fVar244 * auVar139._8_4_;
  auVar156._12_4_ = fVar246 * auVar139._12_4_;
  auVar22._16_4_ = fVar249 * auVar139._16_4_;
  auVar22._0_16_ = auVar156;
  auVar22._20_4_ = fVar251 * auVar139._20_4_;
  auVar22._24_4_ = fVar252 * auVar139._24_4_;
  auVar22._28_4_ = auVar139._28_4_;
  auVar269._16_16_ = auVar186;
  auVar269._0_16_ = auVar174;
  auVar139 = vcvtdq2ps_avx(auVar269);
  auVar139 = vsubps_avx(auVar139,auVar256);
  lVar131 = (ulong)(byte)PVar17 * 0x10;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + lVar131 + 6);
  auVar174 = vpmovsxwd_avx(auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + lVar131 + 0xe);
  auVar186 = vpmovsxwd_avx(auVar10);
  lVar131 = lVar131 + uVar135 * -2;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + lVar131 + 6);
  auVar169 = vpmovsxwd_avx(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar131 + 0xe);
  auVar187 = vpmovsxwd_avx(auVar12);
  auVar234._0_4_ = fVar231 * auVar139._0_4_;
  auVar234._4_4_ = fVar242 * auVar139._4_4_;
  auVar234._8_4_ = fVar244 * auVar139._8_4_;
  auVar234._12_4_ = fVar246 * auVar139._12_4_;
  auVar27._16_4_ = fVar249 * auVar139._16_4_;
  auVar27._0_16_ = auVar234;
  auVar27._20_4_ = fVar251 * auVar139._20_4_;
  auVar27._24_4_ = fVar252 * auVar139._24_4_;
  auVar27._28_4_ = auVar24._28_4_ + auVar25._28_4_;
  auVar257._16_16_ = auVar187;
  auVar257._0_16_ = auVar169;
  auVar139 = vcvtdq2ps_avx(auVar257);
  auVar139 = vsubps_avx(auVar139,auVar177);
  auVar254._0_4_ = fVar182 * auVar139._0_4_;
  auVar254._4_4_ = fVar196 * auVar139._4_4_;
  auVar254._8_4_ = fVar198 * auVar139._8_4_;
  auVar254._12_4_ = fVar199 * auVar139._12_4_;
  auVar24._16_4_ = fVar202 * auVar139._16_4_;
  auVar24._0_16_ = auVar254;
  auVar24._20_4_ = fVar205 * auVar139._20_4_;
  auVar24._24_4_ = fVar208 * auVar139._24_4_;
  auVar24._28_4_ = auVar139._28_4_;
  auVar270._16_16_ = auVar186;
  auVar270._0_16_ = auVar174;
  auVar139 = vcvtdq2ps_avx(auVar270);
  auVar139 = vsubps_avx(auVar139,auVar177);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar132 + uVar135 + 6);
  auVar174 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar132 + uVar135 + 0xe);
  auVar186 = vpmovsxwd_avx(auVar14);
  auVar171._0_4_ = fVar182 * auVar139._0_4_;
  auVar171._4_4_ = fVar196 * auVar139._4_4_;
  auVar171._8_4_ = fVar198 * auVar139._8_4_;
  auVar171._12_4_ = fVar199 * auVar139._12_4_;
  auVar28._16_4_ = fVar202 * auVar139._16_4_;
  auVar28._0_16_ = auVar171;
  auVar28._20_4_ = fVar205 * auVar139._20_4_;
  auVar28._24_4_ = fVar208 * auVar139._24_4_;
  auVar28._28_4_ = auVar139._28_4_;
  auVar190._16_16_ = auVar186;
  auVar190._0_16_ = auVar174;
  auVar139 = vcvtdq2ps_avx(auVar190);
  auVar139 = vsubps_avx(auVar139,auVar140);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar135 * 0x17 + 6);
  auVar174 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar135 * 0x17 + 0xe);
  auVar186 = vpmovsxwd_avx(auVar16);
  auVar184._0_4_ = fVar212 * auVar139._0_4_;
  auVar184._4_4_ = fVar221 * auVar139._4_4_;
  auVar184._8_4_ = fVar223 * auVar139._8_4_;
  auVar184._12_4_ = fVar225 * auVar139._12_4_;
  auVar29._16_4_ = fVar227 * auVar139._16_4_;
  auVar29._0_16_ = auVar184;
  auVar29._20_4_ = fVar228 * auVar139._20_4_;
  auVar29._24_4_ = fVar229 * auVar139._24_4_;
  auVar29._28_4_ = auVar139._28_4_;
  auVar271._16_16_ = auVar186;
  auVar271._0_16_ = auVar174;
  auVar139 = vcvtdq2ps_avx(auVar271);
  auVar139 = vsubps_avx(auVar139,auVar140);
  auVar137._0_4_ = fVar212 * auVar139._0_4_;
  auVar137._4_4_ = fVar221 * auVar139._4_4_;
  auVar137._8_4_ = fVar223 * auVar139._8_4_;
  auVar137._12_4_ = fVar225 * auVar139._12_4_;
  auVar30._16_4_ = fVar227 * auVar139._16_4_;
  auVar30._0_16_ = auVar137;
  auVar30._20_4_ = fVar228 * auVar139._20_4_;
  auVar30._24_4_ = fVar229 * auVar139._24_4_;
  auVar30._28_4_ = auVar139._28_4_;
  auVar169 = auVar22._16_16_;
  auVar275 = ZEXT1664(auVar169);
  auVar174 = vpminsd_avx(auVar169,auVar27._16_16_);
  auVar186 = vpminsd_avx(auVar156,auVar234);
  auVar289._16_16_ = auVar174;
  auVar289._0_16_ = auVar186;
  auVar174 = vpminsd_avx(auVar24._16_16_,auVar28._16_16_);
  auVar186 = vpminsd_avx(auVar254,auVar171);
  auVar325._16_16_ = auVar174;
  auVar325._0_16_ = auVar186;
  auVar139 = vmaxps_avx(auVar289,auVar325);
  auVar174 = vpminsd_avx(auVar29._16_16_,auVar30._16_16_);
  auVar186 = vpminsd_avx(auVar184,auVar137);
  auVar340._16_16_ = auVar174;
  auVar340._0_16_ = auVar186;
  uVar7 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar344._4_4_ = uVar7;
  auVar344._0_4_ = uVar7;
  auVar344._8_4_ = uVar7;
  auVar344._12_4_ = uVar7;
  auVar344._16_4_ = uVar7;
  auVar344._20_4_ = uVar7;
  auVar344._24_4_ = uVar7;
  auVar344._28_4_ = uVar7;
  auVar22 = vmaxps_avx(auVar340,auVar344);
  auVar139 = vmaxps_avx(auVar139,auVar22);
  local_80._4_4_ = auVar139._4_4_ * 0.99999964;
  local_80._0_4_ = auVar139._0_4_ * 0.99999964;
  local_80._8_4_ = auVar139._8_4_ * 0.99999964;
  local_80._12_4_ = auVar139._12_4_ * 0.99999964;
  local_80._16_4_ = auVar139._16_4_ * 0.99999964;
  local_80._20_4_ = auVar139._20_4_ * 0.99999964;
  local_80._24_4_ = auVar139._24_4_ * 0.99999964;
  local_80._28_4_ = auVar139._28_4_;
  auVar174 = vpmaxsd_avx(auVar169,auVar27._16_16_);
  auVar186 = vpmaxsd_avx(auVar156,auVar234);
  auVar160._16_16_ = auVar174;
  auVar160._0_16_ = auVar186;
  auVar174 = vpmaxsd_avx(auVar24._16_16_,auVar28._16_16_);
  auVar186 = vpmaxsd_avx(auVar254,auVar171);
  auVar178._16_16_ = auVar174;
  auVar178._0_16_ = auVar186;
  auVar139 = vminps_avx(auVar160,auVar178);
  auVar174 = vpmaxsd_avx(auVar29._16_16_,auVar30._16_16_);
  auVar186 = vpmaxsd_avx(auVar184,auVar137);
  auVar141._16_16_ = auVar174;
  auVar141._0_16_ = auVar186;
  fVar231 = ray->tfar;
  auVar179._4_4_ = fVar231;
  auVar179._0_4_ = fVar231;
  auVar179._8_4_ = fVar231;
  auVar179._12_4_ = fVar231;
  auVar179._16_4_ = fVar231;
  auVar179._20_4_ = fVar231;
  auVar179._24_4_ = fVar231;
  auVar179._28_4_ = fVar231;
  auVar22 = vminps_avx(auVar141,auVar179);
  auVar139 = vminps_avx(auVar139,auVar22);
  auVar21._4_4_ = auVar139._4_4_ * 1.0000004;
  auVar21._0_4_ = auVar139._0_4_ * 1.0000004;
  auVar21._8_4_ = auVar139._8_4_ * 1.0000004;
  auVar21._12_4_ = auVar139._12_4_ * 1.0000004;
  auVar21._16_4_ = auVar139._16_4_ * 1.0000004;
  auVar21._20_4_ = auVar139._20_4_ * 1.0000004;
  auVar21._24_4_ = auVar139._24_4_ * 1.0000004;
  auVar21._28_4_ = auVar139._28_4_;
  auVar139 = vcmpps_avx(local_80,auVar21,2);
  auVar174 = vpshufd_avx(ZEXT116((byte)PVar17),0);
  auVar161._16_16_ = auVar174;
  auVar161._0_16_ = auVar174;
  auVar22 = vcvtdq2ps_avx(auVar161);
  auVar22 = vcmpps_avx(_DAT_02020f40,auVar22,1);
  auVar139 = vandps_avx(auVar139,auVar22);
  uVar127 = vmovmskps_avx(auVar139);
  local_7f5 = uVar127 != 0;
  if (local_7f5) {
    uVar127 = uVar127 & 0xff;
    local_4c0 = mm_lookupmask_ps._16_8_;
    uStack_4b8 = mm_lookupmask_ps._24_8_;
    uStack_4b0 = mm_lookupmask_ps._16_8_;
    uStack_4a8 = mm_lookupmask_ps._24_8_;
    do {
      uVar135 = (ulong)uVar127;
      auVar139 = auVar275._0_32_;
      lVar131 = 0;
      if (uVar135 != 0) {
        for (; (uVar127 >> lVar131 & 1) == 0; lVar131 = lVar131 + 1) {
        }
      }
      uVar135 = uVar135 - 1 & uVar135;
      local_768 = (ulong)*(uint *)(prim + 2);
      pGVar18 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
      _Var19 = pGVar18[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_508 = (ulong)*(uint *)(prim + lVar131 * 4 + 6);
      uVar132 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                                _Var19 * *(uint *)(prim + lVar131 * 4 + 6));
      p_Var133 = pGVar18[1].intersectionFilterN;
      lVar131 = *(long *)&pGVar18[1].time_range.upper;
      _local_7e0 = *(undefined1 (*) [16])(lVar131 + (long)p_Var133 * uVar132);
      local_6c0 = *(undefined1 (*) [16])(lVar131 + (uVar132 + 1) * (long)p_Var133);
      local_6d0 = *(undefined1 (*) [16])(lVar131 + (uVar132 + 2) * (long)p_Var133);
      lVar134 = 0;
      if (uVar135 != 0) {
        for (; (uVar135 >> lVar134 & 1) == 0; lVar134 = lVar134 + 1) {
        }
      }
      local_4d0 = *(undefined1 (*) [16])(lVar131 + (uVar132 + 3) * (long)p_Var133);
      if ((uVar135 != 0) && (uVar132 = uVar135 - 1 & uVar135, uVar132 != 0)) {
        lVar131 = 0;
        if (uVar132 != 0) {
          for (; (uVar132 >> lVar131 & 1) == 0; lVar131 = lVar131 + 1) {
          }
        }
        p_Var133 = (RTCFilterFunctionN)
                   ((long)p_Var133 *
                   (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                                   _Var19 * *(uint *)(prim + lVar131 * 4 + 6)));
      }
      uVar127 = (uint)pGVar18[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar8 = (ray->org).field_0;
      auVar169 = vsubps_avx(_local_7e0,(undefined1  [16])aVar8);
      auVar12 = _local_7e0;
      auVar174 = vshufps_avx(auVar169,auVar169,0);
      auVar186 = vshufps_avx(auVar169,auVar169,0x55);
      auVar169 = vshufps_avx(auVar169,auVar169,0xaa);
      fVar231 = (pre->ray_space).vx.field_0.m128[0];
      fVar242 = (pre->ray_space).vx.field_0.m128[1];
      fVar244 = (pre->ray_space).vx.field_0.m128[2];
      fVar246 = (pre->ray_space).vx.field_0.m128[3];
      fVar249 = (pre->ray_space).vy.field_0.m128[0];
      fVar251 = (pre->ray_space).vy.field_0.m128[1];
      fVar252 = (pre->ray_space).vy.field_0.m128[2];
      fVar182 = (pre->ray_space).vy.field_0.m128[3];
      fVar196 = (pre->ray_space).vz.field_0.m128[0];
      fVar198 = (pre->ray_space).vz.field_0.m128[1];
      fVar199 = (pre->ray_space).vz.field_0.m128[2];
      fVar202 = (pre->ray_space).vz.field_0.m128[3];
      auVar157._0_8_ =
           CONCAT44(auVar174._4_4_ * fVar242 + auVar169._4_4_ * fVar198 + auVar186._4_4_ * fVar251,
                    auVar174._0_4_ * fVar231 + auVar169._0_4_ * fVar196 + auVar186._0_4_ * fVar249);
      auVar157._8_4_ =
           auVar174._8_4_ * fVar244 + auVar169._8_4_ * fVar199 + auVar186._8_4_ * fVar252;
      auVar157._12_4_ =
           auVar174._12_4_ * fVar246 + auVar169._12_4_ * fVar202 + auVar186._12_4_ * fVar182;
      auVar174 = vblendps_avx(auVar157,_local_7e0,8);
      auVar187 = vsubps_avx(local_6c0,(undefined1  [16])aVar8);
      auVar186 = vshufps_avx(auVar187,auVar187,0);
      auVar169 = vshufps_avx(auVar187,auVar187,0x55);
      auVar187 = vshufps_avx(auVar187,auVar187,0xaa);
      auVar339._0_4_ =
           auVar186._0_4_ * fVar231 + auVar169._0_4_ * fVar249 + auVar187._0_4_ * fVar196;
      auVar339._4_4_ =
           auVar186._4_4_ * fVar242 + auVar169._4_4_ * fVar251 + auVar187._4_4_ * fVar198;
      auVar339._8_4_ =
           auVar186._8_4_ * fVar244 + auVar169._8_4_ * fVar252 + auVar187._8_4_ * fVar199;
      auVar339._12_4_ =
           auVar186._12_4_ * fVar246 + auVar169._12_4_ * fVar182 + auVar187._12_4_ * fVar202;
      auVar186 = vblendps_avx(auVar339,local_6c0,8);
      auVar9 = vsubps_avx(local_6d0,(undefined1  [16])aVar8);
      auVar169 = vshufps_avx(auVar9,auVar9,0);
      auVar187 = vshufps_avx(auVar9,auVar9,0x55);
      auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
      auVar235._0_4_ = auVar169._0_4_ * fVar231 + auVar187._0_4_ * fVar249 + auVar9._0_4_ * fVar196;
      auVar235._4_4_ = auVar169._4_4_ * fVar242 + auVar187._4_4_ * fVar251 + auVar9._4_4_ * fVar198;
      auVar235._8_4_ = auVar169._8_4_ * fVar244 + auVar187._8_4_ * fVar252 + auVar9._8_4_ * fVar199;
      auVar235._12_4_ =
           auVar169._12_4_ * fVar246 + auVar187._12_4_ * fVar182 + auVar9._12_4_ * fVar202;
      auVar10 = vshufps_avx(local_6d0,local_6d0,0xff);
      auVar13 = local_6d0;
      auVar169 = vblendps_avx(auVar235,local_6d0,8);
      auVar11 = vsubps_avx(local_4d0,(undefined1  [16])aVar8);
      auVar187 = vshufps_avx(auVar11,auVar11,0);
      auVar9 = vshufps_avx(auVar11,auVar11,0x55);
      auVar11 = vshufps_avx(auVar11,auVar11,0xaa);
      auVar287._0_4_ = auVar187._0_4_ * fVar231 + auVar11._0_4_ * fVar196 + auVar9._0_4_ * fVar249;
      auVar287._4_4_ = auVar187._4_4_ * fVar242 + auVar11._4_4_ * fVar198 + auVar9._4_4_ * fVar251;
      auVar287._8_4_ = auVar187._8_4_ * fVar244 + auVar11._8_4_ * fVar199 + auVar9._8_4_ * fVar252;
      auVar287._12_4_ =
           auVar187._12_4_ * fVar246 + auVar11._12_4_ * fVar202 + auVar9._12_4_ * fVar182;
      auVar11 = vshufps_avx(local_4d0,local_4d0,0xff);
      auVar14 = local_4d0;
      auVar187 = vblendps_avx(auVar287,local_4d0,8);
      auVar214._8_4_ = 0x7fffffff;
      auVar214._0_8_ = 0x7fffffff7fffffff;
      auVar214._12_4_ = 0x7fffffff;
      auVar174 = vandps_avx(auVar174,auVar214);
      auVar186 = vandps_avx(auVar186,auVar214);
      auVar9 = vmaxps_avx(auVar174,auVar186);
      auVar174 = vandps_avx(auVar169,auVar214);
      auVar186 = vandps_avx(auVar187,auVar214);
      auVar174 = vmaxps_avx(auVar174,auVar186);
      auVar174 = vmaxps_avx(auVar9,auVar174);
      auVar186 = vmovshdup_avx(auVar174);
      auVar186 = vmaxss_avx(auVar186,auVar174);
      auVar174 = vshufpd_avx(auVar174,auVar174,1);
      auVar174 = vmaxss_avx(auVar174,auVar186);
      lVar131 = (long)(int)uVar127 * 0x44;
      fVar231 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar131 + 0x908);
      fVar242 = *(float *)(catmullrom_basis0 + lVar131 + 0x90c);
      fVar244 = *(float *)(catmullrom_basis0 + lVar131 + 0x910);
      fVar246 = *(float *)(catmullrom_basis0 + lVar131 + 0x914);
      fVar249 = *(float *)(catmullrom_basis0 + lVar131 + 0x918);
      fVar251 = *(float *)(catmullrom_basis0 + lVar131 + 0x91c);
      fVar252 = *(float *)(catmullrom_basis0 + lVar131 + 0x920);
      auVar121 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar131 + 0x908);
      local_720._0_16_ = auVar235;
      auVar186 = vshufps_avx(auVar235,auVar235,0);
      register0x00001390 = auVar186;
      _local_760 = auVar186;
      auVar169 = vshufps_avx(auVar235,auVar235,0x55);
      register0x00001350 = auVar169;
      _local_7c0 = auVar169;
      register0x00001450 = auVar10;
      _local_320 = auVar10;
      fVar182 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar131 + 0xd8c);
      fVar196 = *(float *)(catmullrom_basis0 + lVar131 + 0xd90);
      fVar198 = *(float *)(catmullrom_basis0 + lVar131 + 0xd94);
      fVar199 = *(float *)(catmullrom_basis0 + lVar131 + 0xd98);
      fVar202 = *(float *)(catmullrom_basis0 + lVar131 + 0xd9c);
      fVar205 = *(float *)(catmullrom_basis0 + lVar131 + 0xda0);
      fVar208 = *(float *)(catmullrom_basis0 + lVar131 + 0xda4);
      auVar120 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar131 + 0xd8c);
      auVar187 = vshufps_avx(auVar287,auVar287,0);
      register0x000015d0 = auVar187;
      _local_420 = auVar187;
      auVar9 = vshufps_avx(auVar287,auVar287,0x55);
      register0x00001250 = auVar9;
      _local_7a0 = auVar9;
      register0x000013d0 = auVar11;
      _local_140 = auVar11;
      fVar282 = auVar187._0_4_;
      fVar284 = auVar187._4_4_;
      fVar301 = auVar187._8_4_;
      fVar309 = auVar187._12_4_;
      fVar154 = auVar9._0_4_;
      fVar166 = auVar9._4_4_;
      fVar167 = auVar9._8_4_;
      fVar168 = auVar9._12_4_;
      fVar183 = auVar186._0_4_;
      fVar197 = auVar186._4_4_;
      fVar265 = auVar186._8_4_;
      fVar200 = auVar186._12_4_;
      fVar232 = auVar169._0_4_;
      fVar243 = auVar169._4_4_;
      fVar245 = auVar169._8_4_;
      fVar247 = auVar169._12_4_;
      fVar203 = auVar11._0_4_;
      fVar206 = auVar11._4_4_;
      fVar209 = auVar11._8_4_;
      fVar285 = auVar11._12_4_;
      fVar264 = auVar10._0_4_;
      fVar296 = auVar10._4_4_;
      fVar300 = auVar10._8_4_;
      auVar186 = vshufps_avx(auVar339,auVar339,0);
      register0x00001490 = auVar186;
      _local_600 = auVar186;
      fVar212 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar131 + 0x484);
      fVar221 = *(float *)(catmullrom_basis0 + lVar131 + 0x488);
      fVar223 = *(float *)(catmullrom_basis0 + lVar131 + 0x48c);
      fVar225 = *(float *)(catmullrom_basis0 + lVar131 + 0x490);
      fVar227 = *(float *)(catmullrom_basis0 + lVar131 + 0x494);
      fVar228 = *(float *)(catmullrom_basis0 + lVar131 + 0x498);
      fVar229 = *(float *)(catmullrom_basis0 + lVar131 + 0x49c);
      auVar122 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar131 + 0x484);
      fVar316 = auVar186._0_4_;
      fVar321 = auVar186._4_4_;
      fVar322 = auVar186._8_4_;
      fVar323 = auVar186._12_4_;
      auVar186 = vshufps_avx(auVar339,auVar339,0x55);
      register0x00001310 = auVar186;
      _local_560 = auVar186;
      fVar213 = auVar186._0_4_;
      fVar222 = auVar186._4_4_;
      fVar224 = auVar186._8_4_;
      fVar226 = auVar186._12_4_;
      auVar11 = local_6c0;
      auVar186 = vshufps_avx(local_6c0,local_6c0,0xff);
      register0x00001590 = auVar186;
      _local_a0 = auVar186;
      fVar276 = auVar186._0_4_;
      fVar277 = auVar186._4_4_;
      fVar278 = auVar186._8_4_;
      fVar280 = auVar186._12_4_;
      fVar343 = *(float *)(catmullrom_basis0 + lVar131 + 0x924) + 0.0 + 0.0;
      auVar114._8_4_ = auVar157._8_4_;
      auVar114._0_8_ = auVar157._0_8_;
      auVar114._12_4_ = auVar157._12_4_;
      auVar186 = vshufps_avx(auVar114,auVar114,0);
      register0x00001350 = auVar186;
      _local_c0 = auVar186;
      fVar250 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar131);
      fVar328 = *(float *)(catmullrom_basis0 + lVar131 + 4);
      fVar338 = *(float *)(catmullrom_basis0 + lVar131 + 8);
      fVar329 = *(float *)(catmullrom_basis0 + lVar131 + 0xc);
      fVar253 = *(float *)(catmullrom_basis0 + lVar131 + 0x10);
      fVar330 = *(float *)(catmullrom_basis0 + lVar131 + 0x14);
      fVar170 = *(float *)(catmullrom_basis0 + lVar131 + 0x18);
      auVar123 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar131);
      fVar151 = auVar186._0_4_;
      fVar152 = auVar186._4_4_;
      fVar153 = auVar186._8_4_;
      fVar248 = auVar186._12_4_;
      auVar332._0_4_ = fVar151 * fVar250 + fVar316 * fVar212 + fVar183 * fVar231 + fVar282 * fVar182
      ;
      auVar332._4_4_ = fVar152 * fVar328 + fVar321 * fVar221 + fVar197 * fVar242 + fVar284 * fVar196
      ;
      auVar332._8_4_ = fVar153 * fVar338 + fVar322 * fVar223 + fVar265 * fVar244 + fVar301 * fVar198
      ;
      auVar332._12_4_ =
           fVar248 * fVar329 + fVar323 * fVar225 + fVar200 * fVar246 + fVar309 * fVar199;
      auVar332._16_4_ =
           fVar151 * fVar253 + fVar316 * fVar227 + fVar183 * fVar249 + fVar282 * fVar202;
      auVar332._20_4_ =
           fVar152 * fVar330 + fVar321 * fVar228 + fVar197 * fVar251 + fVar284 * fVar205;
      auVar332._24_4_ =
           fVar153 * fVar170 + fVar322 * fVar229 + fVar265 * fVar252 + fVar301 * fVar208;
      auVar332._28_4_ = fVar200 + 0.0;
      auVar186 = vshufps_avx(auVar114,auVar114,0x55);
      register0x00001290 = auVar186;
      _local_380 = auVar186;
      fVar181 = auVar186._0_4_;
      fVar136 = auVar186._4_4_;
      fVar150 = auVar186._8_4_;
      fVar230 = auVar186._12_4_;
      auVar326._0_4_ = fVar181 * fVar250 + fVar213 * fVar212 + fVar232 * fVar231 + fVar154 * fVar182
      ;
      auVar326._4_4_ = fVar136 * fVar328 + fVar222 * fVar221 + fVar243 * fVar242 + fVar166 * fVar196
      ;
      auVar326._8_4_ = fVar150 * fVar338 + fVar224 * fVar223 + fVar245 * fVar244 + fVar167 * fVar198
      ;
      auVar326._12_4_ =
           fVar230 * fVar329 + fVar226 * fVar225 + fVar247 * fVar246 + fVar168 * fVar199;
      auVar326._16_4_ =
           fVar181 * fVar253 + fVar213 * fVar227 + fVar232 * fVar249 + fVar154 * fVar202;
      auVar326._20_4_ =
           fVar136 * fVar330 + fVar222 * fVar228 + fVar243 * fVar251 + fVar166 * fVar205;
      auVar326._24_4_ =
           fVar150 * fVar170 + fVar224 * fVar229 + fVar245 * fVar252 + fVar167 * fVar208;
      auVar326._28_4_ = fVar168 + 0.0 + 0.0 + 0.0;
      auVar186 = vpermilps_avx(_local_7e0,0xff);
      register0x00001450 = auVar186;
      _local_160 = auVar186;
      fVar294 = auVar186._0_4_;
      fVar298 = auVar186._4_4_;
      fVar315 = auVar186._8_4_;
      local_5a0._0_4_ =
           fVar276 * fVar212 + fVar264 * fVar231 + fVar203 * fVar182 + fVar294 * fVar250;
      local_5a0._4_4_ =
           fVar277 * fVar221 + fVar296 * fVar242 + fVar206 * fVar196 + fVar298 * fVar328;
      local_5a0._8_4_ =
           fVar278 * fVar223 + fVar300 * fVar244 + fVar209 * fVar198 + fVar315 * fVar338;
      local_5a0._12_4_ =
           fVar280 * fVar225 + auVar10._12_4_ * fVar246 + fVar285 * fVar199 +
           auVar186._12_4_ * fVar329;
      local_5a0._16_4_ =
           fVar276 * fVar227 + fVar264 * fVar249 + fVar203 * fVar202 + fVar294 * fVar253;
      local_5a0._20_4_ =
           fVar277 * fVar228 + fVar296 * fVar251 + fVar206 * fVar205 + fVar298 * fVar330;
      local_5a0._24_4_ =
           fVar278 * fVar229 + fVar300 * fVar252 + fVar209 * fVar208 + fVar315 * fVar170;
      local_5a0._28_4_ = fVar343 + 0.0;
      fVar250 = *(float *)(catmullrom_basis1 + lVar131 + 0x908);
      fVar328 = *(float *)(catmullrom_basis1 + lVar131 + 0x90c);
      fVar338 = *(float *)(catmullrom_basis1 + lVar131 + 0x910);
      fVar329 = *(float *)(catmullrom_basis1 + lVar131 + 0x914);
      fVar253 = *(float *)(catmullrom_basis1 + lVar131 + 0x918);
      fVar330 = *(float *)(catmullrom_basis1 + lVar131 + 0x91c);
      fVar170 = *(float *)(catmullrom_basis1 + lVar131 + 0x920);
      fVar286 = *(float *)(catmullrom_basis1 + lVar131 + 0xd8c);
      fVar201 = *(float *)(catmullrom_basis1 + lVar131 + 0xd90);
      fVar279 = *(float *)(catmullrom_basis1 + lVar131 + 0xd94);
      fVar291 = *(float *)(catmullrom_basis1 + lVar131 + 0xd98);
      fVar292 = *(float *)(catmullrom_basis1 + lVar131 + 0xd9c);
      fVar204 = *(float *)(catmullrom_basis1 + lVar131 + 0xda0);
      fVar281 = *(float *)(catmullrom_basis1 + lVar131 + 0xda4);
      auVar22 = *(undefined1 (*) [32])(catmullrom_basis1 + lVar131 + 0x484);
      auVar263 = ZEXT3264(auVar22);
      fVar231 = auVar22._0_4_;
      fVar246 = auVar22._4_4_;
      fVar252 = auVar22._8_4_;
      fVar198 = auVar22._12_4_;
      fVar205 = auVar22._16_4_;
      fVar221 = auVar22._20_4_;
      fVar227 = auVar22._24_4_;
      fVar211 = fVar343 + fVar200 + 0.0;
      fVar293 = *(float *)(catmullrom_basis1 + lVar131);
      fVar295 = *(float *)(catmullrom_basis1 + lVar131 + 4);
      fVar207 = *(float *)(catmullrom_basis1 + lVar131 + 8);
      fVar283 = *(float *)(catmullrom_basis1 + lVar131 + 0xc);
      fVar297 = *(float *)(catmullrom_basis1 + lVar131 + 0x10);
      fVar299 = *(float *)(catmullrom_basis1 + lVar131 + 0x14);
      fVar210 = *(float *)(catmullrom_basis1 + lVar131 + 0x18);
      auVar216._0_4_ = fVar151 * fVar293 + fVar316 * fVar231 + fVar250 * fVar183 + fVar282 * fVar286
      ;
      auVar216._4_4_ = fVar152 * fVar295 + fVar321 * fVar246 + fVar328 * fVar197 + fVar284 * fVar201
      ;
      auVar216._8_4_ = fVar153 * fVar207 + fVar322 * fVar252 + fVar338 * fVar265 + fVar301 * fVar279
      ;
      auVar216._12_4_ =
           fVar248 * fVar283 + fVar323 * fVar198 + fVar329 * fVar200 + fVar309 * fVar291;
      auVar216._16_4_ =
           fVar151 * fVar297 + fVar316 * fVar205 + fVar253 * fVar183 + fVar282 * fVar292;
      auVar216._20_4_ =
           fVar152 * fVar299 + fVar321 * fVar221 + fVar330 * fVar197 + fVar284 * fVar204;
      auVar216._24_4_ =
           fVar153 * fVar210 + fVar322 * fVar227 + fVar170 * fVar265 + fVar301 * fVar281;
      auVar216._28_4_ = fVar280 + fVar343 + fVar200 + 0.0;
      auVar346._0_4_ = fVar181 * fVar293 + fVar213 * fVar231 + fVar250 * fVar232 + fVar286 * fVar154
      ;
      auVar346._4_4_ = fVar136 * fVar295 + fVar222 * fVar246 + fVar328 * fVar243 + fVar201 * fVar166
      ;
      auVar346._8_4_ = fVar150 * fVar207 + fVar224 * fVar252 + fVar338 * fVar245 + fVar279 * fVar167
      ;
      auVar346._12_4_ =
           fVar230 * fVar283 + fVar226 * fVar198 + fVar329 * fVar247 + fVar291 * fVar168;
      auVar346._16_4_ =
           fVar181 * fVar297 + fVar213 * fVar205 + fVar253 * fVar232 + fVar292 * fVar154;
      auVar346._20_4_ =
           fVar136 * fVar299 + fVar222 * fVar221 + fVar330 * fVar243 + fVar204 * fVar166;
      auVar346._24_4_ =
           fVar150 * fVar210 + fVar224 * fVar227 + fVar170 * fVar245 + fVar281 * fVar167;
      auVar346._28_4_ = fVar230 + fVar211;
      auVar237._0_4_ = fVar276 * fVar231 + fVar250 * fVar264 + fVar203 * fVar286 + fVar294 * fVar293
      ;
      auVar237._4_4_ = fVar277 * fVar246 + fVar328 * fVar296 + fVar206 * fVar201 + fVar298 * fVar295
      ;
      auVar237._8_4_ = fVar278 * fVar252 + fVar338 * fVar300 + fVar209 * fVar279 + fVar315 * fVar207
      ;
      auVar237._12_4_ =
           fVar280 * fVar198 + fVar329 * auVar10._12_4_ + fVar285 * fVar291 +
           auVar186._12_4_ * fVar283;
      auVar237._16_4_ =
           fVar276 * fVar205 + fVar253 * fVar264 + fVar203 * fVar292 + fVar294 * fVar297;
      auVar237._20_4_ =
           fVar277 * fVar221 + fVar330 * fVar296 + fVar206 * fVar204 + fVar298 * fVar299;
      auVar237._24_4_ =
           fVar278 * fVar227 + fVar170 * fVar300 + fVar209 * fVar281 + fVar315 * fVar210;
      auVar237._28_4_ = fVar343 + fVar285 + fVar200 + fVar230;
      auVar25 = vsubps_avx(auVar216,auVar332);
      auVar26 = vsubps_avx(auVar346,auVar326);
      _auStack_450 = auVar26._16_16_;
      fVar242 = auVar25._0_4_;
      fVar249 = auVar25._4_4_;
      auVar31._4_4_ = auVar326._4_4_ * fVar249;
      auVar31._0_4_ = auVar326._0_4_ * fVar242;
      fVar182 = auVar25._8_4_;
      auVar31._8_4_ = auVar326._8_4_ * fVar182;
      fVar199 = auVar25._12_4_;
      auVar31._12_4_ = auVar326._12_4_ * fVar199;
      fVar208 = auVar25._16_4_;
      auVar31._16_4_ = auVar326._16_4_ * fVar208;
      fVar223 = auVar25._20_4_;
      auVar31._20_4_ = auVar326._20_4_ * fVar223;
      fVar228 = auVar25._24_4_;
      auVar31._24_4_ = auVar326._24_4_ * fVar228;
      auVar31._28_4_ = fVar230;
      fVar244 = auVar26._0_4_;
      fVar251 = auVar26._4_4_;
      auVar32._4_4_ = auVar332._4_4_ * fVar251;
      auVar32._0_4_ = auVar332._0_4_ * fVar244;
      fVar196 = auVar26._8_4_;
      auVar32._8_4_ = auVar332._8_4_ * fVar196;
      fVar202 = auVar26._12_4_;
      auVar32._12_4_ = auVar332._12_4_ * fVar202;
      fVar212 = auVar26._16_4_;
      auVar32._16_4_ = auVar332._16_4_ * fVar212;
      fVar225 = auVar26._20_4_;
      auVar32._20_4_ = auVar332._20_4_ * fVar225;
      fVar229 = auVar26._24_4_;
      auVar32._24_4_ = auVar332._24_4_ * fVar229;
      auVar32._28_4_ = fVar211;
      auVar24 = vsubps_avx(auVar31,auVar32);
      auVar23 = vmaxps_avx(local_5a0,auVar237);
      auVar33._4_4_ = auVar23._4_4_ * auVar23._4_4_ * (fVar249 * fVar249 + fVar251 * fVar251);
      auVar33._0_4_ = auVar23._0_4_ * auVar23._0_4_ * (fVar242 * fVar242 + fVar244 * fVar244);
      auVar33._8_4_ = auVar23._8_4_ * auVar23._8_4_ * (fVar182 * fVar182 + fVar196 * fVar196);
      auVar33._12_4_ = auVar23._12_4_ * auVar23._12_4_ * (fVar199 * fVar199 + fVar202 * fVar202);
      auVar33._16_4_ = auVar23._16_4_ * auVar23._16_4_ * (fVar208 * fVar208 + fVar212 * fVar212);
      auVar33._20_4_ = auVar23._20_4_ * auVar23._20_4_ * (fVar223 * fVar223 + fVar225 * fVar225);
      auVar33._24_4_ = auVar23._24_4_ * auVar23._24_4_ * (fVar228 * fVar228 + fVar229 * fVar229);
      auVar33._28_4_ = auVar25._28_4_ + fVar211;
      auVar34._4_4_ = auVar24._4_4_ * auVar24._4_4_;
      auVar34._0_4_ = auVar24._0_4_ * auVar24._0_4_;
      auVar34._8_4_ = auVar24._8_4_ * auVar24._8_4_;
      auVar34._12_4_ = auVar24._12_4_ * auVar24._12_4_;
      auVar34._16_4_ = auVar24._16_4_ * auVar24._16_4_;
      auVar34._20_4_ = auVar24._20_4_ * auVar24._20_4_;
      auVar34._24_4_ = auVar24._24_4_ * auVar24._24_4_;
      auVar34._28_4_ = auVar24._28_4_;
      auVar23 = vcmpps_avx(auVar34,auVar33,2);
      local_440 = (float)(int)uVar127;
      fStack_43c = 0.0;
      fStack_438 = 0.0;
      fStack_434 = 0.0;
      auVar186 = vshufps_avx(ZEXT416((uint)local_440),ZEXT416((uint)local_440),0);
      auVar191._16_16_ = auVar186;
      auVar191._0_16_ = auVar186;
      auVar24 = vcmpps_avx(_DAT_02020f40,auVar191,1);
      auVar195 = ZEXT3264(auVar24);
      auVar115._8_4_ = auVar157._8_4_;
      auVar115._0_8_ = auVar157._0_8_;
      auVar115._12_4_ = auVar157._12_4_;
      auVar186 = vpermilps_avx(auVar115,0xaa);
      auVar303._16_16_ = auVar186;
      auVar303._0_16_ = auVar186;
      auVar169 = vpermilps_avx(auVar339,0xaa);
      register0x00001550 = auVar169;
      _local_360 = auVar169;
      auVar187 = vpermilps_avx(auVar235,0xaa);
      register0x00001590 = auVar187;
      _local_e0 = auVar187;
      auVar9 = vpermilps_avx(auVar287,0xaa);
      register0x00001310 = auVar9;
      _local_340 = auVar9;
      auVar27 = auVar24 & auVar23;
      local_700 = *(uint *)((long)&(ray->org).field_0 + 0xc);
      uStack_6fc = 0;
      fStack_6f8 = 0.0;
      fStack_6f4 = 0.0;
      auVar174 = ZEXT416((uint)(auVar174._0_4_ * 4.7683716e-07));
      fVar242 = fVar316;
      fVar244 = fVar321;
      fVar249 = fVar322;
      fVar251 = fVar323;
      fVar182 = fVar154;
      fVar196 = fVar166;
      fVar199 = fVar167;
      fVar202 = fVar168;
      fVar208 = fVar232;
      fVar212 = fVar243;
      fVar223 = fVar245;
      fVar225 = fVar213;
      fVar228 = fVar222;
      fVar229 = fVar224;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar27 >> 0x7f,0) == '\0') &&
            (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar27 >> 0xbf,0) == '\0') &&
          (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar27[0x1f])
      {
        p_Var133 = (RTCFilterFunctionN)0x0;
        auVar275 = ZEXT3264(auVar139);
        auVar327 = ZEXT3264(_local_760);
        local_7f0 = context;
        local_7e8 = ray;
        local_7c8 = pre;
      }
      else {
        _local_3a0 = vandps_avx(auVar23,auVar24);
        fVar294 = auVar186._0_4_;
        fVar296 = auVar186._4_4_;
        fVar298 = auVar186._8_4_;
        fVar300 = auVar186._12_4_;
        fVar343 = auVar169._0_4_;
        fVar276 = auVar169._4_4_;
        fVar277 = auVar169._8_4_;
        fVar278 = auVar169._12_4_;
        fVar280 = auVar187._0_4_;
        fVar310 = auVar187._4_4_;
        fVar311 = auVar187._8_4_;
        fVar312 = auVar187._12_4_;
        fVar203 = auVar9._0_4_;
        fVar206 = auVar9._4_4_;
        fVar209 = auVar9._8_4_;
        fVar285 = auVar9._12_4_;
        fVar211 = auVar24._28_4_ + *(float *)(catmullrom_basis1 + lVar131 + 0x924) + 0.0;
        local_3c0._0_4_ =
             fVar294 * fVar293 + fVar343 * fVar231 + fVar280 * fVar250 + fVar203 * fVar286;
        local_3c0._4_4_ =
             fVar296 * fVar295 + fVar276 * fVar246 + fVar310 * fVar328 + fVar206 * fVar201;
        fStack_3b8 = fVar298 * fVar207 + fVar277 * fVar252 + fVar311 * fVar338 + fVar209 * fVar279;
        fStack_3b4 = fVar300 * fVar283 + fVar278 * fVar198 + fVar312 * fVar329 + fVar285 * fVar291;
        fStack_3b0 = fVar294 * fVar297 + fVar343 * fVar205 + fVar280 * fVar253 + fVar203 * fVar292;
        fStack_3ac = fVar296 * fVar299 + fVar276 * fVar221 + fVar310 * fVar330 + fVar206 * fVar204;
        fStack_3a8 = fVar298 * fVar210 + fVar277 * fVar227 + fVar311 * fVar170 + fVar209 * fVar281;
        fStack_3a4 = local_3a0._28_4_ + fVar211;
        local_4a0._0_4_ = auVar123._0_4_;
        local_4a0._4_4_ = auVar123._4_4_;
        fStack_498 = auVar123._8_4_;
        fStack_494 = auVar123._12_4_;
        fStack_490 = auVar123._16_4_;
        fStack_48c = auVar123._20_4_;
        fStack_488 = auVar123._24_4_;
        local_480._0_4_ = auVar122._0_4_;
        local_480._4_4_ = auVar122._4_4_;
        fStack_478 = auVar122._8_4_;
        fStack_474 = auVar122._12_4_;
        fStack_470 = auVar122._16_4_;
        fStack_46c = auVar122._20_4_;
        fStack_468 = auVar122._24_4_;
        local_740._0_4_ = auVar121._0_4_;
        local_740._4_4_ = auVar121._4_4_;
        fStack_738 = auVar121._8_4_;
        fStack_734 = auVar121._12_4_;
        auStack_730._0_4_ = auVar121._16_4_;
        auStack_730._4_4_ = auVar121._20_4_;
        fStack_728 = auVar121._24_4_;
        local_680._0_4_ = auVar120._0_4_;
        local_680._4_4_ = auVar120._4_4_;
        fStack_678 = auVar120._8_4_;
        fStack_674 = auVar120._12_4_;
        auStack_670._0_4_ = auVar120._16_4_;
        auStack_670._4_4_ = auVar120._20_4_;
        fStack_668 = auVar120._24_4_;
        local_680._0_4_ =
             fVar294 * (float)local_4a0._0_4_ +
             fVar343 * (float)local_480._0_4_ +
             fVar280 * (float)local_740._0_4_ + fVar203 * (float)local_680._0_4_;
        local_680._4_4_ =
             fVar296 * (float)local_4a0._4_4_ +
             fVar276 * (float)local_480._4_4_ +
             fVar310 * (float)local_740._4_4_ + fVar206 * (float)local_680._4_4_;
        fStack_678 = fVar298 * fStack_498 +
                     fVar277 * fStack_478 + fVar311 * fStack_738 + fVar209 * fStack_678;
        fStack_674 = fVar300 * fStack_494 +
                     fVar278 * fStack_474 + fVar312 * fStack_734 + fVar285 * fStack_674;
        auStack_670._0_4_ =
             fVar294 * fStack_490 +
             fVar343 * fStack_470 +
             fVar280 * (float)auStack_730._0_4_ + fVar203 * (float)auStack_670._0_4_;
        auStack_670._4_4_ =
             fVar296 * fStack_48c +
             fVar276 * fStack_46c +
             fVar310 * (float)auStack_730._4_4_ + fVar206 * (float)auStack_670._4_4_;
        fStack_668 = fVar298 * fStack_488 +
                     fVar277 * fStack_468 + fVar311 * fStack_728 + fVar209 * fStack_668;
        fStack_664 = fStack_3a4 + fVar211 + local_3a0._28_4_ + auVar24._28_4_;
        fVar231 = *(float *)(catmullrom_basis0 + lVar131 + 0x1210);
        fVar246 = *(float *)(catmullrom_basis0 + lVar131 + 0x1214);
        fVar252 = *(float *)(catmullrom_basis0 + lVar131 + 0x1218);
        fVar198 = *(float *)(catmullrom_basis0 + lVar131 + 0x121c);
        fVar205 = *(float *)(catmullrom_basis0 + lVar131 + 0x1220);
        fVar221 = *(float *)(catmullrom_basis0 + lVar131 + 0x1224);
        fVar227 = *(float *)(catmullrom_basis0 + lVar131 + 0x1228);
        fVar250 = *(float *)(catmullrom_basis0 + lVar131 + 0x1694);
        fVar328 = *(float *)(catmullrom_basis0 + lVar131 + 0x1698);
        fVar338 = *(float *)(catmullrom_basis0 + lVar131 + 0x169c);
        fVar329 = *(float *)(catmullrom_basis0 + lVar131 + 0x16a0);
        fVar253 = *(float *)(catmullrom_basis0 + lVar131 + 0x16a4);
        fVar330 = *(float *)(catmullrom_basis0 + lVar131 + 0x16a8);
        fVar170 = *(float *)(catmullrom_basis0 + lVar131 + 0x16ac);
        fVar286 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b18);
        fVar201 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b1c);
        fVar279 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b20);
        fVar291 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b24);
        fVar292 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b28);
        fVar204 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b2c);
        fVar281 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b30);
        fVar293 = *(float *)(catmullrom_basis0 + lVar131 + 0x1f9c);
        fVar295 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fa0);
        fVar207 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fa4);
        fVar283 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fa8);
        fVar297 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fac);
        fVar299 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fb0);
        fVar210 = *(float *)(catmullrom_basis0 + lVar131 + 0x1fb4);
        _local_620 = auVar303;
        fVar264 = fVar300 + auVar22._28_4_;
        local_720._0_16_ = auVar174;
        fVar211 = *(float *)(catmullrom_basis0 + lVar131 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar131 + 0x1fb8);
        fVar315 = *(float *)(catmullrom_basis0 + lVar131 + 0x16b0) + fVar211;
        local_480._4_4_ =
             fVar152 * fVar246 + fVar321 * fVar328 + fVar197 * fVar201 + fVar284 * fVar295;
        local_480._0_4_ =
             fVar151 * fVar231 + fVar316 * fVar250 + fVar183 * fVar286 + fVar282 * fVar293;
        fStack_478 = fVar153 * fVar252 + fVar322 * fVar338 + fVar265 * fVar279 + fVar301 * fVar207;
        fStack_474 = fVar248 * fVar198 + fVar323 * fVar329 + fVar200 * fVar291 + fVar309 * fVar283;
        fStack_470 = fVar151 * fVar205 + fVar316 * fVar253 + fVar183 * fVar292 + fVar282 * fVar297;
        fStack_46c = fVar152 * fVar221 + fVar321 * fVar330 + fVar197 * fVar204 + fVar284 * fVar299;
        fStack_468 = fVar153 * fVar227 + fVar322 * fVar170 + fVar265 * fVar281 + fVar301 * fVar210;
        fStack_464 = *(float *)(catmullrom_basis0 + lVar131 + 0x16b0) +
                     *(float *)(catmullrom_basis0 + lVar131 + 0x1fb8) + fVar264;
        auVar258._0_4_ =
             fVar181 * fVar231 + fVar232 * fVar286 + fVar154 * fVar293 + fVar213 * fVar250;
        auVar258._4_4_ =
             fVar136 * fVar246 + fVar243 * fVar201 + fVar166 * fVar295 + fVar222 * fVar328;
        auVar258._8_4_ =
             fVar150 * fVar252 + fVar245 * fVar279 + fVar167 * fVar207 + fVar224 * fVar338;
        auVar258._12_4_ =
             fVar230 * fVar198 + fVar247 * fVar291 + fVar168 * fVar283 + fVar226 * fVar329;
        auVar258._16_4_ =
             fVar181 * fVar205 + fVar232 * fVar292 + fVar154 * fVar297 + fVar213 * fVar253;
        auVar258._20_4_ =
             fVar136 * fVar221 + fVar243 * fVar204 + fVar166 * fVar299 + fVar222 * fVar330;
        auVar258._24_4_ =
             fVar150 * fVar227 + fVar245 * fVar281 + fVar167 * fVar210 + fVar224 * fVar170;
        auVar258._28_4_ = fVar211 + fVar300 + 0.0 + fVar264;
        local_4a0._4_4_ =
             fVar276 * fVar328 + fVar310 * fVar201 + fVar206 * fVar295 + fVar296 * fVar246;
        local_4a0._0_4_ =
             fVar343 * fVar250 + fVar280 * fVar286 + fVar203 * fVar293 + fVar294 * fVar231;
        fStack_498 = fVar277 * fVar338 + fVar311 * fVar279 + fVar209 * fVar207 + fVar298 * fVar252;
        fStack_494 = fVar278 * fVar329 + fVar312 * fVar291 + fVar285 * fVar283 + fVar300 * fVar198;
        fStack_490 = fVar343 * fVar253 + fVar280 * fVar292 + fVar203 * fVar297 + fVar294 * fVar205;
        fStack_48c = fVar276 * fVar330 + fVar310 * fVar204 + fVar206 * fVar299 + fVar296 * fVar221;
        fStack_488 = fVar277 * fVar170 + fVar311 * fVar281 + fVar209 * fVar210 + fVar298 * fVar227;
        fStack_484 = fVar315 + *(float *)(catmullrom_basis0 + lVar131 + 0x122c);
        fVar231 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b18);
        fVar246 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b1c);
        fVar252 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b20);
        fVar198 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b24);
        fVar205 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b28);
        fVar221 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b2c);
        fVar227 = *(float *)(catmullrom_basis1 + lVar131 + 0x1b30);
        fVar250 = *(float *)(catmullrom_basis1 + lVar131 + 0x1f9c);
        fVar328 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fa0);
        fVar338 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fa4);
        fVar329 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fa8);
        fVar253 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fac);
        fVar330 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fb0);
        fVar170 = *(float *)(catmullrom_basis1 + lVar131 + 0x1fb4);
        fVar286 = *(float *)(catmullrom_basis1 + lVar131 + 0x1694);
        fVar201 = *(float *)(catmullrom_basis1 + lVar131 + 0x1698);
        fVar279 = *(float *)(catmullrom_basis1 + lVar131 + 0x169c);
        fVar291 = *(float *)(catmullrom_basis1 + lVar131 + 0x16a0);
        fVar292 = *(float *)(catmullrom_basis1 + lVar131 + 0x16a4);
        fVar204 = *(float *)(catmullrom_basis1 + lVar131 + 0x16a8);
        fVar281 = *(float *)(catmullrom_basis1 + lVar131 + 0x16ac);
        fVar293 = *(float *)(catmullrom_basis1 + lVar131 + 0x1210);
        fVar295 = *(float *)(catmullrom_basis1 + lVar131 + 0x1214);
        fVar207 = *(float *)(catmullrom_basis1 + lVar131 + 0x1218);
        fVar283 = *(float *)(catmullrom_basis1 + lVar131 + 0x121c);
        fVar297 = *(float *)(catmullrom_basis1 + lVar131 + 0x1220);
        fVar299 = *(float *)(catmullrom_basis1 + lVar131 + 0x1224);
        fVar210 = *(float *)(catmullrom_basis1 + lVar131 + 0x1228);
        auVar272._0_4_ =
             fVar151 * fVar293 + fVar316 * fVar286 + fVar183 * fVar231 + fVar282 * fVar250;
        auVar272._4_4_ =
             fVar152 * fVar295 + fVar321 * fVar201 + fVar197 * fVar246 + fVar284 * fVar328;
        auVar272._8_4_ =
             fVar153 * fVar207 + fVar322 * fVar279 + fVar265 * fVar252 + fVar301 * fVar338;
        auVar272._12_4_ =
             fVar248 * fVar283 + fVar323 * fVar291 + fVar200 * fVar198 + fVar309 * fVar329;
        auVar272._16_4_ =
             fVar151 * fVar297 + fVar316 * fVar292 + fVar183 * fVar205 + fVar282 * fVar253;
        auVar272._20_4_ =
             fVar152 * fVar299 + fVar321 * fVar204 + fVar197 * fVar221 + fVar284 * fVar330;
        auVar272._24_4_ =
             fVar153 * fVar210 + fVar322 * fVar281 + fVar265 * fVar227 + fVar301 * fVar170;
        auVar272._28_4_ = fVar200 + fVar200 + fVar315 + fVar309;
        auVar304._0_4_ =
             fVar181 * fVar293 + fVar213 * fVar286 + fVar232 * fVar231 + fVar154 * fVar250;
        auVar304._4_4_ =
             fVar136 * fVar295 + fVar222 * fVar201 + fVar243 * fVar246 + fVar166 * fVar328;
        auVar304._8_4_ =
             fVar150 * fVar207 + fVar224 * fVar279 + fVar245 * fVar252 + fVar167 * fVar338;
        auVar304._12_4_ =
             fVar230 * fVar283 + fVar226 * fVar291 + fVar247 * fVar198 + fVar168 * fVar329;
        auVar304._16_4_ =
             fVar181 * fVar297 + fVar213 * fVar292 + fVar232 * fVar205 + fVar154 * fVar253;
        auVar304._20_4_ =
             fVar136 * fVar299 + fVar222 * fVar204 + fVar243 * fVar221 + fVar166 * fVar330;
        auVar304._24_4_ =
             fVar150 * fVar210 + fVar224 * fVar281 + fVar245 * fVar227 + fVar167 * fVar170;
        auVar304._28_4_ = fVar200 + fVar200 + fVar200 + fVar315;
        auVar180._0_4_ =
             fVar294 * fVar293 + fVar343 * fVar286 + fVar280 * fVar231 + fVar203 * fVar250;
        auVar180._4_4_ =
             fVar296 * fVar295 + fVar276 * fVar201 + fVar310 * fVar246 + fVar206 * fVar328;
        auVar180._8_4_ =
             fVar298 * fVar207 + fVar277 * fVar279 + fVar311 * fVar252 + fVar209 * fVar338;
        auVar180._12_4_ =
             fVar300 * fVar283 + fVar278 * fVar291 + fVar312 * fVar198 + fVar285 * fVar329;
        auVar180._16_4_ =
             fVar294 * fVar297 + fVar343 * fVar292 + fVar280 * fVar205 + fVar203 * fVar253;
        auVar180._20_4_ =
             fVar296 * fVar299 + fVar276 * fVar204 + fVar310 * fVar221 + fVar206 * fVar330;
        auVar180._24_4_ =
             fVar298 * fVar210 + fVar277 * fVar281 + fVar311 * fVar227 + fVar209 * fVar170;
        auVar180._28_4_ =
             *(float *)(catmullrom_basis1 + lVar131 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar131 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar131 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar131 + 0x1fb8);
        auVar217._8_4_ = 0x7fffffff;
        auVar217._0_8_ = 0x7fffffff7fffffff;
        auVar217._12_4_ = 0x7fffffff;
        auVar217._16_4_ = 0x7fffffff;
        auVar217._20_4_ = 0x7fffffff;
        auVar217._24_4_ = 0x7fffffff;
        auVar217._28_4_ = 0x7fffffff;
        auVar22 = vandps_avx(_local_480,auVar217);
        auVar23 = vandps_avx(auVar258,auVar217);
        auVar23 = vmaxps_avx(auVar22,auVar23);
        auVar22 = vandps_avx(auVar217,_local_4a0);
        auVar22 = vmaxps_avx(auVar23,auVar22);
        auVar174 = vpermilps_avx(auVar174,0);
        auVar259._16_16_ = auVar174;
        auVar259._0_16_ = auVar174;
        auVar22 = vcmpps_avx(auVar22,auVar259,1);
        auVar24 = vblendvps_avx(_local_480,auVar25,auVar22);
        auVar27 = vblendvps_avx(auVar258,auVar26,auVar22);
        auVar22 = vandps_avx(auVar272,auVar217);
        auVar23 = vandps_avx(auVar304,auVar217);
        auVar28 = vmaxps_avx(auVar22,auVar23);
        auVar22 = vandps_avx(auVar180,auVar217);
        auVar22 = vmaxps_avx(auVar28,auVar22);
        auVar28 = vcmpps_avx(auVar22,auVar259,1);
        auVar22 = vblendvps_avx(auVar272,auVar25,auVar28);
        auVar25 = vblendvps_avx(auVar304,auVar26,auVar28);
        fVar136 = auVar24._0_4_;
        fVar150 = auVar24._4_4_;
        fVar230 = auVar24._8_4_;
        fVar211 = auVar24._12_4_;
        fVar151 = auVar24._16_4_;
        fVar152 = auVar24._20_4_;
        fVar153 = auVar24._24_4_;
        fVar183 = auVar22._0_4_;
        fVar197 = auVar22._4_4_;
        fVar265 = auVar22._8_4_;
        fVar200 = auVar22._12_4_;
        fVar203 = auVar22._16_4_;
        fVar206 = auVar22._20_4_;
        fVar209 = auVar22._24_4_;
        fVar285 = -auVar22._28_4_;
        fVar231 = auVar27._0_4_;
        fVar205 = auVar27._4_4_;
        fVar328 = auVar27._8_4_;
        fVar330 = auVar27._12_4_;
        fVar279 = auVar27._16_4_;
        fVar281 = auVar27._20_4_;
        fVar283 = auVar27._24_4_;
        auVar142._0_4_ = fVar231 * fVar231 + fVar136 * fVar136;
        auVar142._4_4_ = fVar205 * fVar205 + fVar150 * fVar150;
        auVar142._8_4_ = fVar328 * fVar328 + fVar230 * fVar230;
        auVar142._12_4_ = fVar330 * fVar330 + fVar211 * fVar211;
        auVar142._16_4_ = fVar279 * fVar279 + fVar151 * fVar151;
        auVar142._20_4_ = fVar281 * fVar281 + fVar152 * fVar152;
        auVar142._24_4_ = fVar283 * fVar283 + fVar153 * fVar153;
        auVar142._28_4_ = auVar304._28_4_ + auVar24._28_4_;
        auVar24 = vrsqrtps_avx(auVar142);
        fVar246 = auVar24._0_4_;
        fVar252 = auVar24._4_4_;
        auVar35._4_4_ = fVar252 * 1.5;
        auVar35._0_4_ = fVar246 * 1.5;
        fVar198 = auVar24._8_4_;
        auVar35._8_4_ = fVar198 * 1.5;
        fVar221 = auVar24._12_4_;
        auVar35._12_4_ = fVar221 * 1.5;
        fVar227 = auVar24._16_4_;
        auVar35._16_4_ = fVar227 * 1.5;
        fVar250 = auVar24._20_4_;
        auVar35._20_4_ = fVar250 * 1.5;
        fVar338 = auVar24._24_4_;
        fVar181 = auVar23._28_4_;
        auVar35._24_4_ = fVar338 * 1.5;
        auVar35._28_4_ = fVar181;
        auVar36._4_4_ = fVar252 * fVar252 * fVar252 * auVar142._4_4_ * 0.5;
        auVar36._0_4_ = fVar246 * fVar246 * fVar246 * auVar142._0_4_ * 0.5;
        auVar36._8_4_ = fVar198 * fVar198 * fVar198 * auVar142._8_4_ * 0.5;
        auVar36._12_4_ = fVar221 * fVar221 * fVar221 * auVar142._12_4_ * 0.5;
        auVar36._16_4_ = fVar227 * fVar227 * fVar227 * auVar142._16_4_ * 0.5;
        auVar36._20_4_ = fVar250 * fVar250 * fVar250 * auVar142._20_4_ * 0.5;
        auVar36._24_4_ = fVar338 * fVar338 * fVar338 * auVar142._24_4_ * 0.5;
        auVar36._28_4_ = auVar142._28_4_;
        auVar23 = vsubps_avx(auVar35,auVar36);
        fVar246 = auVar23._0_4_;
        fVar221 = auVar23._4_4_;
        fVar338 = auVar23._8_4_;
        fVar170 = auVar23._12_4_;
        fVar291 = auVar23._16_4_;
        fVar293 = auVar23._20_4_;
        fVar297 = auVar23._24_4_;
        fVar252 = auVar25._0_4_;
        fVar227 = auVar25._4_4_;
        fVar329 = auVar25._8_4_;
        fVar286 = auVar25._12_4_;
        fVar292 = auVar25._16_4_;
        fVar295 = auVar25._20_4_;
        fVar299 = auVar25._24_4_;
        auVar143._0_4_ = fVar252 * fVar252 + fVar183 * fVar183;
        auVar143._4_4_ = fVar227 * fVar227 + fVar197 * fVar197;
        auVar143._8_4_ = fVar329 * fVar329 + fVar265 * fVar265;
        auVar143._12_4_ = fVar286 * fVar286 + fVar200 * fVar200;
        auVar143._16_4_ = fVar292 * fVar292 + fVar203 * fVar203;
        auVar143._20_4_ = fVar295 * fVar295 + fVar206 * fVar206;
        auVar143._24_4_ = fVar299 * fVar299 + fVar209 * fVar209;
        auVar143._28_4_ = auVar22._28_4_ + auVar23._28_4_;
        auVar22 = vrsqrtps_avx(auVar143);
        fVar198 = auVar22._0_4_;
        fVar250 = auVar22._4_4_;
        auVar37._4_4_ = fVar250 * 1.5;
        auVar37._0_4_ = fVar198 * 1.5;
        fVar253 = auVar22._8_4_;
        auVar37._8_4_ = fVar253 * 1.5;
        fVar201 = auVar22._12_4_;
        auVar37._12_4_ = fVar201 * 1.5;
        fVar204 = auVar22._16_4_;
        auVar37._16_4_ = fVar204 * 1.5;
        fVar207 = auVar22._20_4_;
        auVar37._20_4_ = fVar207 * 1.5;
        fVar210 = auVar22._24_4_;
        auVar37._24_4_ = fVar210 * 1.5;
        auVar37._28_4_ = fVar181;
        auVar38._4_4_ = fVar250 * fVar250 * fVar250 * auVar143._4_4_ * 0.5;
        auVar38._0_4_ = fVar198 * fVar198 * fVar198 * auVar143._0_4_ * 0.5;
        auVar38._8_4_ = fVar253 * fVar253 * fVar253 * auVar143._8_4_ * 0.5;
        auVar38._12_4_ = fVar201 * fVar201 * fVar201 * auVar143._12_4_ * 0.5;
        auVar38._16_4_ = fVar204 * fVar204 * fVar204 * auVar143._16_4_ * 0.5;
        auVar38._20_4_ = fVar207 * fVar207 * fVar207 * auVar143._20_4_ * 0.5;
        auVar38._24_4_ = fVar210 * fVar210 * fVar210 * auVar143._24_4_ * 0.5;
        auVar38._28_4_ = auVar143._28_4_;
        auVar22 = vsubps_avx(auVar37,auVar38);
        fVar198 = auVar22._0_4_;
        fVar250 = auVar22._4_4_;
        fVar253 = auVar22._8_4_;
        fVar201 = auVar22._12_4_;
        fVar204 = auVar22._16_4_;
        fVar207 = auVar22._20_4_;
        fVar210 = auVar22._24_4_;
        fVar231 = (float)local_5a0._0_4_ * fVar231 * fVar246;
        fVar205 = local_5a0._4_4_ * fVar205 * fVar221;
        auVar39._4_4_ = fVar205;
        auVar39._0_4_ = fVar231;
        fVar328 = local_5a0._8_4_ * fVar328 * fVar338;
        auVar39._8_4_ = fVar328;
        fVar330 = local_5a0._12_4_ * fVar330 * fVar170;
        auVar39._12_4_ = fVar330;
        fVar279 = local_5a0._16_4_ * fVar279 * fVar291;
        auVar39._16_4_ = fVar279;
        fVar281 = local_5a0._20_4_ * fVar281 * fVar293;
        auVar39._20_4_ = fVar281;
        fVar283 = local_5a0._24_4_ * fVar283 * fVar297;
        auVar39._24_4_ = fVar283;
        auVar39._28_4_ = fVar285;
        local_500._4_4_ = auVar332._4_4_ + fVar205;
        local_500._0_4_ = auVar332._0_4_ + fVar231;
        fStack_4f8 = auVar332._8_4_ + fVar328;
        fStack_4f4 = auVar332._12_4_ + fVar330;
        fStack_4f0 = auVar332._16_4_ + fVar279;
        fStack_4ec = auVar332._20_4_ + fVar281;
        fStack_4e8 = auVar332._24_4_ + fVar283;
        fStack_4e4 = auVar332._28_4_ + fVar285;
        fVar231 = (float)local_5a0._0_4_ * fVar246 * -fVar136;
        fVar205 = local_5a0._4_4_ * fVar221 * -fVar150;
        auVar40._4_4_ = fVar205;
        auVar40._0_4_ = fVar231;
        fVar328 = local_5a0._8_4_ * fVar338 * -fVar230;
        auVar40._8_4_ = fVar328;
        fVar330 = local_5a0._12_4_ * fVar170 * -fVar211;
        auVar40._12_4_ = fVar330;
        fVar279 = local_5a0._16_4_ * fVar291 * -fVar151;
        auVar40._16_4_ = fVar279;
        fVar281 = local_5a0._20_4_ * fVar293 * -fVar152;
        auVar40._20_4_ = fVar281;
        fVar283 = local_5a0._24_4_ * fVar297 * -fVar153;
        auVar40._24_4_ = fVar283;
        auVar40._28_4_ = fVar181;
        local_460._4_4_ = fVar205 + auVar326._4_4_;
        local_460._0_4_ = fVar231 + auVar326._0_4_;
        fStack_458 = fVar328 + auVar326._8_4_;
        fStack_454 = fVar330 + auVar326._12_4_;
        auStack_450._0_4_ = fVar279 + auVar326._16_4_;
        auStack_450._4_4_ = fVar281 + auVar326._20_4_;
        fStack_448 = fVar283 + auVar326._24_4_;
        fStack_444 = fVar181 + auVar326._28_4_;
        fVar231 = (float)local_5a0._0_4_ * fVar246 * 0.0;
        fVar246 = local_5a0._4_4_ * fVar221 * 0.0;
        auVar41._4_4_ = fVar246;
        auVar41._0_4_ = fVar231;
        fVar205 = local_5a0._8_4_ * fVar338 * 0.0;
        auVar41._8_4_ = fVar205;
        fVar221 = local_5a0._12_4_ * fVar170 * 0.0;
        auVar41._12_4_ = fVar221;
        fVar328 = local_5a0._16_4_ * fVar291 * 0.0;
        auVar41._16_4_ = fVar328;
        fVar338 = local_5a0._20_4_ * fVar293 * 0.0;
        auVar41._20_4_ = fVar338;
        fVar330 = local_5a0._24_4_ * fVar297 * 0.0;
        auVar41._24_4_ = fVar330;
        auVar41._28_4_ = fVar168;
        auVar260._0_4_ = (float)local_680._0_4_ + fVar231;
        auVar260._4_4_ = (float)local_680._4_4_ + fVar246;
        auVar260._8_4_ = fStack_678 + fVar205;
        auVar260._12_4_ = fStack_674 + fVar221;
        auVar260._16_4_ = (float)auStack_670._0_4_ + fVar328;
        auVar260._20_4_ = (float)auStack_670._4_4_ + fVar338;
        auVar260._24_4_ = fStack_668 + fVar330;
        auVar260._28_4_ = fStack_664 + fVar168;
        fVar231 = auVar237._0_4_ * fVar252 * fVar198;
        fVar246 = auVar237._4_4_ * fVar227 * fVar250;
        auVar42._4_4_ = fVar246;
        auVar42._0_4_ = fVar231;
        fVar252 = auVar237._8_4_ * fVar329 * fVar253;
        auVar42._8_4_ = fVar252;
        fVar205 = auVar237._12_4_ * fVar286 * fVar201;
        auVar42._12_4_ = fVar205;
        fVar221 = auVar237._16_4_ * fVar292 * fVar204;
        auVar42._16_4_ = fVar221;
        fVar227 = auVar237._20_4_ * fVar295 * fVar207;
        auVar42._20_4_ = fVar227;
        fVar328 = auVar237._24_4_ * fVar299 * fVar210;
        auVar42._24_4_ = fVar328;
        auVar42._28_4_ = auVar25._28_4_;
        auVar27 = vsubps_avx(auVar332,auVar39);
        auVar305._0_4_ = auVar216._0_4_ + fVar231;
        auVar305._4_4_ = auVar216._4_4_ + fVar246;
        auVar305._8_4_ = auVar216._8_4_ + fVar252;
        auVar305._12_4_ = auVar216._12_4_ + fVar205;
        auVar305._16_4_ = auVar216._16_4_ + fVar221;
        auVar305._20_4_ = auVar216._20_4_ + fVar227;
        auVar305._24_4_ = auVar216._24_4_ + fVar328;
        auVar305._28_4_ = auVar216._28_4_ + auVar25._28_4_;
        fVar231 = auVar237._0_4_ * fVar198 * -fVar183;
        fVar246 = auVar237._4_4_ * fVar250 * -fVar197;
        auVar43._4_4_ = fVar246;
        auVar43._0_4_ = fVar231;
        fVar252 = auVar237._8_4_ * fVar253 * -fVar265;
        auVar43._8_4_ = fVar252;
        fVar205 = auVar237._12_4_ * fVar201 * -fVar200;
        auVar43._12_4_ = fVar205;
        fVar221 = auVar237._16_4_ * fVar204 * -fVar203;
        auVar43._16_4_ = fVar221;
        fVar227 = auVar237._20_4_ * fVar207 * -fVar206;
        auVar43._20_4_ = fVar227;
        fVar328 = auVar237._24_4_ * fVar210 * -fVar209;
        auVar43._24_4_ = fVar328;
        auVar43._28_4_ = fVar278;
        auVar28 = vsubps_avx(auVar326,auVar40);
        auVar318._0_4_ = fVar231 + auVar346._0_4_;
        auVar318._4_4_ = fVar246 + auVar346._4_4_;
        auVar318._8_4_ = fVar252 + auVar346._8_4_;
        auVar318._12_4_ = fVar205 + auVar346._12_4_;
        auVar318._16_4_ = fVar221 + auVar346._16_4_;
        auVar318._20_4_ = fVar227 + auVar346._20_4_;
        auVar318._24_4_ = fVar328 + auVar346._24_4_;
        auVar318._28_4_ = fVar278 + auVar346._28_4_;
        fVar231 = auVar237._0_4_ * fVar198 * 0.0;
        fVar246 = auVar237._4_4_ * fVar250 * 0.0;
        auVar44._4_4_ = fVar246;
        auVar44._0_4_ = fVar231;
        fVar252 = auVar237._8_4_ * fVar253 * 0.0;
        auVar44._8_4_ = fVar252;
        fVar198 = auVar237._12_4_ * fVar201 * 0.0;
        auVar44._12_4_ = fVar198;
        fVar205 = auVar237._16_4_ * fVar204 * 0.0;
        auVar44._16_4_ = fVar205;
        fVar221 = auVar237._20_4_ * fVar207 * 0.0;
        auVar44._20_4_ = fVar221;
        fVar227 = auVar237._24_4_ * fVar210 * 0.0;
        auVar44._24_4_ = fVar227;
        auVar44._28_4_ = 0x3f000000;
        auVar29 = vsubps_avx(_local_680,auVar41);
        auVar345._0_4_ = fVar231 + (float)local_3c0._0_4_;
        auVar345._4_4_ = fVar246 + (float)local_3c0._4_4_;
        auVar345._8_4_ = fVar252 + fStack_3b8;
        auVar345._12_4_ = fVar198 + fStack_3b4;
        auVar345._16_4_ = fVar205 + fStack_3b0;
        auVar345._20_4_ = fVar221 + fStack_3ac;
        auVar345._24_4_ = fVar227 + fStack_3a8;
        auVar345._28_4_ = fStack_3a4 + 0.5;
        auVar22 = vsubps_avx(auVar216,auVar42);
        auVar23 = vsubps_avx(auVar346,auVar43);
        auVar21 = vsubps_avx(_local_3c0,auVar44);
        auVar24 = vsubps_avx(auVar318,auVar28);
        auVar25 = vsubps_avx(auVar345,auVar29);
        auVar45._4_4_ = auVar29._4_4_ * auVar24._4_4_;
        auVar45._0_4_ = auVar29._0_4_ * auVar24._0_4_;
        auVar45._8_4_ = auVar29._8_4_ * auVar24._8_4_;
        auVar45._12_4_ = auVar29._12_4_ * auVar24._12_4_;
        auVar45._16_4_ = auVar29._16_4_ * auVar24._16_4_;
        auVar45._20_4_ = auVar29._20_4_ * auVar24._20_4_;
        auVar45._24_4_ = auVar29._24_4_ * auVar24._24_4_;
        auVar45._28_4_ = fVar248;
        auVar46._4_4_ = auVar28._4_4_ * auVar25._4_4_;
        auVar46._0_4_ = auVar28._0_4_ * auVar25._0_4_;
        auVar46._8_4_ = auVar28._8_4_ * auVar25._8_4_;
        auVar46._12_4_ = auVar28._12_4_ * auVar25._12_4_;
        auVar46._16_4_ = auVar28._16_4_ * auVar25._16_4_;
        auVar46._20_4_ = auVar28._20_4_ * auVar25._20_4_;
        auVar46._24_4_ = auVar28._24_4_ * auVar25._24_4_;
        auVar46._28_4_ = fStack_3a4;
        auVar26 = vsubps_avx(auVar46,auVar45);
        auVar47._4_4_ = auVar27._4_4_ * auVar25._4_4_;
        auVar47._0_4_ = auVar27._0_4_ * auVar25._0_4_;
        auVar47._8_4_ = auVar27._8_4_ * auVar25._8_4_;
        auVar47._12_4_ = auVar27._12_4_ * auVar25._12_4_;
        auVar47._16_4_ = auVar27._16_4_ * auVar25._16_4_;
        auVar47._20_4_ = auVar27._20_4_ * auVar25._20_4_;
        auVar47._24_4_ = auVar27._24_4_ * auVar25._24_4_;
        auVar47._28_4_ = auVar25._28_4_;
        auVar30 = vsubps_avx(auVar305,auVar27);
        auVar48._4_4_ = auVar29._4_4_ * auVar30._4_4_;
        auVar48._0_4_ = auVar29._0_4_ * auVar30._0_4_;
        auVar48._8_4_ = auVar29._8_4_ * auVar30._8_4_;
        auVar48._12_4_ = auVar29._12_4_ * auVar30._12_4_;
        auVar48._16_4_ = auVar29._16_4_ * auVar30._16_4_;
        auVar48._20_4_ = auVar29._20_4_ * auVar30._20_4_;
        auVar48._24_4_ = auVar29._24_4_ * auVar30._24_4_;
        auVar48._28_4_ = auVar216._28_4_;
        auVar140 = vsubps_avx(auVar48,auVar47);
        auVar49._4_4_ = auVar30._4_4_ * auVar28._4_4_;
        auVar49._0_4_ = auVar30._0_4_ * auVar28._0_4_;
        auVar49._8_4_ = auVar30._8_4_ * auVar28._8_4_;
        auVar49._12_4_ = auVar30._12_4_ * auVar28._12_4_;
        auVar49._16_4_ = auVar30._16_4_ * auVar28._16_4_;
        auVar49._20_4_ = auVar30._20_4_ * auVar28._20_4_;
        auVar49._24_4_ = auVar30._24_4_ * auVar28._24_4_;
        auVar49._28_4_ = auVar25._28_4_;
        auVar50._4_4_ = auVar27._4_4_ * auVar24._4_4_;
        auVar50._0_4_ = auVar27._0_4_ * auVar24._0_4_;
        auVar50._8_4_ = auVar27._8_4_ * auVar24._8_4_;
        auVar50._12_4_ = auVar27._12_4_ * auVar24._12_4_;
        auVar50._16_4_ = auVar27._16_4_ * auVar24._16_4_;
        auVar50._20_4_ = auVar27._20_4_ * auVar24._20_4_;
        auVar50._24_4_ = auVar27._24_4_ * auVar24._24_4_;
        auVar50._28_4_ = auVar24._28_4_;
        auVar24 = vsubps_avx(auVar50,auVar49);
        auVar144._0_4_ = auVar26._0_4_ * 0.0 + auVar24._0_4_ + auVar140._0_4_ * 0.0;
        auVar144._4_4_ = auVar26._4_4_ * 0.0 + auVar24._4_4_ + auVar140._4_4_ * 0.0;
        auVar144._8_4_ = auVar26._8_4_ * 0.0 + auVar24._8_4_ + auVar140._8_4_ * 0.0;
        auVar144._12_4_ = auVar26._12_4_ * 0.0 + auVar24._12_4_ + auVar140._12_4_ * 0.0;
        auVar144._16_4_ = auVar26._16_4_ * 0.0 + auVar24._16_4_ + auVar140._16_4_ * 0.0;
        auVar144._20_4_ = auVar26._20_4_ * 0.0 + auVar24._20_4_ + auVar140._20_4_ * 0.0;
        auVar144._24_4_ = auVar26._24_4_ * 0.0 + auVar24._24_4_ + auVar140._24_4_ * 0.0;
        auVar144._28_4_ = auVar24._28_4_ + auVar24._28_4_ + auVar140._28_4_;
        auVar30 = vcmpps_avx(auVar144,ZEXT432(0) << 0x20,2);
        _local_660 = vblendvps_avx(auVar22,_local_500,auVar30);
        auVar22 = vblendvps_avx(auVar23,_local_460,auVar30);
        auVar23 = vblendvps_avx(auVar21,auVar260,auVar30);
        auVar263 = ZEXT3264(auVar23);
        auVar24 = vblendvps_avx(auVar27,auVar305,auVar30);
        auVar25 = vblendvps_avx(auVar28,auVar318,auVar30);
        auVar26 = vblendvps_avx(auVar29,auVar345,auVar30);
        auVar27 = vblendvps_avx(auVar305,auVar27,auVar30);
        auVar28 = vblendvps_avx(auVar318,auVar28,auVar30);
        _local_640 = vpackssdw_avx(local_3a0._0_16_,local_3a0._16_16_);
        _auStack_630 = auVar332._16_16_;
        auVar29 = vblendvps_avx(auVar345,auVar29,auVar30);
        auVar27 = vsubps_avx(auVar27,_local_660);
        auVar140 = vsubps_avx(auVar28,auVar22);
        auVar29 = vsubps_avx(auVar29,auVar23);
        auVar141 = vsubps_avx(auVar22,auVar25);
        fVar231 = auVar140._0_4_;
        fVar153 = auVar23._0_4_;
        fVar221 = auVar140._4_4_;
        fVar248 = auVar23._4_4_;
        auVar51._4_4_ = fVar248 * fVar221;
        auVar51._0_4_ = fVar153 * fVar231;
        fVar329 = auVar140._8_4_;
        fVar183 = auVar23._8_4_;
        auVar51._8_4_ = fVar183 * fVar329;
        fVar201 = auVar140._12_4_;
        fVar197 = auVar23._12_4_;
        auVar51._12_4_ = fVar197 * fVar201;
        fVar281 = auVar140._16_4_;
        fVar265 = auVar23._16_4_;
        auVar51._16_4_ = fVar265 * fVar281;
        fVar297 = auVar140._20_4_;
        fVar200 = auVar23._20_4_;
        auVar51._20_4_ = fVar200 * fVar297;
        fVar150 = auVar140._24_4_;
        fVar203 = auVar23._24_4_;
        auVar51._24_4_ = fVar203 * fVar150;
        auVar51._28_4_ = auVar28._28_4_;
        fVar246 = auVar22._0_4_;
        fVar300 = auVar29._0_4_;
        fVar227 = auVar22._4_4_;
        fVar315 = auVar29._4_4_;
        auVar52._4_4_ = fVar315 * fVar227;
        auVar52._0_4_ = fVar300 * fVar246;
        fVar253 = auVar22._8_4_;
        fVar343 = auVar29._8_4_;
        auVar52._8_4_ = fVar343 * fVar253;
        fVar279 = auVar22._12_4_;
        fVar276 = auVar29._12_4_;
        auVar52._12_4_ = fVar276 * fVar279;
        fVar293 = auVar22._16_4_;
        fVar277 = auVar29._16_4_;
        auVar52._16_4_ = fVar277 * fVar293;
        fVar299 = auVar22._20_4_;
        fVar278 = auVar29._20_4_;
        auVar52._20_4_ = fVar278 * fVar299;
        fVar230 = auVar22._24_4_;
        fVar280 = auVar29._24_4_;
        uVar7 = auVar21._28_4_;
        auVar52._24_4_ = fVar280 * fVar230;
        auVar52._28_4_ = uVar7;
        auVar28 = vsubps_avx(auVar52,auVar51);
        fVar252 = local_660;
        fVar250 = local_660._4_4_;
        auVar53._4_4_ = fVar315 * fVar250;
        auVar53._0_4_ = fVar300 * fVar252;
        fVar330 = local_660._8_4_;
        auVar53._8_4_ = fVar343 * fVar330;
        fVar291 = local_660._12_4_;
        auVar53._12_4_ = fVar276 * fVar291;
        fVar295 = local_660._16_4_;
        auVar53._16_4_ = fVar277 * fVar295;
        fVar210 = local_660._20_4_;
        auVar53._20_4_ = fVar278 * fVar210;
        fVar211 = local_660._24_4_;
        auVar53._24_4_ = fVar280 * fVar211;
        auVar53._28_4_ = uVar7;
        fVar198 = auVar27._0_4_;
        fVar328 = auVar27._4_4_;
        auVar54._4_4_ = fVar248 * fVar328;
        auVar54._0_4_ = fVar153 * fVar198;
        fVar170 = auVar27._8_4_;
        auVar54._8_4_ = fVar183 * fVar170;
        fVar292 = auVar27._12_4_;
        auVar54._12_4_ = fVar197 * fVar292;
        fVar207 = auVar27._16_4_;
        auVar54._16_4_ = fVar265 * fVar207;
        fVar181 = auVar27._20_4_;
        auVar54._20_4_ = fVar200 * fVar181;
        fVar151 = auVar27._24_4_;
        auVar54._24_4_ = fVar203 * fVar151;
        auVar54._28_4_ = auVar345._28_4_;
        auVar21 = vsubps_avx(auVar54,auVar53);
        auVar55._4_4_ = fVar227 * fVar328;
        auVar55._0_4_ = fVar246 * fVar198;
        auVar55._8_4_ = fVar253 * fVar170;
        auVar55._12_4_ = fVar279 * fVar292;
        auVar55._16_4_ = fVar293 * fVar207;
        auVar55._20_4_ = fVar299 * fVar181;
        auVar55._24_4_ = fVar230 * fVar151;
        auVar55._28_4_ = uVar7;
        auVar347._0_4_ = fVar252 * fVar231;
        auVar347._4_4_ = fVar250 * fVar221;
        auVar347._8_4_ = fVar330 * fVar329;
        auVar347._12_4_ = fVar291 * fVar201;
        auVar347._16_4_ = fVar295 * fVar281;
        auVar347._20_4_ = fVar210 * fVar297;
        auVar347._24_4_ = fVar211 * fVar150;
        auVar347._28_4_ = 0;
        auVar158 = vsubps_avx(auVar347,auVar55);
        auVar159 = vsubps_avx(auVar23,auVar26);
        fVar205 = auVar158._28_4_ + auVar21._28_4_;
        auVar162._0_4_ = auVar158._0_4_ + auVar21._0_4_ * 0.0 + auVar28._0_4_ * 0.0;
        auVar162._4_4_ = auVar158._4_4_ + auVar21._4_4_ * 0.0 + auVar28._4_4_ * 0.0;
        auVar162._8_4_ = auVar158._8_4_ + auVar21._8_4_ * 0.0 + auVar28._8_4_ * 0.0;
        auVar162._12_4_ = auVar158._12_4_ + auVar21._12_4_ * 0.0 + auVar28._12_4_ * 0.0;
        auVar162._16_4_ = auVar158._16_4_ + auVar21._16_4_ * 0.0 + auVar28._16_4_ * 0.0;
        auVar162._20_4_ = auVar158._20_4_ + auVar21._20_4_ * 0.0 + auVar28._20_4_ * 0.0;
        auVar162._24_4_ = auVar158._24_4_ + auVar21._24_4_ * 0.0 + auVar28._24_4_ * 0.0;
        auVar162._28_4_ = fVar205 + auVar28._28_4_;
        fVar206 = auVar141._0_4_;
        fVar209 = auVar141._4_4_;
        auVar56._4_4_ = fVar209 * auVar26._4_4_;
        auVar56._0_4_ = fVar206 * auVar26._0_4_;
        fVar285 = auVar141._8_4_;
        auVar56._8_4_ = fVar285 * auVar26._8_4_;
        fVar264 = auVar141._12_4_;
        auVar56._12_4_ = fVar264 * auVar26._12_4_;
        fVar294 = auVar141._16_4_;
        auVar56._16_4_ = fVar294 * auVar26._16_4_;
        fVar296 = auVar141._20_4_;
        auVar56._20_4_ = fVar296 * auVar26._20_4_;
        fVar298 = auVar141._24_4_;
        auVar56._24_4_ = fVar298 * auVar26._24_4_;
        auVar56._28_4_ = fVar205;
        fVar205 = auVar159._0_4_;
        fVar338 = auVar159._4_4_;
        auVar57._4_4_ = auVar25._4_4_ * fVar338;
        auVar57._0_4_ = auVar25._0_4_ * fVar205;
        fVar286 = auVar159._8_4_;
        auVar57._8_4_ = auVar25._8_4_ * fVar286;
        fVar204 = auVar159._12_4_;
        auVar57._12_4_ = auVar25._12_4_ * fVar204;
        fVar283 = auVar159._16_4_;
        auVar57._16_4_ = auVar25._16_4_ * fVar283;
        fVar136 = auVar159._20_4_;
        auVar57._20_4_ = auVar25._20_4_ * fVar136;
        fVar152 = auVar159._24_4_;
        auVar57._24_4_ = auVar25._24_4_ * fVar152;
        auVar57._28_4_ = auVar158._28_4_;
        auVar21 = vsubps_avx(auVar57,auVar56);
        auVar141 = vsubps_avx(_local_660,auVar24);
        fVar282 = auVar141._0_4_;
        fVar284 = auVar141._4_4_;
        auVar58._4_4_ = fVar284 * auVar26._4_4_;
        auVar58._0_4_ = fVar282 * auVar26._0_4_;
        fVar301 = auVar141._8_4_;
        auVar58._8_4_ = fVar301 * auVar26._8_4_;
        fVar309 = auVar141._12_4_;
        auVar58._12_4_ = fVar309 * auVar26._12_4_;
        fVar310 = auVar141._16_4_;
        auVar58._16_4_ = fVar310 * auVar26._16_4_;
        fVar311 = auVar141._20_4_;
        auVar58._20_4_ = fVar311 * auVar26._20_4_;
        fVar312 = auVar141._24_4_;
        auVar58._24_4_ = fVar312 * auVar26._24_4_;
        auVar58._28_4_ = auVar26._28_4_;
        auVar59._4_4_ = auVar24._4_4_ * fVar338;
        auVar59._0_4_ = auVar24._0_4_ * fVar205;
        auVar59._8_4_ = auVar24._8_4_ * fVar286;
        auVar59._12_4_ = auVar24._12_4_ * fVar204;
        auVar59._16_4_ = auVar24._16_4_ * fVar283;
        auVar59._20_4_ = auVar24._20_4_ * fVar136;
        auVar59._24_4_ = auVar24._24_4_ * fVar152;
        auVar59._28_4_ = auVar28._28_4_;
        auVar28 = vsubps_avx(auVar58,auVar59);
        auVar60._4_4_ = auVar25._4_4_ * fVar284;
        auVar60._0_4_ = auVar25._0_4_ * fVar282;
        auVar60._8_4_ = auVar25._8_4_ * fVar301;
        auVar60._12_4_ = auVar25._12_4_ * fVar309;
        auVar60._16_4_ = auVar25._16_4_ * fVar310;
        auVar60._20_4_ = auVar25._20_4_ * fVar311;
        auVar60._24_4_ = auVar25._24_4_ * fVar312;
        auVar60._28_4_ = auVar26._28_4_;
        auVar61._4_4_ = auVar24._4_4_ * fVar209;
        auVar61._0_4_ = auVar24._0_4_ * fVar206;
        auVar61._8_4_ = auVar24._8_4_ * fVar285;
        auVar61._12_4_ = auVar24._12_4_ * fVar264;
        auVar61._16_4_ = auVar24._16_4_ * fVar294;
        auVar61._20_4_ = auVar24._20_4_ * fVar296;
        auVar61._24_4_ = auVar24._24_4_ * fVar298;
        auVar61._28_4_ = auVar24._28_4_;
        auVar24 = vsubps_avx(auVar61,auVar60);
        auVar218._0_4_ = auVar21._0_4_ * 0.0 + auVar24._0_4_ + auVar28._0_4_ * 0.0;
        auVar218._4_4_ = auVar21._4_4_ * 0.0 + auVar24._4_4_ + auVar28._4_4_ * 0.0;
        auVar218._8_4_ = auVar21._8_4_ * 0.0 + auVar24._8_4_ + auVar28._8_4_ * 0.0;
        auVar218._12_4_ = auVar21._12_4_ * 0.0 + auVar24._12_4_ + auVar28._12_4_ * 0.0;
        auVar218._16_4_ = auVar21._16_4_ * 0.0 + auVar24._16_4_ + auVar28._16_4_ * 0.0;
        auVar218._20_4_ = auVar21._20_4_ * 0.0 + auVar24._20_4_ + auVar28._20_4_ * 0.0;
        auVar218._24_4_ = auVar21._24_4_ * 0.0 + auVar24._24_4_ + auVar28._24_4_ * 0.0;
        auVar218._28_4_ = auVar24._28_4_ + auVar24._28_4_ + auVar28._28_4_;
        auVar24 = vmaxps_avx(auVar162,auVar218);
        auVar24 = vcmpps_avx(auVar24,ZEXT832(0) << 0x20,2);
        auVar174 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
        auVar174 = vpand_avx(auVar174,_local_640);
        auVar186 = vpmovsxwd_avx(auVar174);
        auVar169 = vpunpckhwd_avx(auVar174,auVar174);
        auVar192._16_16_ = auVar169;
        auVar192._0_16_ = auVar186;
        if ((((((((auVar192 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar192 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar192 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar192 >> 0x7f,0) == '\0') &&
              (auVar192 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar169 >> 0x3f,0) == '\0') &&
            (auVar192 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar169[0xf]) {
LAB_0115cb3e:
          auVar240._8_8_ = uStack_4b8;
          auVar240._0_8_ = local_4c0;
          auVar240._16_8_ = uStack_4b0;
          auVar240._24_8_ = uStack_4a8;
          auVar275 = ZEXT3264(auVar139);
          auVar195 = ZEXT3264(auVar192);
        }
        else {
          auVar62._4_4_ = fVar338 * fVar221;
          auVar62._0_4_ = fVar205 * fVar231;
          auVar62._8_4_ = fVar286 * fVar329;
          auVar62._12_4_ = fVar204 * fVar201;
          auVar62._16_4_ = fVar283 * fVar281;
          auVar62._20_4_ = fVar136 * fVar297;
          auVar62._24_4_ = fVar152 * fVar150;
          auVar62._28_4_ = auVar169._12_4_;
          auVar333._0_4_ = fVar206 * fVar300;
          auVar333._4_4_ = fVar209 * fVar315;
          auVar333._8_4_ = fVar285 * fVar343;
          auVar333._12_4_ = fVar264 * fVar276;
          auVar333._16_4_ = fVar294 * fVar277;
          auVar333._20_4_ = fVar296 * fVar278;
          auVar333._24_4_ = fVar298 * fVar280;
          auVar333._28_4_ = 0;
          auVar24 = vsubps_avx(auVar333,auVar62);
          auVar63._4_4_ = fVar284 * fVar315;
          auVar63._0_4_ = fVar282 * fVar300;
          auVar63._8_4_ = fVar301 * fVar343;
          auVar63._12_4_ = fVar309 * fVar276;
          auVar63._16_4_ = fVar310 * fVar277;
          auVar63._20_4_ = fVar311 * fVar278;
          auVar63._24_4_ = fVar312 * fVar280;
          auVar63._28_4_ = auVar29._28_4_;
          auVar64._4_4_ = fVar338 * fVar328;
          auVar64._0_4_ = fVar205 * fVar198;
          auVar64._8_4_ = fVar286 * fVar170;
          auVar64._12_4_ = fVar204 * fVar292;
          auVar64._16_4_ = fVar283 * fVar207;
          auVar64._20_4_ = fVar136 * fVar181;
          auVar64._24_4_ = fVar152 * fVar151;
          auVar64._28_4_ = auVar159._28_4_;
          auVar26 = vsubps_avx(auVar64,auVar63);
          auVar65._4_4_ = fVar209 * fVar328;
          auVar65._0_4_ = fVar206 * fVar198;
          auVar65._8_4_ = fVar285 * fVar170;
          auVar65._12_4_ = fVar264 * fVar292;
          auVar65._16_4_ = fVar294 * fVar207;
          auVar65._20_4_ = fVar296 * fVar181;
          auVar65._24_4_ = fVar298 * fVar151;
          auVar65._28_4_ = auVar162._28_4_;
          auVar66._4_4_ = fVar284 * fVar221;
          auVar66._0_4_ = fVar282 * fVar231;
          auVar66._8_4_ = fVar301 * fVar329;
          auVar66._12_4_ = fVar309 * fVar201;
          auVar66._16_4_ = fVar310 * fVar281;
          auVar66._20_4_ = fVar311 * fVar297;
          auVar66._24_4_ = fVar312 * fVar150;
          auVar66._28_4_ = auVar140._28_4_;
          auVar28 = vsubps_avx(auVar66,auVar65);
          auVar273._0_4_ = auVar24._0_4_ * 0.0 + auVar28._0_4_ + auVar26._0_4_ * 0.0;
          auVar273._4_4_ = auVar24._4_4_ * 0.0 + auVar28._4_4_ + auVar26._4_4_ * 0.0;
          auVar273._8_4_ = auVar24._8_4_ * 0.0 + auVar28._8_4_ + auVar26._8_4_ * 0.0;
          auVar273._12_4_ = auVar24._12_4_ * 0.0 + auVar28._12_4_ + auVar26._12_4_ * 0.0;
          auVar273._16_4_ = auVar24._16_4_ * 0.0 + auVar28._16_4_ + auVar26._16_4_ * 0.0;
          auVar273._20_4_ = auVar24._20_4_ * 0.0 + auVar28._20_4_ + auVar26._20_4_ * 0.0;
          auVar273._24_4_ = auVar24._24_4_ * 0.0 + auVar28._24_4_ + auVar26._24_4_ * 0.0;
          auVar273._28_4_ = auVar140._28_4_ + auVar28._28_4_ + auVar162._28_4_;
          auVar25 = vrcpps_avx(auVar273);
          fVar198 = auVar25._0_4_;
          fVar205 = auVar25._4_4_;
          auVar67._4_4_ = auVar273._4_4_ * fVar205;
          auVar67._0_4_ = auVar273._0_4_ * fVar198;
          fVar221 = auVar25._8_4_;
          auVar67._8_4_ = auVar273._8_4_ * fVar221;
          fVar328 = auVar25._12_4_;
          auVar67._12_4_ = auVar273._12_4_ * fVar328;
          fVar338 = auVar25._16_4_;
          auVar67._16_4_ = auVar273._16_4_ * fVar338;
          fVar329 = auVar25._20_4_;
          auVar67._20_4_ = auVar273._20_4_ * fVar329;
          fVar170 = auVar25._24_4_;
          auVar67._24_4_ = auVar273._24_4_ * fVar170;
          auVar67._28_4_ = auVar159._28_4_;
          auVar334._8_4_ = 0x3f800000;
          auVar334._0_8_ = &DAT_3f8000003f800000;
          auVar334._12_4_ = 0x3f800000;
          auVar334._16_4_ = 0x3f800000;
          auVar334._20_4_ = 0x3f800000;
          auVar334._24_4_ = 0x3f800000;
          auVar334._28_4_ = 0x3f800000;
          auVar29 = vsubps_avx(auVar334,auVar67);
          fVar198 = auVar29._0_4_ * fVar198 + fVar198;
          fVar205 = auVar29._4_4_ * fVar205 + fVar205;
          fVar221 = auVar29._8_4_ * fVar221 + fVar221;
          fVar328 = auVar29._12_4_ * fVar328 + fVar328;
          fVar338 = auVar29._16_4_ * fVar338 + fVar338;
          fVar329 = auVar29._20_4_ * fVar329 + fVar329;
          fVar170 = auVar29._24_4_ * fVar170 + fVar170;
          auVar68._4_4_ =
               (auVar24._4_4_ * fVar250 + auVar26._4_4_ * fVar227 + auVar28._4_4_ * fVar248) *
               fVar205;
          auVar68._0_4_ =
               (auVar24._0_4_ * fVar252 + auVar26._0_4_ * fVar246 + auVar28._0_4_ * fVar153) *
               fVar198;
          auVar68._8_4_ =
               (auVar24._8_4_ * fVar330 + auVar26._8_4_ * fVar253 + auVar28._8_4_ * fVar183) *
               fVar221;
          auVar68._12_4_ =
               (auVar24._12_4_ * fVar291 + auVar26._12_4_ * fVar279 + auVar28._12_4_ * fVar197) *
               fVar328;
          auVar68._16_4_ =
               (auVar24._16_4_ * fVar295 + auVar26._16_4_ * fVar293 + auVar28._16_4_ * fVar265) *
               fVar338;
          auVar68._20_4_ =
               (auVar24._20_4_ * fVar210 + auVar26._20_4_ * fVar299 + auVar28._20_4_ * fVar200) *
               fVar329;
          auVar68._24_4_ =
               (auVar24._24_4_ * fVar211 + auVar26._24_4_ * fVar230 + auVar28._24_4_ * fVar203) *
               fVar170;
          auVar68._28_4_ = local_660._28_4_ + auVar27._28_4_ + auVar23._28_4_;
          auVar186 = vpermilps_avx(ZEXT416(local_700),0);
          auVar193._16_16_ = auVar186;
          auVar193._0_16_ = auVar186;
          auVar23 = vcmpps_avx(auVar193,auVar68,2);
          fVar231 = ray->tfar;
          auVar238._4_4_ = fVar231;
          auVar238._0_4_ = fVar231;
          auVar238._8_4_ = fVar231;
          auVar238._12_4_ = fVar231;
          auVar238._16_4_ = fVar231;
          auVar238._20_4_ = fVar231;
          auVar238._24_4_ = fVar231;
          auVar238._28_4_ = fVar231;
          auVar24 = vcmpps_avx(auVar68,auVar238,2);
          auVar23 = vandps_avx(auVar24,auVar23);
          auVar186 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
          auVar174 = vpand_avx(auVar174,auVar186);
          auVar186 = vpmovsxwd_avx(auVar174);
          auVar169 = vpshufd_avx(auVar174,0xee);
          auVar169 = vpmovsxwd_avx(auVar169);
          auVar263 = ZEXT1664(auVar169);
          auVar192._16_16_ = auVar169;
          auVar192._0_16_ = auVar186;
          if ((((((((auVar192 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar192 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar192 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar192 >> 0x7f,0) == '\0') &&
                (auVar192 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar169 >> 0x3f,0) == '\0') &&
              (auVar192 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar169[0xf]) goto LAB_0115cb3e;
          auVar23 = vcmpps_avx(ZEXT832(0) << 0x20,auVar273,4);
          auVar186 = vpackssdw_avx(auVar23._0_16_,auVar23._16_16_);
          auVar174 = vpand_avx(auVar174,auVar186);
          auVar186 = vpmovsxwd_avx(auVar174);
          auVar174 = vpunpckhwd_avx(auVar174,auVar174);
          auVar195 = ZEXT1664(auVar174);
          auVar261._16_16_ = auVar174;
          auVar261._0_16_ = auVar186;
          auVar263 = ZEXT3264(auVar261);
          auVar240._8_8_ = uStack_4b8;
          auVar240._0_8_ = local_4c0;
          auVar240._16_8_ = uStack_4b0;
          auVar240._24_8_ = uStack_4a8;
          auVar275 = ZEXT3264(auVar139);
          if ((((((((auVar261 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar261 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar261 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar261 >> 0x7f,0) != '\0') ||
                (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar174 >> 0x3f,0) != '\0') ||
              (auVar261 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar174[0xf] < '\0') {
            auVar194._0_4_ = auVar162._0_4_ * fVar198;
            auVar194._4_4_ = auVar162._4_4_ * fVar205;
            auVar194._8_4_ = auVar162._8_4_ * fVar221;
            auVar194._12_4_ = auVar162._12_4_ * fVar328;
            auVar194._16_4_ = auVar162._16_4_ * fVar338;
            auVar194._20_4_ = auVar162._20_4_ * fVar329;
            auVar194._24_4_ = auVar162._24_4_ * fVar170;
            auVar194._28_4_ = 0;
            auVar69._4_4_ = auVar218._4_4_ * fVar205;
            auVar69._0_4_ = auVar218._0_4_ * fVar198;
            auVar69._8_4_ = auVar218._8_4_ * fVar221;
            auVar69._12_4_ = auVar218._12_4_ * fVar328;
            auVar69._16_4_ = auVar218._16_4_ * fVar338;
            auVar69._20_4_ = auVar218._20_4_ * fVar329;
            auVar69._24_4_ = auVar218._24_4_ * fVar170;
            auVar69._28_4_ = auVar29._28_4_ + auVar25._28_4_;
            auVar239._8_4_ = 0x3f800000;
            auVar239._0_8_ = &DAT_3f8000003f800000;
            auVar239._12_4_ = 0x3f800000;
            auVar239._16_4_ = 0x3f800000;
            auVar239._20_4_ = 0x3f800000;
            auVar239._24_4_ = 0x3f800000;
            auVar239._28_4_ = 0x3f800000;
            auVar139 = vsubps_avx(auVar239,auVar194);
            local_180 = vblendvps_avx(auVar139,auVar194,auVar30);
            auVar139 = vsubps_avx(auVar239,auVar69);
            auVar195 = ZEXT3264(auVar139);
            _local_3e0 = vblendvps_avx(auVar139,auVar69,auVar30);
            auVar275 = ZEXT3264(auVar68);
            auVar240 = auVar261;
          }
        }
        if ((((((((auVar240 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar240 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar240 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar240 >> 0x7f,0) == '\0') &&
              (auVar240 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar240 >> 0xbf,0) == '\0') &&
            (auVar240 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar240[0x1f]) {
LAB_0115b784:
          p_Var133 = (RTCFilterFunctionN)0x0;
          auVar327 = ZEXT3264(_local_760);
          local_6d0 = auVar13;
          local_6c0 = auVar11;
          local_4d0 = auVar14;
        }
        else {
          auVar139 = vsubps_avx(auVar237,local_5a0);
          auVar195 = ZEXT3264(local_180);
          fVar246 = (float)local_5a0._0_4_ + auVar139._0_4_ * local_180._0_4_;
          fVar252 = local_5a0._4_4_ + auVar139._4_4_ * local_180._4_4_;
          fVar198 = local_5a0._8_4_ + auVar139._8_4_ * local_180._8_4_;
          fVar205 = local_5a0._12_4_ + auVar139._12_4_ * local_180._12_4_;
          fVar221 = local_5a0._16_4_ + auVar139._16_4_ * local_180._16_4_;
          fVar227 = local_5a0._20_4_ + auVar139._20_4_ * local_180._20_4_;
          fVar250 = local_5a0._24_4_ + auVar139._24_4_ * local_180._24_4_;
          fVar328 = local_5a0._28_4_ + auVar139._28_4_;
          fVar231 = pre->depth_scale;
          auVar70._4_4_ = (fVar252 + fVar252) * fVar231;
          auVar70._0_4_ = (fVar246 + fVar246) * fVar231;
          auVar70._8_4_ = (fVar198 + fVar198) * fVar231;
          auVar70._12_4_ = (fVar205 + fVar205) * fVar231;
          auVar70._16_4_ = (fVar221 + fVar221) * fVar231;
          auVar70._20_4_ = (fVar227 + fVar227) * fVar231;
          auVar70._24_4_ = (fVar250 + fVar250) * fVar231;
          auVar70._28_4_ = fVar328 + fVar328;
          local_2c0 = auVar275._0_32_;
          auVar139 = vcmpps_avx(local_2c0,auVar70,6);
          auVar23 = auVar240 & auVar139;
          if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar23 >> 0x7f,0) == '\0') &&
                (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar23 >> 0xbf,0) == '\0') &&
              (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar23[0x1f]) goto LAB_0115b784;
          local_240 = vandps_avx(auVar139,auVar240);
          local_2e0 = (float)local_3e0._0_4_ + (float)local_3e0._0_4_ + -1.0;
          fStack_2dc = (float)local_3e0._4_4_ + (float)local_3e0._4_4_ + -1.0;
          fStack_2d8 = (float)uStack_3d8 + (float)uStack_3d8 + -1.0;
          fStack_2d4 = uStack_3d8._4_4_ + uStack_3d8._4_4_ + -1.0;
          fStack_2d0 = (float)uStack_3d0 + (float)uStack_3d0 + -1.0;
          fStack_2cc = uStack_3d0._4_4_ + uStack_3d0._4_4_ + -1.0;
          fStack_2c8 = (float)uStack_3c8 + (float)uStack_3c8 + -1.0;
          fStack_2c4 = uStack_3c8._4_4_ + uStack_3c8._4_4_ + -1.0;
          local_300 = local_180;
          local_2a0 = 0;
          local_29c = uVar127;
          local_290 = local_7e0;
          uStack_288 = local_7e0._8_8_;
          local_280 = local_6c0._0_8_;
          uStack_278 = local_6c0._8_8_;
          local_270 = local_6d0._0_8_;
          uStack_268 = local_6d0._8_8_;
          local_260 = local_4d0._0_8_;
          uStack_258 = local_4d0._8_8_;
          local_3e0._4_4_ = fStack_2dc;
          local_3e0._0_4_ = local_2e0;
          uStack_3d8._0_4_ = fStack_2d8;
          uStack_3d8._4_4_ = fStack_2d4;
          uStack_3d0._0_4_ = fStack_2d0;
          uStack_3d0._4_4_ = fStack_2cc;
          auVar126 = _local_3e0;
          uStack_3c8._0_4_ = fStack_2c8;
          uStack_3c8._4_4_ = fStack_2c4;
          auVar139 = _local_3e0;
          if ((pGVar18->mask & ray->mask) == 0) goto LAB_0115b784;
          auVar327 = ZEXT3264(_local_760);
          auVar149 = ZEXT3264(auVar303);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (p_Var133 = (RTCFilterFunctionN)CONCAT71((int7)((ulong)p_Var133 >> 8),1),
             local_6d0 = auVar13, local_6c0 = auVar11, local_4d0 = auVar14,
             pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar172._0_4_ = 1.0 / local_440;
            auVar172._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar174 = vshufps_avx(auVar172,auVar172,0);
            local_220[0] = auVar174._0_4_ * (local_180._0_4_ + 0.0);
            local_220[1] = auVar174._4_4_ * (local_180._4_4_ + 1.0);
            local_220[2] = auVar174._8_4_ * (local_180._8_4_ + 2.0);
            local_220[3] = auVar174._12_4_ * (local_180._12_4_ + 3.0);
            fStack_210 = auVar174._0_4_ * (local_180._16_4_ + 4.0);
            fStack_20c = auVar174._4_4_ * (local_180._20_4_ + 5.0);
            fStack_208 = auVar174._8_4_ * (local_180._24_4_ + 6.0);
            fStack_204 = (float)local_180._28_4_ + 7.0;
            uStack_3d0 = auVar126._16_8_;
            uStack_3c8 = auVar139._24_8_;
            local_200 = local_3e0;
            uStack_1f8 = uStack_3d8;
            uStack_1f0 = uStack_3d0;
            uStack_1e8 = uStack_3c8;
            local_580 = local_2c0;
            local_1e0 = local_2c0;
            iVar128 = vmovmskps_avx(local_240);
            local_5c0._0_8_ = CONCAT44((int)((ulong)context->args >> 0x20),iVar128);
            lVar134 = 0;
            if (local_5c0._0_8_ != 0) {
              for (; ((ulong)local_5c0._0_8_ >> lVar134 & 1) == 0; lVar134 = lVar134 + 1) {
              }
            }
            uVar132 = CONCAT71((int7)((ulong)p_Var133 >> 8),iVar128 != 0);
            local_6d0 = auVar13;
            local_6c0 = auVar11;
            local_4d0 = auVar14;
            _local_3e0 = auVar139;
            if (iVar128 != 0) {
              local_5c0._8_24_ = auVar237._8_24_;
              _auStack_5d0 = auVar22._16_16_;
              _local_5e0 = local_6c0;
              _auStack_730 = auVar346._16_16_;
              _local_740 = local_6d0;
              _local_680 = local_4d0;
              local_7f0 = context;
              local_7e8 = ray;
              local_7c8 = pre;
              fVar231 = (float)local_7e0._0_4_;
              fVar242 = (float)local_7e0._4_4_;
              fVar244 = (float)uStack_7d8;
              fVar246 = uStack_7d8._4_4_;
              _local_7e0 = auVar12;
              do {
                local_534 = local_220[lVar134];
                local_530 = *(undefined4 *)((long)&local_200 + lVar134 * 4);
                local_660 = (undefined1  [4])ray->tfar;
                local_640 = (undefined1  [8])lVar134;
                ray->tfar = *(float *)(local_1e0 + lVar134 * 4);
                fVar251 = 1.0 - local_534;
                fVar249 = local_534 * 3.0;
                auVar263 = ZEXT464(0x3f000000);
                auVar174 = ZEXT416((uint)((fVar251 * -2.0 * local_534 + local_534 * local_534) * 0.5
                                         ));
                auVar174 = vshufps_avx(auVar174,auVar174,0);
                auVar186 = ZEXT416((uint)(((fVar251 + fVar251) * (fVar249 + 2.0) +
                                          fVar251 * fVar251 * -3.0) * 0.5));
                auVar186 = vshufps_avx(auVar186,auVar186,0);
                auVar169 = ZEXT416((uint)(((local_534 + local_534) * (fVar249 + -5.0) +
                                          local_534 * fVar249) * 0.5));
                auVar169 = vshufps_avx(auVar169,auVar169,0);
                auVar187 = ZEXT416((uint)((local_534 * (fVar251 + fVar251) - fVar251 * fVar251) *
                                         0.5));
                auVar187 = vshufps_avx(auVar187,auVar187,0);
                auVar185._0_4_ = fVar231 * auVar187._0_4_;
                auVar185._4_4_ = fVar242 * auVar187._4_4_;
                auVar185._8_4_ = fVar244 * auVar187._8_4_;
                auVar185._12_4_ = fVar246 * auVar187._12_4_;
                auVar195 = ZEXT1664(auVar185);
                auVar173._0_4_ =
                     auVar185._0_4_ +
                     auVar169._0_4_ * (float)local_5e0._0_4_ +
                     auVar174._0_4_ * (float)local_680._0_4_ +
                     auVar186._0_4_ * (float)local_740._0_4_;
                auVar173._4_4_ =
                     auVar185._4_4_ +
                     auVar169._4_4_ * (float)local_5e0._4_4_ +
                     auVar174._4_4_ * (float)local_680._4_4_ +
                     auVar186._4_4_ * (float)local_740._4_4_;
                auVar173._8_4_ =
                     auVar185._8_4_ +
                     auVar169._8_4_ * fStack_5d8 +
                     auVar174._8_4_ * fStack_678 + auVar186._8_4_ * fStack_738;
                auVar173._12_4_ =
                     auVar185._12_4_ +
                     auVar169._12_4_ * fStack_5d4 +
                     auVar174._12_4_ * fStack_674 + auVar186._12_4_ * fStack_734;
                local_6b0.context = context->user;
                local_540 = vmovlps_avx(auVar173);
                local_538 = vextractps_avx(auVar173,2);
                local_52c = (int)local_508;
                local_528 = (int)local_768;
                local_524 = (local_6b0.context)->instID[0];
                local_520 = (local_6b0.context)->instPrimID[0];
                local_7f4 = -1;
                local_6b0.valid = &local_7f4;
                local_6b0.geometryUserPtr = pGVar18->userPtr;
                local_6b0.ray = (RTCRayN *)ray;
                local_6b0.hit = (RTCHitN *)&local_540;
                local_6b0.N = 1;
                local_5a0._0_4_ = (int)uVar132;
                if (pGVar18->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0115bb78:
                  auVar303 = auVar149._0_32_;
                  p_Var133 = context->args->filter;
                  auVar12 = _local_7e0;
                  if (p_Var133 == (RTCFilterFunctionN)0x0) break;
                  if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                     (((pGVar18->field_8).field_0x2 & 0x40) != 0)) {
                    auVar195 = ZEXT1664(auVar195._0_16_);
                    auVar263 = ZEXT1664(auVar263._0_16_);
                    (*p_Var133)(&local_6b0);
                    uVar132 = (ulong)(uint)local_5a0._0_4_;
                    auVar149 = ZEXT3264(_local_620);
                    auVar327 = ZEXT3264(_local_760);
                    context = local_7f0;
                    ray = local_7e8;
                    pre = local_7c8;
                    fVar231 = (float)local_7e0._0_4_;
                    fVar242 = (float)local_7e0._4_4_;
                    fVar244 = (float)uStack_7d8;
                    fVar246 = uStack_7d8._4_4_;
                    fVar232 = (float)local_7c0._0_4_;
                    fVar243 = (float)local_7c0._4_4_;
                    fVar245 = fStack_7b8;
                    fVar247 = fStack_7b4;
                    fVar208 = fStack_7b0;
                    fVar212 = fStack_7ac;
                    fVar223 = fStack_7a8;
                    fVar213 = (float)local_560._0_4_;
                    fVar222 = (float)local_560._4_4_;
                    fVar224 = fStack_558;
                    fVar226 = fStack_554;
                    fVar225 = fStack_550;
                    fVar228 = fStack_54c;
                    fVar229 = fStack_548;
                  }
                  auVar303 = auVar149._0_32_;
                  auVar12 = _local_7e0;
                  if (*local_6b0.valid != 0) break;
                }
                else {
                  auVar195 = ZEXT1664(auVar185);
                  auVar263 = ZEXT1664(auVar263._0_16_);
                  (*pGVar18->occlusionFilterN)(&local_6b0);
                  uVar132 = (ulong)(uint)local_5a0._0_4_;
                  auVar149 = ZEXT3264(_local_620);
                  auVar327 = ZEXT3264(_local_760);
                  context = local_7f0;
                  ray = local_7e8;
                  pre = local_7c8;
                  fVar231 = (float)local_7e0._0_4_;
                  fVar242 = (float)local_7e0._4_4_;
                  fVar244 = (float)uStack_7d8;
                  fVar246 = uStack_7d8._4_4_;
                  fVar232 = (float)local_7c0._0_4_;
                  fVar243 = (float)local_7c0._4_4_;
                  fVar245 = fStack_7b8;
                  fVar247 = fStack_7b4;
                  fVar208 = fStack_7b0;
                  fVar212 = fStack_7ac;
                  fVar223 = fStack_7a8;
                  fVar213 = (float)local_560._0_4_;
                  fVar222 = (float)local_560._4_4_;
                  fVar224 = fStack_558;
                  fVar226 = fStack_554;
                  fVar225 = fStack_550;
                  fVar228 = fStack_54c;
                  fVar229 = fStack_548;
                  if (*local_6b0.valid != 0) goto LAB_0115bb78;
                }
                auVar303 = auVar149._0_32_;
                ray->tfar = (float)local_660;
                uVar129 = local_5c0._0_8_ ^ 1L << ((ulong)local_640 & 0x3f);
                lVar134 = 0;
                if (uVar129 != 0) {
                  for (; (uVar129 >> lVar134 & 1) == 0; lVar134 = lVar134 + 1) {
                  }
                }
                local_5c0._0_8_ = uVar129;
                uVar132 = CONCAT71((int7)(uVar132 >> 8),uVar129 != 0);
                auVar12 = _local_7e0;
              } while (uVar129 != 0);
            }
            _local_7e0 = auVar12;
            p_Var133 = (RTCFilterFunctionN)(uVar132 & 0xffffffffffffff01);
            auVar275 = ZEXT3264(local_580);
            fVar316 = (float)local_600._0_4_;
            fVar321 = (float)local_600._4_4_;
            fVar322 = fStack_5f8;
            fVar323 = fStack_5f4;
            fVar242 = fStack_5f0;
            fVar244 = fStack_5ec;
            fVar249 = fStack_5e8;
            fVar251 = fStack_5e4;
            fVar154 = (float)local_7a0._0_4_;
            fVar166 = (float)local_7a0._4_4_;
            fVar167 = fStack_798;
            fVar168 = fStack_794;
            fVar182 = fStack_790;
            fVar196 = fStack_78c;
            fVar199 = fStack_788;
            fVar202 = fStack_784;
            auVar12 = _local_7e0;
          }
        }
        _local_7e0 = auVar12;
        local_7f0 = context;
        local_7e8 = ray;
        local_7c8 = pre;
        auVar174 = local_720._0_16_;
      }
      if (8 < (int)uVar127) {
        _local_460 = vpshufd_avx(ZEXT416(uVar127),0);
        auVar174 = vshufps_avx(auVar174,auVar174,0);
        register0x00001210 = auVar174;
        _local_3c0 = auVar174;
        auVar116._4_4_ = uStack_6fc;
        auVar116._0_4_ = local_700;
        auVar116._8_4_ = fStack_6f8;
        auVar116._12_4_ = fStack_6f4;
        auVar174 = vpermilps_avx(auVar116,0);
        local_100._16_16_ = auVar174;
        local_100._0_16_ = auVar174;
        auVar138._0_4_ = 1.0 / local_440;
        auVar138._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar174 = vshufps_avx(auVar138,auVar138,0);
        register0x00001210 = auVar174;
        _local_120 = auVar174;
        auVar149 = ZEXT3264(_local_120);
        lVar134 = 8;
        local_580 = auVar275._0_32_;
        _local_620 = auVar303;
        do {
          pauVar1 = (undefined1 (*) [28])(catmullrom_basis0 + lVar134 * 4 + lVar131);
          fVar231 = *(float *)*pauVar1;
          fVar246 = *(float *)(*pauVar1 + 4);
          fVar252 = *(float *)(*pauVar1 + 8);
          fVar198 = *(float *)(*pauVar1 + 0xc);
          fVar205 = *(float *)(*pauVar1 + 0x10);
          fVar221 = *(float *)(*pauVar1 + 0x14);
          fVar227 = *(float *)(*pauVar1 + 0x18);
          auVar123 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar131 + 0x22307f0 + lVar134 * 4);
          fVar250 = *(float *)*pauVar1;
          fVar328 = *(float *)(*pauVar1 + 4);
          fVar338 = *(float *)(*pauVar1 + 8);
          fVar329 = *(float *)(*pauVar1 + 0xc);
          fVar253 = *(float *)(*pauVar1 + 0x10);
          fVar330 = *(float *)(*pauVar1 + 0x14);
          fVar170 = *(float *)(*pauVar1 + 0x18);
          auVar122 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar131 + 0x2230c74 + lVar134 * 4);
          fVar286 = *(float *)*pauVar1;
          fVar201 = *(float *)(*pauVar1 + 4);
          fVar279 = *(float *)(*pauVar1 + 8);
          fVar291 = *(float *)(*pauVar1 + 0xc);
          fVar292 = *(float *)(*pauVar1 + 0x10);
          fVar204 = *(float *)(*pauVar1 + 0x14);
          fVar281 = *(float *)(*pauVar1 + 0x18);
          auVar121 = *pauVar1;
          pauVar1 = (undefined1 (*) [28])(lVar131 + 0x22310f8 + lVar134 * 4);
          fVar293 = *(float *)*pauVar1;
          fVar295 = *(float *)(*pauVar1 + 4);
          fVar207 = *(float *)(*pauVar1 + 8);
          fVar283 = *(float *)(*pauVar1 + 0xc);
          fVar297 = *(float *)(*pauVar1 + 0x10);
          fVar299 = *(float *)(*pauVar1 + 0x14);
          fVar210 = *(float *)(*pauVar1 + 0x18);
          auVar120 = *pauVar1;
          fVar211 = auVar327._0_4_;
          fVar151 = auVar327._4_4_;
          fVar152 = auVar327._8_4_;
          fVar153 = auVar327._12_4_;
          fVar248 = auVar327._16_4_;
          fVar183 = auVar327._20_4_;
          fVar197 = auVar327._24_4_;
          fVar136 = auVar195._28_4_;
          fVar181 = fVar136 + *(float *)pauVar1[1];
          fStack_6e4 = fVar136 + fVar136 + auVar149._28_4_;
          fVar230 = fVar136 + fVar181;
          auVar306._0_4_ =
               (float)local_c0._0_4_ * fVar231 +
               fVar250 * fVar316 + fVar211 * fVar286 + (float)local_420._0_4_ * fVar293;
          auVar306._4_4_ =
               (float)local_c0._4_4_ * fVar246 +
               fVar328 * fVar321 + fVar151 * fVar201 + (float)local_420._4_4_ * fVar295;
          auVar306._8_4_ =
               fStack_b8 * fVar252 + fVar338 * fVar322 + fVar152 * fVar279 + fStack_418 * fVar207;
          auVar306._12_4_ =
               fStack_b4 * fVar198 + fVar329 * fVar323 + fVar153 * fVar291 + fStack_414 * fVar283;
          auVar306._16_4_ =
               fStack_b0 * fVar205 + fVar253 * fVar242 + fVar248 * fVar292 + fStack_410 * fVar297;
          auVar306._20_4_ =
               fStack_ac * fVar221 + fVar330 * fVar244 + fVar183 * fVar204 + fStack_40c * fVar299;
          auVar306._24_4_ =
               fStack_a8 * fVar227 + fVar170 * fVar249 + fVar197 * fVar281 + fStack_408 * fVar210;
          auVar306._28_4_ = fVar181 + fStack_6e4;
          local_720._0_4_ =
               fVar213 * fVar250 + fVar232 * fVar286 + fVar154 * fVar293 +
               (float)local_380._0_4_ * fVar231;
          local_720._4_4_ =
               fVar222 * fVar328 + fVar243 * fVar201 + fVar166 * fVar295 +
               (float)local_380._4_4_ * fVar246;
          local_720._8_4_ =
               fVar224 * fVar338 + fVar245 * fVar279 + fVar167 * fVar207 + fStack_378 * fVar252;
          local_720._12_4_ =
               fVar226 * fVar329 + fVar247 * fVar291 + fVar168 * fVar283 + fStack_374 * fVar198;
          local_720._16_4_ =
               fVar225 * fVar253 + fVar208 * fVar292 + fVar182 * fVar297 + fStack_370 * fVar205;
          local_720._20_4_ =
               fVar228 * fVar330 + fVar212 * fVar204 + fVar196 * fVar299 + fStack_36c * fVar221;
          local_720._24_4_ =
               fVar229 * fVar170 + fVar223 * fVar281 + fVar199 * fVar210 + fStack_368 * fVar227;
          local_720._28_4_ = fVar136 + fVar136 + auVar263._28_4_ + fStack_6e4;
          fVar136 = fVar231 * (float)local_160._0_4_ +
                    (float)local_a0._0_4_ * fVar250 +
                    fVar286 * (float)local_320._0_4_ + fVar293 * (float)local_140._0_4_;
          fVar150 = fVar246 * (float)local_160._4_4_ +
                    (float)local_a0._4_4_ * fVar328 +
                    fVar201 * (float)local_320._4_4_ + fVar295 * (float)local_140._4_4_;
          fStack_6f8 = fVar252 * fStack_158 +
                       fStack_98 * fVar338 + fVar279 * fStack_318 + fVar207 * fStack_138;
          fStack_6f4 = fVar198 * fStack_154 +
                       fStack_94 * fVar329 + fVar291 * fStack_314 + fVar283 * fStack_134;
          fStack_6f0 = fVar205 * fStack_150 +
                       fStack_90 * fVar253 + fVar292 * fStack_310 + fVar297 * fStack_130;
          fStack_6ec = fVar221 * fStack_14c +
                       fStack_8c * fVar330 + fVar204 * fStack_30c + fVar299 * fStack_12c;
          fStack_6e8 = fVar227 * fStack_148 +
                       fStack_88 * fVar170 + fVar281 * fStack_308 + fVar210 * fStack_128;
          fStack_6e4 = fStack_6e4 + fVar230;
          pauVar1 = (undefined1 (*) [28])(catmullrom_basis1 + lVar134 * 4 + lVar131);
          fVar250 = *(float *)*pauVar1;
          fVar328 = *(float *)(*pauVar1 + 4);
          fVar338 = *(float *)(*pauVar1 + 8);
          fVar329 = *(float *)(*pauVar1 + 0xc);
          fVar253 = *(float *)(*pauVar1 + 0x10);
          fVar330 = *(float *)(*pauVar1 + 0x14);
          fVar170 = *(float *)(*pauVar1 + 0x18);
          auVar125 = *pauVar1;
          pfVar2 = (float *)(lVar131 + 0x2232c10 + lVar134 * 4);
          fVar286 = *pfVar2;
          fVar201 = pfVar2[1];
          fVar279 = pfVar2[2];
          fVar291 = pfVar2[3];
          fVar292 = pfVar2[4];
          fVar204 = pfVar2[5];
          fVar281 = pfVar2[6];
          auVar139 = *(undefined1 (*) [32])(lVar131 + 0x2233094 + lVar134 * 4);
          auVar149 = ZEXT3264(auVar139);
          pauVar3 = (undefined1 (*) [28])(lVar131 + 0x2233518 + lVar134 * 4);
          fVar293 = *(float *)*pauVar3;
          fVar295 = *(float *)(*pauVar3 + 4);
          fVar207 = *(float *)(*pauVar3 + 8);
          fVar283 = *(float *)(*pauVar3 + 0xc);
          fVar297 = *(float *)(*pauVar3 + 0x10);
          fVar299 = *(float *)(*pauVar3 + 0x14);
          fVar210 = *(float *)(*pauVar3 + 0x18);
          auVar124 = *pauVar3;
          fVar181 = *(float *)pauVar3[1];
          fVar231 = auVar139._0_4_;
          fVar246 = auVar139._4_4_;
          fVar252 = auVar139._8_4_;
          fVar198 = auVar139._12_4_;
          fVar205 = auVar139._16_4_;
          fVar221 = auVar139._20_4_;
          fVar227 = auVar139._24_4_;
          fVar230 = fVar181 + fVar181 + fVar230;
          auVar335._0_4_ =
               (float)local_c0._0_4_ * fVar250 +
               fVar286 * fVar316 + fVar211 * fVar231 + (float)local_420._0_4_ * fVar293;
          auVar335._4_4_ =
               (float)local_c0._4_4_ * fVar328 +
               fVar201 * fVar321 + fVar151 * fVar246 + (float)local_420._4_4_ * fVar295;
          auVar335._8_4_ =
               fStack_b8 * fVar338 + fVar279 * fVar322 + fVar152 * fVar252 + fStack_418 * fVar207;
          auVar335._12_4_ =
               fStack_b4 * fVar329 + fVar291 * fVar323 + fVar153 * fVar198 + fStack_414 * fVar283;
          auVar335._16_4_ =
               fStack_b0 * fVar253 + fVar292 * fVar242 + fVar248 * fVar205 + fStack_410 * fVar297;
          auVar335._20_4_ =
               fStack_ac * fVar330 + fVar204 * fVar244 + fVar183 * fVar221 + fStack_40c * fVar299;
          auVar335._24_4_ =
               fStack_a8 * fVar170 + fVar281 * fVar249 + fVar197 * fVar227 + fStack_408 * fVar210;
          auVar335._28_4_ = fVar251 + fVar230;
          local_5c0._0_4_ =
               fVar250 * (float)local_380._0_4_ +
               fVar213 * fVar286 + fVar232 * fVar231 + fVar154 * fVar293;
          local_5c0._4_4_ =
               fVar328 * (float)local_380._4_4_ +
               fVar222 * fVar201 + fVar243 * fVar246 + fVar166 * fVar295;
          local_5c0._8_4_ =
               fVar338 * fStack_378 + fVar224 * fVar279 + fVar245 * fVar252 + fVar167 * fVar207;
          local_5c0._12_4_ =
               fVar329 * fStack_374 + fVar226 * fVar291 + fVar247 * fVar198 + fVar168 * fVar283;
          local_5c0._16_4_ =
               fVar253 * fStack_370 + fVar225 * fVar292 + fVar208 * fVar205 + fVar182 * fVar297;
          local_5c0._20_4_ =
               fVar330 * fStack_36c + fVar228 * fVar204 + fVar212 * fVar221 + fVar196 * fVar299;
          local_5c0._24_4_ =
               fVar170 * fStack_368 + fVar229 * fVar281 + fVar223 * fVar227 + fVar199 * fVar210;
          local_5c0._28_4_ = fVar230 + fVar181 + fVar181 + fVar202;
          auVar274._0_4_ =
               (float)local_a0._0_4_ * fVar286 +
               fVar231 * (float)local_320._0_4_ + fVar293 * (float)local_140._0_4_ +
               fVar250 * (float)local_160._0_4_;
          auVar274._4_4_ =
               (float)local_a0._4_4_ * fVar201 +
               fVar246 * (float)local_320._4_4_ + fVar295 * (float)local_140._4_4_ +
               fVar328 * (float)local_160._4_4_;
          auVar274._8_4_ =
               fStack_98 * fVar279 + fVar252 * fStack_318 + fVar207 * fStack_138 +
               fVar338 * fStack_158;
          auVar274._12_4_ =
               fStack_94 * fVar291 + fVar198 * fStack_314 + fVar283 * fStack_134 +
               fVar329 * fStack_154;
          auVar274._16_4_ =
               fStack_90 * fVar292 + fVar205 * fStack_310 + fVar297 * fStack_130 +
               fVar253 * fStack_150;
          auVar274._20_4_ =
               fStack_8c * fVar204 + fVar221 * fStack_30c + fVar299 * fStack_12c +
               fVar330 * fStack_14c;
          auVar274._24_4_ =
               fStack_88 * fVar281 + fVar227 * fStack_308 + fVar210 * fStack_128 +
               fVar170 * fStack_148;
          auVar274._28_4_ = fVar181 + fVar181 + fStack_404 + fVar230;
          auVar23 = vsubps_avx(auVar335,auVar306);
          _local_4a0 = vsubps_avx(local_5c0,local_720);
          fVar208 = auVar23._0_4_;
          fVar212 = auVar23._4_4_;
          auVar71._4_4_ = fVar212 * local_720._4_4_;
          auVar71._0_4_ = fVar208 * local_720._0_4_;
          fVar223 = auVar23._8_4_;
          auVar71._8_4_ = fVar223 * local_720._8_4_;
          fVar225 = auVar23._12_4_;
          auVar71._12_4_ = fVar225 * local_720._12_4_;
          fVar228 = auVar23._16_4_;
          auVar71._16_4_ = fVar228 * local_720._16_4_;
          fVar229 = auVar23._20_4_;
          auVar71._20_4_ = fVar229 * local_720._20_4_;
          fVar250 = auVar23._24_4_;
          auVar71._24_4_ = fVar250 * local_720._24_4_;
          auVar71._28_4_ = fVar230;
          fVar242 = local_4a0._0_4_;
          fVar244 = local_4a0._4_4_;
          auVar72._4_4_ = auVar306._4_4_ * fVar244;
          auVar72._0_4_ = auVar306._0_4_ * fVar242;
          fVar249 = local_4a0._8_4_;
          auVar72._8_4_ = auVar306._8_4_ * fVar249;
          fVar182 = local_4a0._12_4_;
          auVar72._12_4_ = auVar306._12_4_ * fVar182;
          fVar196 = local_4a0._16_4_;
          auVar72._16_4_ = auVar306._16_4_ * fVar196;
          fVar199 = local_4a0._20_4_;
          auVar72._20_4_ = auVar306._20_4_ * fVar199;
          fVar202 = local_4a0._24_4_;
          auVar72._24_4_ = auVar306._24_4_ * fVar202;
          auVar72._28_4_ = local_5c0._28_4_;
          auVar24 = vsubps_avx(auVar71,auVar72);
          auVar117._4_4_ = fVar150;
          auVar117._0_4_ = fVar136;
          auVar117._8_4_ = fStack_6f8;
          auVar117._12_4_ = fStack_6f4;
          auVar117._16_4_ = fStack_6f0;
          auVar117._20_4_ = fStack_6ec;
          auVar117._24_4_ = fStack_6e8;
          auVar117._28_4_ = fStack_6e4;
          auVar22 = vmaxps_avx(auVar117,auVar274);
          auVar73._4_4_ = auVar22._4_4_ * auVar22._4_4_ * (fVar212 * fVar212 + fVar244 * fVar244);
          auVar73._0_4_ = auVar22._0_4_ * auVar22._0_4_ * (fVar208 * fVar208 + fVar242 * fVar242);
          auVar73._8_4_ = auVar22._8_4_ * auVar22._8_4_ * (fVar223 * fVar223 + fVar249 * fVar249);
          auVar73._12_4_ = auVar22._12_4_ * auVar22._12_4_ * (fVar225 * fVar225 + fVar182 * fVar182)
          ;
          auVar73._16_4_ = auVar22._16_4_ * auVar22._16_4_ * (fVar228 * fVar228 + fVar196 * fVar196)
          ;
          auVar73._20_4_ = auVar22._20_4_ * auVar22._20_4_ * (fVar229 * fVar229 + fVar199 * fVar199)
          ;
          auVar73._24_4_ = auVar22._24_4_ * auVar22._24_4_ * (fVar250 * fVar250 + fVar202 * fVar202)
          ;
          auVar73._28_4_ = fVar251 + local_5c0._28_4_;
          auVar74._4_4_ = auVar24._4_4_ * auVar24._4_4_;
          auVar74._0_4_ = auVar24._0_4_ * auVar24._0_4_;
          auVar74._8_4_ = auVar24._8_4_ * auVar24._8_4_;
          auVar74._12_4_ = auVar24._12_4_ * auVar24._12_4_;
          auVar74._16_4_ = auVar24._16_4_ * auVar24._16_4_;
          auVar74._20_4_ = auVar24._20_4_ * auVar24._20_4_;
          auVar74._24_4_ = auVar24._24_4_ * auVar24._24_4_;
          auVar74._28_4_ = auVar24._28_4_;
          auVar22 = vcmpps_avx(auVar74,auVar73,2);
          auVar195 = ZEXT3264(auVar22);
          local_2a0 = (uint)lVar134;
          auVar186 = vpshufd_avx(ZEXT416(local_2a0),0);
          auVar174 = vpor_avx(auVar186,_DAT_01ff0cf0);
          auVar186 = vpor_avx(auVar186,_DAT_02020ea0);
          auVar174 = vpcmpgtd_avx(_local_460,auVar174);
          auVar263 = ZEXT1664(auVar174);
          auVar186 = vpcmpgtd_avx(_local_460,auVar186);
          register0x00001290 = auVar186;
          _local_480 = auVar174;
          auVar24 = _local_480 & auVar22;
          fVar316 = (float)local_600._0_4_;
          fVar321 = (float)local_600._4_4_;
          fVar322 = fStack_5f8;
          fVar323 = fStack_5f4;
          fVar242 = fStack_5f0;
          fVar244 = fStack_5ec;
          fVar249 = fStack_5e8;
          fVar251 = fStack_5e4;
          fVar154 = (float)local_7a0._0_4_;
          fVar166 = (float)local_7a0._4_4_;
          fVar167 = fStack_798;
          fVar168 = fStack_794;
          fVar182 = fStack_790;
          fVar196 = fStack_78c;
          fVar199 = fStack_788;
          fVar202 = fStack_784;
          fVar232 = (float)local_7c0._0_4_;
          fVar243 = (float)local_7c0._4_4_;
          fVar245 = fStack_7b8;
          fVar247 = fStack_7b4;
          fVar208 = fStack_7b0;
          fVar212 = fStack_7ac;
          fVar223 = fStack_7a8;
          fVar213 = (float)local_560._0_4_;
          fVar222 = (float)local_560._4_4_;
          fVar224 = fStack_558;
          fVar226 = fStack_554;
          fVar225 = fStack_550;
          fVar228 = fStack_54c;
          fVar229 = fStack_548;
          if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar24 >> 0x7f,0) == '\0') &&
                (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar24 >> 0xbf,0) == '\0') &&
              (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar24[0x1f]) {
            auVar275 = ZEXT3264(local_580);
            auVar327 = ZEXT3264(auVar327._0_32_);
          }
          else {
            local_680._0_4_ = auVar125._0_4_;
            local_680._4_4_ = auVar125._4_4_;
            fStack_678 = auVar125._8_4_;
            fStack_674 = auVar125._12_4_;
            auStack_670._0_4_ = auVar125._16_4_;
            auStack_670._4_4_ = auVar125._20_4_;
            fStack_668 = auVar125._24_4_;
            local_500._0_4_ = auVar124._0_4_;
            local_500._4_4_ = auVar124._4_4_;
            fStack_4f8 = auVar124._8_4_;
            fStack_4f4 = auVar124._12_4_;
            fStack_4f0 = auVar124._16_4_;
            fStack_4ec = auVar124._20_4_;
            fStack_4e8 = auVar124._24_4_;
            local_500._0_4_ =
                 (float)local_620._0_4_ * (float)local_680._0_4_ +
                 fVar286 * (float)local_360._0_4_ +
                 (float)local_e0._0_4_ * fVar231 + (float)local_340._0_4_ * (float)local_500._0_4_;
            local_500._4_4_ =
                 (float)local_620._4_4_ * (float)local_680._4_4_ +
                 fVar201 * (float)local_360._4_4_ +
                 (float)local_e0._4_4_ * fVar246 + (float)local_340._4_4_ * (float)local_500._4_4_;
            fStack_4f8 = fStack_618 * fStack_678 +
                         fVar279 * fStack_358 + fStack_d8 * fVar252 + fStack_338 * fStack_4f8;
            fStack_4f4 = fStack_614 * fStack_674 +
                         fVar291 * fStack_354 + fStack_d4 * fVar198 + fStack_334 * fStack_4f4;
            fStack_4f0 = fStack_610 * (float)auStack_670._0_4_ +
                         fVar292 * fStack_350 + fStack_d0 * fVar205 + fStack_330 * fStack_4f0;
            fStack_4ec = fStack_60c * (float)auStack_670._4_4_ +
                         fVar204 * fStack_34c + fStack_cc * fVar221 + fStack_32c * fStack_4ec;
            fStack_4e8 = fStack_608 * fStack_668 +
                         fVar281 * fStack_348 + fStack_c8 * fVar227 + fStack_328 * fStack_4e8;
            fStack_4e4 = auVar306._28_4_ + auVar139._28_4_ + fStack_604 + 0.0;
            local_660 = auVar122._0_4_;
            auStack_65c._0_4_ = auVar122._4_4_;
            auStack_65c._4_4_ = auVar122._8_4_;
            fStack_654 = auVar122._12_4_;
            fStack_650 = auVar122._16_4_;
            fStack_64c = auVar122._20_4_;
            fStack_648 = auVar122._24_4_;
            local_5e0._0_4_ = auVar121._0_4_;
            local_5e0._4_4_ = auVar121._4_4_;
            fStack_5d8 = auVar121._8_4_;
            fStack_5d4 = auVar121._12_4_;
            auStack_5d0._0_4_ = auVar121._16_4_;
            auStack_5d0._4_4_ = auVar121._20_4_;
            fStack_5c8 = auVar121._24_4_;
            local_740._0_4_ = auVar120._0_4_;
            local_740._4_4_ = auVar120._4_4_;
            fStack_738 = auVar120._8_4_;
            fStack_734 = auVar120._12_4_;
            auStack_730._0_4_ = auVar120._16_4_;
            auStack_730._4_4_ = auVar120._20_4_;
            fStack_728 = auVar120._24_4_;
            pfVar4 = (float *)(lVar131 + 0x2231e84 + lVar134 * 4);
            fVar231 = *pfVar4;
            fVar246 = pfVar4[1];
            fVar252 = pfVar4[2];
            fVar198 = pfVar4[3];
            fVar205 = pfVar4[4];
            fVar221 = pfVar4[5];
            fVar227 = pfVar4[6];
            pfVar5 = (float *)(lVar131 + 0x2232308 + lVar134 * 4);
            fVar250 = *pfVar5;
            fVar328 = pfVar5[1];
            fVar338 = pfVar5[2];
            fVar329 = pfVar5[3];
            fVar253 = pfVar5[4];
            fVar330 = pfVar5[5];
            fVar170 = pfVar5[6];
            fVar265 = pfVar2[7] + 0.0;
            pfVar6 = (float *)(lVar131 + 0x2231a00 + lVar134 * 4);
            fVar286 = *pfVar6;
            fVar201 = pfVar6[1];
            fVar279 = pfVar6[2];
            fVar291 = pfVar6[3];
            fVar292 = pfVar6[4];
            fVar204 = pfVar6[5];
            fVar281 = pfVar6[6];
            fVar181 = pfVar4[7] + pfVar5[7];
            fVar230 = pfVar5[7] + fVar265;
            fVar265 = pfVar2[7] + *(float *)pauVar1[1] + fVar265;
            pfVar2 = (float *)(lVar131 + 0x223157c + lVar134 * 4);
            fVar293 = *pfVar2;
            fVar295 = pfVar2[1];
            fVar207 = pfVar2[2];
            fVar283 = pfVar2[3];
            fVar297 = pfVar2[4];
            fVar299 = pfVar2[5];
            fVar210 = pfVar2[6];
            local_440 = (float)local_c0._0_4_ * fVar293 +
                        fVar286 * (float)local_600._0_4_ +
                        fVar211 * fVar231 + (float)local_420._0_4_ * fVar250;
            fStack_43c = (float)local_c0._4_4_ * fVar295 +
                         fVar201 * (float)local_600._4_4_ +
                         fVar151 * fVar246 + (float)local_420._4_4_ * fVar328;
            fStack_438 = fStack_b8 * fVar207 +
                         fVar279 * fStack_5f8 + fVar152 * fVar252 + fStack_418 * fVar338;
            fStack_434 = fStack_b4 * fVar283 +
                         fVar291 * fStack_5f4 + fVar153 * fVar198 + fStack_414 * fVar329;
            fStack_430 = fStack_b0 * fVar297 +
                         fVar292 * fStack_5f0 + fVar248 * fVar205 + fStack_410 * fVar253;
            fStack_42c = fStack_ac * fVar299 +
                         fVar204 * fStack_5ec + fVar183 * fVar221 + fStack_40c * fVar330;
            fStack_428 = fStack_a8 * fVar210 +
                         fVar281 * fStack_5e8 + fVar197 * fVar227 + fStack_408 * fVar170;
            fStack_424 = fVar181 + fVar230;
            local_3a0._4_4_ =
                 fVar295 * (float)local_380._4_4_ +
                 fVar246 * (float)local_7c0._4_4_ + (float)local_7a0._4_4_ * fVar328 +
                 (float)local_560._4_4_ * fVar201;
            local_3a0._0_4_ =
                 fVar293 * (float)local_380._0_4_ +
                 fVar231 * (float)local_7c0._0_4_ + (float)local_7a0._0_4_ * fVar250 +
                 (float)local_560._0_4_ * fVar286;
            fStack_398 = fVar207 * fStack_378 +
                         fVar252 * fStack_7b8 + fStack_798 * fVar338 + fStack_558 * fVar279;
            fStack_394 = fVar283 * fStack_374 +
                         fVar198 * fStack_7b4 + fStack_794 * fVar329 + fStack_554 * fVar291;
            fStack_390 = fVar297 * fStack_370 +
                         fVar205 * fStack_7b0 + fStack_790 * fVar253 + fStack_550 * fVar292;
            fStack_38c = fVar299 * fStack_36c +
                         fVar221 * fStack_7ac + fStack_78c * fVar330 + fStack_54c * fVar204;
            fStack_388 = fVar210 * fStack_368 +
                         fVar227 * fStack_7a8 + fStack_788 * fVar170 + fStack_548 * fVar281;
            fStack_384 = fVar230 + fVar265;
            auVar341._0_4_ =
                 fVar286 * (float)local_360._0_4_ +
                 (float)local_e0._0_4_ * fVar231 + (float)local_340._0_4_ * fVar250 +
                 fVar293 * (float)local_620._0_4_;
            auVar341._4_4_ =
                 fVar201 * (float)local_360._4_4_ +
                 (float)local_e0._4_4_ * fVar246 + (float)local_340._4_4_ * fVar328 +
                 fVar295 * (float)local_620._4_4_;
            auVar341._8_4_ =
                 fVar279 * fStack_358 + fStack_d8 * fVar252 + fStack_338 * fVar338 +
                 fVar207 * fStack_618;
            auVar341._12_4_ =
                 fVar291 * fStack_354 + fStack_d4 * fVar198 + fStack_334 * fVar329 +
                 fVar283 * fStack_614;
            auVar341._16_4_ =
                 fVar292 * fStack_350 + fStack_d0 * fVar205 + fStack_330 * fVar253 +
                 fVar297 * fStack_610;
            auVar341._20_4_ =
                 fVar204 * fStack_34c + fStack_cc * fVar221 + fStack_32c * fVar330 +
                 fVar299 * fStack_60c;
            auVar341._24_4_ =
                 fVar281 * fStack_348 + fStack_c8 * fVar227 + fStack_328 * fVar170 +
                 fVar210 * fStack_608;
            auVar341._28_4_ = pfVar6[7] + fVar181 + fVar265;
            pfVar2 = (float *)(lVar131 + 0x22342a4 + lVar134 * 4);
            fVar231 = *pfVar2;
            fVar246 = pfVar2[1];
            fVar252 = pfVar2[2];
            fVar198 = pfVar2[3];
            fVar205 = pfVar2[4];
            fVar221 = pfVar2[5];
            fVar227 = pfVar2[6];
            pfVar4 = (float *)(lVar131 + 0x2234728 + lVar134 * 4);
            fVar250 = *pfVar4;
            fVar328 = pfVar4[1];
            fVar338 = pfVar4[2];
            fVar329 = pfVar4[3];
            fVar253 = pfVar4[4];
            fVar330 = pfVar4[5];
            fVar170 = pfVar4[6];
            pfVar5 = (float *)(lVar131 + 0x2233e20 + lVar134 * 4);
            fVar286 = *pfVar5;
            fVar201 = pfVar5[1];
            fVar279 = pfVar5[2];
            fVar291 = pfVar5[3];
            fVar292 = pfVar5[4];
            fVar204 = pfVar5[5];
            fVar281 = pfVar5[6];
            pfVar6 = (float *)(lVar131 + 0x223399c + lVar134 * 4);
            fVar293 = *pfVar6;
            fVar295 = pfVar6[1];
            fVar207 = pfVar6[2];
            fVar283 = pfVar6[3];
            fVar297 = pfVar6[4];
            fVar299 = pfVar6[5];
            fVar210 = pfVar6[6];
            auVar307._0_4_ =
                 (float)local_c0._0_4_ * fVar293 +
                 fVar286 * (float)local_600._0_4_ +
                 fVar231 * (float)local_760._0_4_ + (float)local_420._0_4_ * fVar250;
            auVar307._4_4_ =
                 (float)local_c0._4_4_ * fVar295 +
                 fVar201 * (float)local_600._4_4_ +
                 fVar246 * (float)local_760._4_4_ + (float)local_420._4_4_ * fVar328;
            auVar307._8_4_ =
                 fStack_b8 * fVar207 +
                 fVar279 * fStack_5f8 + fVar252 * fStack_758 + fStack_418 * fVar338;
            auVar307._12_4_ =
                 fStack_b4 * fVar283 +
                 fVar291 * fStack_5f4 + fVar198 * fStack_754 + fStack_414 * fVar329;
            auVar307._16_4_ =
                 fStack_b0 * fVar297 +
                 fVar292 * fStack_5f0 + fVar205 * fStack_750 + fStack_410 * fVar253;
            auVar307._20_4_ =
                 fStack_ac * fVar299 +
                 fVar204 * fStack_5ec + fVar221 * fStack_74c + fStack_40c * fVar330;
            auVar307._24_4_ =
                 fStack_a8 * fVar210 +
                 fVar281 * fStack_5e8 + fVar227 * fStack_748 + fStack_408 * fVar170;
            auVar307._28_4_ = fStack_784 + fStack_784 + fStack_404 + auVar335._28_4_;
            auVar336._0_4_ =
                 fVar293 * (float)local_380._0_4_ +
                 (float)local_560._0_4_ * fVar286 +
                 fVar231 * (float)local_7c0._0_4_ + (float)local_7a0._0_4_ * fVar250;
            auVar336._4_4_ =
                 fVar295 * (float)local_380._4_4_ +
                 (float)local_560._4_4_ * fVar201 +
                 fVar246 * (float)local_7c0._4_4_ + (float)local_7a0._4_4_ * fVar328;
            auVar336._8_4_ =
                 fVar207 * fStack_378 +
                 fStack_558 * fVar279 + fVar252 * fStack_7b8 + fStack_798 * fVar338;
            auVar336._12_4_ =
                 fVar283 * fStack_374 +
                 fStack_554 * fVar291 + fVar198 * fStack_7b4 + fStack_794 * fVar329;
            auVar336._16_4_ =
                 fVar297 * fStack_370 +
                 fStack_550 * fVar292 + fVar205 * fStack_7b0 + fStack_790 * fVar253;
            auVar336._20_4_ =
                 fVar299 * fStack_36c +
                 fStack_54c * fVar204 + fVar221 * fStack_7ac + fStack_78c * fVar330;
            auVar336._24_4_ =
                 fVar210 * fStack_368 +
                 fStack_548 * fVar281 + fVar227 * fStack_7a8 + fStack_788 * fVar170;
            auVar336._28_4_ = fStack_784 + fStack_784 + auVar335._28_4_ + fStack_784;
            auVar241._8_4_ = 0x7fffffff;
            auVar241._0_8_ = 0x7fffffff7fffffff;
            auVar241._12_4_ = 0x7fffffff;
            auVar241._16_4_ = 0x7fffffff;
            auVar241._20_4_ = 0x7fffffff;
            auVar241._24_4_ = 0x7fffffff;
            auVar241._28_4_ = 0x7fffffff;
            auVar119._4_4_ = fStack_43c;
            auVar119._0_4_ = local_440;
            auVar119._8_4_ = fStack_438;
            auVar119._12_4_ = fStack_434;
            auVar119._16_4_ = fStack_430;
            auVar119._20_4_ = fStack_42c;
            auVar119._24_4_ = fStack_428;
            auVar119._28_4_ = fStack_424;
            auVar139 = vandps_avx(auVar119,auVar241);
            auVar24 = vandps_avx(_local_3a0,auVar241);
            auVar24 = vmaxps_avx(auVar139,auVar24);
            auVar139 = vandps_avx(auVar341,auVar241);
            auVar24 = vmaxps_avx(auVar24,auVar139);
            auVar24 = vcmpps_avx(auVar24,_local_3c0,1);
            auVar25 = vblendvps_avx(auVar119,auVar23,auVar24);
            auVar146._0_4_ =
                 fVar293 * (float)local_620._0_4_ +
                 fVar286 * (float)local_360._0_4_ +
                 fVar250 * (float)local_340._0_4_ + (float)local_e0._0_4_ * fVar231;
            auVar146._4_4_ =
                 fVar295 * (float)local_620._4_4_ +
                 fVar201 * (float)local_360._4_4_ +
                 fVar328 * (float)local_340._4_4_ + (float)local_e0._4_4_ * fVar246;
            auVar146._8_4_ =
                 fVar207 * fStack_618 +
                 fVar279 * fStack_358 + fVar338 * fStack_338 + fStack_d8 * fVar252;
            auVar146._12_4_ =
                 fVar283 * fStack_614 +
                 fVar291 * fStack_354 + fVar329 * fStack_334 + fStack_d4 * fVar198;
            auVar146._16_4_ =
                 fVar297 * fStack_610 +
                 fVar292 * fStack_350 + fVar253 * fStack_330 + fStack_d0 * fVar205;
            auVar146._20_4_ =
                 fVar299 * fStack_60c +
                 fVar204 * fStack_34c + fVar330 * fStack_32c + fStack_cc * fVar221;
            auVar146._24_4_ =
                 fVar210 * fStack_608 +
                 fVar281 * fStack_348 + fVar170 * fStack_328 + fStack_c8 * fVar227;
            auVar146._28_4_ = auVar139._28_4_ + pfVar5[7] + pfVar4[7] + pfVar2[7];
            auVar26 = vblendvps_avx(_local_3a0,_local_4a0,auVar24);
            auVar139 = vandps_avx(auVar307,auVar241);
            auVar24 = vandps_avx(auVar336,auVar241);
            auVar27 = vmaxps_avx(auVar139,auVar24);
            auVar139 = vandps_avx(auVar146,auVar241);
            auVar139 = vmaxps_avx(auVar27,auVar139);
            local_640._0_4_ = auVar123._0_4_;
            local_640._4_4_ = auVar123._4_4_;
            fStack_638 = auVar123._8_4_;
            fStack_634 = auVar123._12_4_;
            auStack_630._0_4_ = auVar123._16_4_;
            auStack_630._4_4_ = auVar123._20_4_;
            fStack_628 = auVar123._24_4_;
            auVar24 = vcmpps_avx(auVar139,_local_3c0,1);
            auVar139 = vblendvps_avx(auVar307,auVar23,auVar24);
            auVar147._0_4_ =
                 (float)local_620._0_4_ * (float)local_640._0_4_ +
                 (float)local_360._0_4_ * (float)local_660 +
                 (float)local_e0._0_4_ * (float)local_5e0._0_4_ +
                 (float)local_340._0_4_ * (float)local_740._0_4_;
            auVar147._4_4_ =
                 (float)local_620._4_4_ * (float)local_640._4_4_ +
                 (float)local_360._4_4_ * (float)auStack_65c._0_4_ +
                 (float)local_e0._4_4_ * (float)local_5e0._4_4_ +
                 (float)local_340._4_4_ * (float)local_740._4_4_;
            auVar147._8_4_ =
                 fStack_618 * fStack_638 +
                 fStack_358 * (float)auStack_65c._4_4_ +
                 fStack_d8 * fStack_5d8 + fStack_338 * fStack_738;
            auVar147._12_4_ =
                 fStack_614 * fStack_634 +
                 fStack_354 * fStack_654 + fStack_d4 * fStack_5d4 + fStack_334 * fStack_734;
            auVar147._16_4_ =
                 fStack_610 * (float)auStack_630._0_4_ +
                 fStack_350 * fStack_650 +
                 fStack_d0 * (float)auStack_5d0._0_4_ + fStack_330 * (float)auStack_730._0_4_;
            auVar147._20_4_ =
                 fStack_60c * (float)auStack_630._4_4_ +
                 fStack_34c * fStack_64c +
                 fStack_cc * (float)auStack_5d0._4_4_ + fStack_32c * (float)auStack_730._4_4_;
            auVar147._24_4_ =
                 fStack_608 * fStack_628 +
                 fStack_348 * fStack_648 + fStack_c8 * fStack_5c8 + fStack_328 * fStack_728;
            auVar147._28_4_ = auVar27._28_4_ + fStack_4e4 + fStack_604 + 0.0;
            auVar24 = vblendvps_avx(auVar336,_local_4a0,auVar24);
            fVar183 = auVar25._0_4_;
            fVar197 = auVar25._4_4_;
            fVar265 = auVar25._8_4_;
            fVar200 = auVar25._12_4_;
            fVar203 = auVar25._16_4_;
            fVar206 = auVar25._20_4_;
            fVar209 = auVar25._24_4_;
            fVar285 = auVar25._28_4_;
            fVar286 = auVar139._0_4_;
            fVar279 = auVar139._4_4_;
            fVar292 = auVar139._8_4_;
            fVar281 = auVar139._12_4_;
            fVar295 = auVar139._16_4_;
            fVar283 = auVar139._20_4_;
            fVar299 = auVar139._24_4_;
            fVar231 = auVar26._0_4_;
            fVar252 = auVar26._4_4_;
            fVar205 = auVar26._8_4_;
            fVar227 = auVar26._12_4_;
            fVar328 = auVar26._16_4_;
            fVar329 = auVar26._20_4_;
            fVar330 = auVar26._24_4_;
            auVar319._0_4_ = fVar231 * fVar231 + fVar183 * fVar183;
            auVar319._4_4_ = fVar252 * fVar252 + fVar197 * fVar197;
            auVar319._8_4_ = fVar205 * fVar205 + fVar265 * fVar265;
            auVar319._12_4_ = fVar227 * fVar227 + fVar200 * fVar200;
            auVar319._16_4_ = fVar328 * fVar328 + fVar203 * fVar203;
            auVar319._20_4_ = fVar329 * fVar329 + fVar206 * fVar206;
            auVar319._24_4_ = fVar330 * fVar330 + fVar209 * fVar209;
            auVar319._28_4_ = auVar23._28_4_ + local_4a0._28_4_;
            auVar23 = vrsqrtps_avx(auVar319);
            fVar246 = auVar23._0_4_;
            fVar198 = auVar23._4_4_;
            auVar75._4_4_ = fVar198 * 1.5;
            auVar75._0_4_ = fVar246 * 1.5;
            fVar221 = auVar23._8_4_;
            auVar75._8_4_ = fVar221 * 1.5;
            fVar250 = auVar23._12_4_;
            auVar75._12_4_ = fVar250 * 1.5;
            fVar338 = auVar23._16_4_;
            auVar75._16_4_ = fVar338 * 1.5;
            fVar253 = auVar23._20_4_;
            auVar75._20_4_ = fVar253 * 1.5;
            fVar170 = auVar23._24_4_;
            auVar75._24_4_ = fVar170 * 1.5;
            auVar75._28_4_ = auVar336._28_4_;
            auVar76._4_4_ = fVar198 * fVar198 * fVar198 * auVar319._4_4_ * 0.5;
            auVar76._0_4_ = fVar246 * fVar246 * fVar246 * auVar319._0_4_ * 0.5;
            auVar76._8_4_ = fVar221 * fVar221 * fVar221 * auVar319._8_4_ * 0.5;
            auVar76._12_4_ = fVar250 * fVar250 * fVar250 * auVar319._12_4_ * 0.5;
            auVar76._16_4_ = fVar338 * fVar338 * fVar338 * auVar319._16_4_ * 0.5;
            auVar76._20_4_ = fVar253 * fVar253 * fVar253 * auVar319._20_4_ * 0.5;
            auVar76._24_4_ = fVar170 * fVar170 * fVar170 * auVar319._24_4_ * 0.5;
            auVar76._28_4_ = auVar319._28_4_;
            auVar25 = vsubps_avx(auVar75,auVar76);
            fVar181 = auVar25._0_4_;
            fVar230 = auVar25._4_4_;
            fVar211 = auVar25._8_4_;
            fVar151 = auVar25._12_4_;
            fVar152 = auVar25._16_4_;
            fVar153 = auVar25._20_4_;
            fVar248 = auVar25._24_4_;
            fVar246 = auVar24._0_4_;
            fVar198 = auVar24._4_4_;
            fVar221 = auVar24._8_4_;
            fVar250 = auVar24._12_4_;
            fVar338 = auVar24._16_4_;
            fVar253 = auVar24._20_4_;
            fVar170 = auVar24._24_4_;
            auVar290._0_4_ = fVar246 * fVar246 + fVar286 * fVar286;
            auVar290._4_4_ = fVar198 * fVar198 + fVar279 * fVar279;
            auVar290._8_4_ = fVar221 * fVar221 + fVar292 * fVar292;
            auVar290._12_4_ = fVar250 * fVar250 + fVar281 * fVar281;
            auVar290._16_4_ = fVar338 * fVar338 + fVar295 * fVar295;
            auVar290._20_4_ = fVar253 * fVar253 + fVar283 * fVar283;
            auVar290._24_4_ = fVar170 * fVar170 + fVar299 * fVar299;
            auVar290._28_4_ = auVar23._28_4_ + auVar139._28_4_;
            auVar139 = vrsqrtps_avx(auVar290);
            fVar201 = auVar139._0_4_;
            fVar291 = auVar139._4_4_;
            auVar77._4_4_ = fVar291 * 1.5;
            auVar77._0_4_ = fVar201 * 1.5;
            fVar204 = auVar139._8_4_;
            auVar77._8_4_ = fVar204 * 1.5;
            fVar293 = auVar139._12_4_;
            auVar77._12_4_ = fVar293 * 1.5;
            fVar207 = auVar139._16_4_;
            auVar77._16_4_ = fVar207 * 1.5;
            fVar297 = auVar139._20_4_;
            auVar77._20_4_ = fVar297 * 1.5;
            fVar210 = auVar139._24_4_;
            auVar77._24_4_ = fVar210 * 1.5;
            auVar77._28_4_ = auVar336._28_4_;
            auVar78._4_4_ = fVar291 * fVar291 * fVar291 * auVar290._4_4_ * 0.5;
            auVar78._0_4_ = fVar201 * fVar201 * fVar201 * auVar290._0_4_ * 0.5;
            auVar78._8_4_ = fVar204 * fVar204 * fVar204 * auVar290._8_4_ * 0.5;
            auVar78._12_4_ = fVar293 * fVar293 * fVar293 * auVar290._12_4_ * 0.5;
            auVar78._16_4_ = fVar207 * fVar207 * fVar207 * auVar290._16_4_ * 0.5;
            auVar78._20_4_ = fVar297 * fVar297 * fVar297 * auVar290._20_4_ * 0.5;
            auVar78._24_4_ = fVar210 * fVar210 * fVar210 * auVar290._24_4_ * 0.5;
            auVar78._28_4_ = auVar290._28_4_;
            auVar23 = vsubps_avx(auVar77,auVar78);
            fVar201 = auVar23._0_4_;
            fVar291 = auVar23._4_4_;
            fVar204 = auVar23._8_4_;
            fVar293 = auVar23._12_4_;
            fVar207 = auVar23._16_4_;
            fVar297 = auVar23._20_4_;
            fVar210 = auVar23._24_4_;
            fVar231 = fVar136 * fVar181 * fVar231;
            fVar252 = fVar150 * fVar230 * fVar252;
            auVar79._4_4_ = fVar252;
            auVar79._0_4_ = fVar231;
            fVar205 = fStack_6f8 * fVar211 * fVar205;
            auVar79._8_4_ = fVar205;
            fVar227 = fStack_6f4 * fVar151 * fVar227;
            auVar79._12_4_ = fVar227;
            fVar328 = fStack_6f0 * fVar152 * fVar328;
            auVar79._16_4_ = fVar328;
            fVar329 = fStack_6ec * fVar153 * fVar329;
            auVar79._20_4_ = fVar329;
            fVar330 = fStack_6e8 * fVar248 * fVar330;
            auVar79._24_4_ = fVar330;
            auVar79._28_4_ = auVar139._28_4_;
            local_640._4_4_ = fVar252 + auVar306._4_4_;
            local_640._0_4_ = fVar231 + auVar306._0_4_;
            fStack_638 = fVar205 + auVar306._8_4_;
            fStack_634 = fVar227 + auVar306._12_4_;
            auStack_630._0_4_ = fVar328 + auVar306._16_4_;
            auStack_630._4_4_ = fVar329 + auVar306._20_4_;
            fStack_628 = fVar330 + auVar306._24_4_;
            fStack_624 = auVar139._28_4_ + auVar306._28_4_;
            fVar231 = fVar136 * fVar181 * -fVar183;
            fVar252 = fVar150 * fVar230 * -fVar197;
            auVar80._4_4_ = fVar252;
            auVar80._0_4_ = fVar231;
            fVar205 = fStack_6f8 * fVar211 * -fVar265;
            auVar80._8_4_ = fVar205;
            fVar227 = fStack_6f4 * fVar151 * -fVar200;
            auVar80._12_4_ = fVar227;
            fVar328 = fStack_6f0 * fVar152 * -fVar203;
            auVar80._16_4_ = fVar328;
            fVar329 = fStack_6ec * fVar153 * -fVar206;
            auVar80._20_4_ = fVar329;
            fVar330 = fStack_6e8 * fVar248 * -fVar209;
            auVar80._24_4_ = fVar330;
            auVar80._28_4_ = -fVar285;
            local_740._4_4_ = local_720._4_4_ + fVar252;
            local_740._0_4_ = local_720._0_4_ + fVar231;
            fStack_738 = local_720._8_4_ + fVar205;
            fStack_734 = local_720._12_4_ + fVar227;
            auStack_730._0_4_ = local_720._16_4_ + fVar328;
            auStack_730._4_4_ = local_720._20_4_ + fVar329;
            fStack_728 = local_720._24_4_ + fVar330;
            fStack_724 = local_720._28_4_ + -fVar285;
            fVar231 = fVar181 * 0.0 * fVar136;
            fVar252 = fVar230 * 0.0 * fVar150;
            auVar81._4_4_ = fVar252;
            auVar81._0_4_ = fVar231;
            fVar205 = fVar211 * 0.0 * fStack_6f8;
            auVar81._8_4_ = fVar205;
            fVar227 = fVar151 * 0.0 * fStack_6f4;
            auVar81._12_4_ = fVar227;
            fVar328 = fVar152 * 0.0 * fStack_6f0;
            auVar81._16_4_ = fVar328;
            fVar329 = fVar153 * 0.0 * fStack_6ec;
            auVar81._20_4_ = fVar329;
            fVar330 = fVar248 * 0.0 * fStack_6e8;
            auVar81._24_4_ = fVar330;
            auVar81._28_4_ = fVar285;
            auVar28 = vsubps_avx(auVar306,auVar79);
            auVar348._0_4_ = fVar231 + auVar147._0_4_;
            auVar348._4_4_ = fVar252 + auVar147._4_4_;
            auVar348._8_4_ = fVar205 + auVar147._8_4_;
            auVar348._12_4_ = fVar227 + auVar147._12_4_;
            auVar348._16_4_ = fVar328 + auVar147._16_4_;
            auVar348._20_4_ = fVar329 + auVar147._20_4_;
            auVar348._24_4_ = fVar330 + auVar147._24_4_;
            auVar348._28_4_ = fVar285 + auVar147._28_4_;
            fVar231 = auVar274._0_4_ * fVar201 * fVar246;
            fVar246 = auVar274._4_4_ * fVar291 * fVar198;
            auVar82._4_4_ = fVar246;
            auVar82._0_4_ = fVar231;
            fVar252 = auVar274._8_4_ * fVar204 * fVar221;
            auVar82._8_4_ = fVar252;
            fVar198 = auVar274._12_4_ * fVar293 * fVar250;
            auVar82._12_4_ = fVar198;
            fVar205 = auVar274._16_4_ * fVar207 * fVar338;
            auVar82._16_4_ = fVar205;
            fVar221 = auVar274._20_4_ * fVar297 * fVar253;
            auVar82._20_4_ = fVar221;
            fVar227 = auVar274._24_4_ * fVar210 * fVar170;
            auVar82._24_4_ = fVar227;
            auVar82._28_4_ = fStack_6e4;
            auVar140 = vsubps_avx(local_720,auVar80);
            auVar342._0_4_ = auVar335._0_4_ + fVar231;
            auVar342._4_4_ = auVar335._4_4_ + fVar246;
            auVar342._8_4_ = auVar335._8_4_ + fVar252;
            auVar342._12_4_ = auVar335._12_4_ + fVar198;
            auVar342._16_4_ = auVar335._16_4_ + fVar205;
            auVar342._20_4_ = auVar335._20_4_ + fVar221;
            auVar342._24_4_ = auVar335._24_4_ + fVar227;
            auVar342._28_4_ = auVar335._28_4_ + fStack_6e4;
            fVar231 = fVar201 * -fVar286 * auVar274._0_4_;
            fVar246 = fVar291 * -fVar279 * auVar274._4_4_;
            auVar83._4_4_ = fVar246;
            auVar83._0_4_ = fVar231;
            fVar252 = fVar204 * -fVar292 * auVar274._8_4_;
            auVar83._8_4_ = fVar252;
            fVar198 = fVar293 * -fVar281 * auVar274._12_4_;
            auVar83._12_4_ = fVar198;
            fVar205 = fVar207 * -fVar295 * auVar274._16_4_;
            auVar83._16_4_ = fVar205;
            fVar221 = fVar297 * -fVar283 * auVar274._20_4_;
            auVar83._20_4_ = fVar221;
            fVar227 = fVar210 * -fVar299 * auVar274._24_4_;
            auVar83._24_4_ = fVar227;
            auVar83._28_4_ = auVar306._28_4_;
            auVar141 = vsubps_avx(auVar147,auVar81);
            auVar219._0_4_ = (float)local_5c0._0_4_ + fVar231;
            auVar219._4_4_ = local_5c0._4_4_ + fVar246;
            auVar219._8_4_ = local_5c0._8_4_ + fVar252;
            auVar219._12_4_ = local_5c0._12_4_ + fVar198;
            auVar219._16_4_ = local_5c0._16_4_ + fVar205;
            auVar219._20_4_ = local_5c0._20_4_ + fVar221;
            auVar219._24_4_ = local_5c0._24_4_ + fVar227;
            auVar219._28_4_ = local_5c0._28_4_ + auVar306._28_4_;
            fVar231 = fVar201 * 0.0 * auVar274._0_4_;
            fVar246 = fVar291 * 0.0 * auVar274._4_4_;
            auVar84._4_4_ = fVar246;
            auVar84._0_4_ = fVar231;
            fVar252 = fVar204 * 0.0 * auVar274._8_4_;
            auVar84._8_4_ = fVar252;
            fVar198 = fVar293 * 0.0 * auVar274._12_4_;
            auVar84._12_4_ = fVar198;
            fVar205 = fVar207 * 0.0 * auVar274._16_4_;
            auVar84._16_4_ = fVar205;
            fVar221 = fVar297 * 0.0 * auVar274._20_4_;
            auVar84._20_4_ = fVar221;
            fVar227 = fVar210 * 0.0 * auVar274._24_4_;
            auVar84._24_4_ = fVar227;
            auVar84._28_4_ = auVar147._28_4_;
            auVar139 = vsubps_avx(auVar335,auVar82);
            auVar308._0_4_ = (float)local_500._0_4_ + fVar231;
            auVar308._4_4_ = (float)local_500._4_4_ + fVar246;
            auVar308._8_4_ = fStack_4f8 + fVar252;
            auVar308._12_4_ = fStack_4f4 + fVar198;
            auVar308._16_4_ = fStack_4f0 + fVar205;
            auVar308._20_4_ = fStack_4ec + fVar221;
            auVar308._24_4_ = fStack_4e8 + fVar227;
            auVar308._28_4_ = fStack_4e4 + auVar147._28_4_;
            auVar24 = vsubps_avx(local_5c0,auVar83);
            auVar25 = vsubps_avx(_local_500,auVar84);
            auVar26 = vsubps_avx(auVar219,auVar140);
            auVar27 = vsubps_avx(auVar308,auVar141);
            auVar85._4_4_ = auVar141._4_4_ * auVar26._4_4_;
            auVar85._0_4_ = auVar141._0_4_ * auVar26._0_4_;
            auVar85._8_4_ = auVar141._8_4_ * auVar26._8_4_;
            auVar85._12_4_ = auVar141._12_4_ * auVar26._12_4_;
            auVar85._16_4_ = auVar141._16_4_ * auVar26._16_4_;
            auVar85._20_4_ = auVar141._20_4_ * auVar26._20_4_;
            auVar85._24_4_ = auVar141._24_4_ * auVar26._24_4_;
            auVar85._28_4_ = auVar336._28_4_;
            auVar86._4_4_ = auVar140._4_4_ * auVar27._4_4_;
            auVar86._0_4_ = auVar140._0_4_ * auVar27._0_4_;
            auVar86._8_4_ = auVar140._8_4_ * auVar27._8_4_;
            auVar86._12_4_ = auVar140._12_4_ * auVar27._12_4_;
            auVar86._16_4_ = auVar140._16_4_ * auVar27._16_4_;
            auVar86._20_4_ = auVar140._20_4_ * auVar27._20_4_;
            auVar86._24_4_ = auVar140._24_4_ * auVar27._24_4_;
            auVar86._28_4_ = local_5c0._28_4_;
            auVar29 = vsubps_avx(auVar86,auVar85);
            auVar87._4_4_ = auVar28._4_4_ * auVar27._4_4_;
            auVar87._0_4_ = auVar28._0_4_ * auVar27._0_4_;
            auVar87._8_4_ = auVar28._8_4_ * auVar27._8_4_;
            auVar87._12_4_ = auVar28._12_4_ * auVar27._12_4_;
            auVar87._16_4_ = auVar28._16_4_ * auVar27._16_4_;
            auVar87._20_4_ = auVar28._20_4_ * auVar27._20_4_;
            auVar87._24_4_ = auVar28._24_4_ * auVar27._24_4_;
            auVar87._28_4_ = auVar27._28_4_;
            auVar27 = vsubps_avx(auVar342,auVar28);
            auVar88._4_4_ = auVar141._4_4_ * auVar27._4_4_;
            auVar88._0_4_ = auVar141._0_4_ * auVar27._0_4_;
            auVar88._8_4_ = auVar141._8_4_ * auVar27._8_4_;
            auVar88._12_4_ = auVar141._12_4_ * auVar27._12_4_;
            auVar88._16_4_ = auVar141._16_4_ * auVar27._16_4_;
            auVar88._20_4_ = auVar141._20_4_ * auVar27._20_4_;
            auVar88._24_4_ = auVar141._24_4_ * auVar27._24_4_;
            auVar88._28_4_ = auVar23._28_4_;
            auVar30 = vsubps_avx(auVar88,auVar87);
            auVar89._4_4_ = auVar140._4_4_ * auVar27._4_4_;
            auVar89._0_4_ = auVar140._0_4_ * auVar27._0_4_;
            auVar89._8_4_ = auVar140._8_4_ * auVar27._8_4_;
            auVar89._12_4_ = auVar140._12_4_ * auVar27._12_4_;
            auVar89._16_4_ = auVar140._16_4_ * auVar27._16_4_;
            auVar89._20_4_ = auVar140._20_4_ * auVar27._20_4_;
            auVar89._24_4_ = auVar140._24_4_ * auVar27._24_4_;
            auVar89._28_4_ = auVar23._28_4_;
            auVar90._4_4_ = auVar28._4_4_ * auVar26._4_4_;
            auVar90._0_4_ = auVar28._0_4_ * auVar26._0_4_;
            auVar90._8_4_ = auVar28._8_4_ * auVar26._8_4_;
            auVar90._12_4_ = auVar28._12_4_ * auVar26._12_4_;
            auVar90._16_4_ = auVar28._16_4_ * auVar26._16_4_;
            auVar90._20_4_ = auVar28._20_4_ * auVar26._20_4_;
            auVar90._24_4_ = auVar28._24_4_ * auVar26._24_4_;
            auVar90._28_4_ = auVar26._28_4_;
            auVar23 = vsubps_avx(auVar90,auVar89);
            auVar163._0_4_ = auVar29._0_4_ * 0.0 + auVar23._0_4_ + auVar30._0_4_ * 0.0;
            auVar163._4_4_ = auVar29._4_4_ * 0.0 + auVar23._4_4_ + auVar30._4_4_ * 0.0;
            auVar163._8_4_ = auVar29._8_4_ * 0.0 + auVar23._8_4_ + auVar30._8_4_ * 0.0;
            auVar163._12_4_ = auVar29._12_4_ * 0.0 + auVar23._12_4_ + auVar30._12_4_ * 0.0;
            auVar163._16_4_ = auVar29._16_4_ * 0.0 + auVar23._16_4_ + auVar30._16_4_ * 0.0;
            auVar163._20_4_ = auVar29._20_4_ * 0.0 + auVar23._20_4_ + auVar30._20_4_ * 0.0;
            auVar163._24_4_ = auVar29._24_4_ * 0.0 + auVar23._24_4_ + auVar30._24_4_ * 0.0;
            auVar163._28_4_ = auVar29._28_4_ + auVar23._28_4_ + auVar30._28_4_;
            auVar21 = vcmpps_avx(auVar163,ZEXT832(0) << 0x20,2);
            auVar23 = vblendvps_avx(auVar139,_local_640,auVar21);
            auVar195 = ZEXT3264(auVar23);
            auVar139 = vblendvps_avx(auVar24,_local_740,auVar21);
            auVar24 = vblendvps_avx(auVar25,auVar348,auVar21);
            auVar25 = vblendvps_avx(auVar28,auVar342,auVar21);
            auVar26 = vblendvps_avx(auVar140,auVar219,auVar21);
            auVar27 = vblendvps_avx(auVar141,auVar308,auVar21);
            auVar28 = vblendvps_avx(auVar342,auVar28,auVar21);
            auVar29 = vblendvps_avx(auVar219,auVar140,auVar21);
            auVar30 = vblendvps_avx(auVar308,auVar141,auVar21);
            local_720 = vandps_avx(auVar22,_local_480);
            auVar28 = vsubps_avx(auVar28,auVar23);
            auVar158 = vsubps_avx(auVar29,auVar139);
            auVar30 = vsubps_avx(auVar30,auVar24);
            auVar159 = vsubps_avx(auVar139,auVar26);
            fVar231 = auVar158._0_4_;
            fVar343 = auVar24._0_4_;
            fVar250 = auVar158._4_4_;
            fVar276 = auVar24._4_4_;
            auVar91._4_4_ = fVar276 * fVar250;
            auVar91._0_4_ = fVar343 * fVar231;
            fVar286 = auVar158._8_4_;
            fVar277 = auVar24._8_4_;
            auVar91._8_4_ = fVar277 * fVar286;
            fVar293 = auVar158._12_4_;
            fVar278 = auVar24._12_4_;
            auVar91._12_4_ = fVar278 * fVar293;
            fVar181 = auVar158._16_4_;
            fVar280 = auVar24._16_4_;
            auVar91._16_4_ = fVar280 * fVar181;
            fVar183 = auVar158._20_4_;
            fVar282 = auVar24._20_4_;
            auVar91._20_4_ = fVar282 * fVar183;
            fVar285 = auVar158._24_4_;
            fVar284 = auVar24._24_4_;
            auVar91._24_4_ = fVar284 * fVar285;
            auVar91._28_4_ = auVar29._28_4_;
            fVar246 = auVar139._0_4_;
            fVar301 = auVar30._0_4_;
            fVar328 = auVar139._4_4_;
            fVar309 = auVar30._4_4_;
            auVar92._4_4_ = fVar309 * fVar328;
            auVar92._0_4_ = fVar301 * fVar246;
            fVar201 = auVar139._8_4_;
            fVar310 = auVar30._8_4_;
            auVar92._8_4_ = fVar310 * fVar201;
            fVar295 = auVar139._12_4_;
            fVar311 = auVar30._12_4_;
            auVar92._12_4_ = fVar311 * fVar295;
            fVar230 = auVar139._16_4_;
            fVar312 = auVar30._16_4_;
            auVar92._16_4_ = fVar312 * fVar230;
            fVar197 = auVar139._20_4_;
            fVar313 = auVar30._20_4_;
            auVar92._20_4_ = fVar313 * fVar197;
            fVar264 = auVar139._24_4_;
            fVar314 = auVar30._24_4_;
            uVar7 = auVar140._28_4_;
            auVar92._24_4_ = fVar314 * fVar264;
            auVar92._28_4_ = uVar7;
            auVar29 = vsubps_avx(auVar92,auVar91);
            fVar252 = auVar23._0_4_;
            fVar338 = auVar23._4_4_;
            auVar93._4_4_ = fVar309 * fVar338;
            auVar93._0_4_ = fVar301 * fVar252;
            fVar279 = auVar23._8_4_;
            auVar93._8_4_ = fVar310 * fVar279;
            fVar207 = auVar23._12_4_;
            auVar93._12_4_ = fVar311 * fVar207;
            fVar211 = auVar23._16_4_;
            auVar93._16_4_ = fVar312 * fVar211;
            fVar265 = auVar23._20_4_;
            auVar93._20_4_ = fVar313 * fVar265;
            fVar294 = auVar23._24_4_;
            auVar93._24_4_ = fVar314 * fVar294;
            auVar93._28_4_ = uVar7;
            fVar198 = auVar28._0_4_;
            fVar329 = auVar28._4_4_;
            auVar94._4_4_ = fVar276 * fVar329;
            auVar94._0_4_ = fVar343 * fVar198;
            fVar291 = auVar28._8_4_;
            auVar94._8_4_ = fVar277 * fVar291;
            fVar283 = auVar28._12_4_;
            auVar94._12_4_ = fVar278 * fVar283;
            fVar151 = auVar28._16_4_;
            auVar94._16_4_ = fVar280 * fVar151;
            fVar200 = auVar28._20_4_;
            auVar94._20_4_ = fVar282 * fVar200;
            fVar296 = auVar28._24_4_;
            auVar94._24_4_ = fVar284 * fVar296;
            auVar94._28_4_ = auVar342._28_4_;
            auVar140 = vsubps_avx(auVar94,auVar93);
            auVar95._4_4_ = fVar328 * fVar329;
            auVar95._0_4_ = fVar246 * fVar198;
            auVar95._8_4_ = fVar201 * fVar291;
            auVar95._12_4_ = fVar295 * fVar283;
            auVar95._16_4_ = fVar230 * fVar151;
            auVar95._20_4_ = fVar197 * fVar200;
            auVar95._24_4_ = fVar264 * fVar296;
            auVar95._28_4_ = uVar7;
            auVar96._4_4_ = fVar338 * fVar250;
            auVar96._0_4_ = fVar252 * fVar231;
            auVar96._8_4_ = fVar279 * fVar286;
            auVar96._12_4_ = fVar207 * fVar293;
            auVar96._16_4_ = fVar211 * fVar181;
            auVar96._20_4_ = fVar265 * fVar183;
            auVar96._24_4_ = fVar294 * fVar285;
            auVar96._28_4_ = auVar141._28_4_;
            auVar141 = vsubps_avx(auVar96,auVar95);
            auVar160 = vsubps_avx(auVar24,auVar27);
            fVar221 = auVar141._28_4_ + auVar140._28_4_;
            auVar320._0_4_ = auVar141._0_4_ + auVar140._0_4_ * 0.0 + auVar29._0_4_ * 0.0;
            auVar320._4_4_ = auVar141._4_4_ + auVar140._4_4_ * 0.0 + auVar29._4_4_ * 0.0;
            auVar320._8_4_ = auVar141._8_4_ + auVar140._8_4_ * 0.0 + auVar29._8_4_ * 0.0;
            auVar320._12_4_ = auVar141._12_4_ + auVar140._12_4_ * 0.0 + auVar29._12_4_ * 0.0;
            auVar320._16_4_ = auVar141._16_4_ + auVar140._16_4_ * 0.0 + auVar29._16_4_ * 0.0;
            auVar320._20_4_ = auVar141._20_4_ + auVar140._20_4_ * 0.0 + auVar29._20_4_ * 0.0;
            auVar320._24_4_ = auVar141._24_4_ + auVar140._24_4_ * 0.0 + auVar29._24_4_ * 0.0;
            auVar320._28_4_ = fVar221 + auVar29._28_4_;
            fVar205 = auVar159._0_4_;
            fVar253 = auVar159._4_4_;
            auVar97._4_4_ = auVar27._4_4_ * fVar253;
            auVar97._0_4_ = auVar27._0_4_ * fVar205;
            fVar292 = auVar159._8_4_;
            auVar97._8_4_ = auVar27._8_4_ * fVar292;
            fVar297 = auVar159._12_4_;
            auVar97._12_4_ = auVar27._12_4_ * fVar297;
            fVar152 = auVar159._16_4_;
            auVar97._16_4_ = auVar27._16_4_ * fVar152;
            fVar203 = auVar159._20_4_;
            auVar97._20_4_ = auVar27._20_4_ * fVar203;
            fVar298 = auVar159._24_4_;
            auVar97._24_4_ = auVar27._24_4_ * fVar298;
            auVar97._28_4_ = fVar221;
            fVar221 = auVar160._0_4_;
            fVar330 = auVar160._4_4_;
            auVar98._4_4_ = auVar26._4_4_ * fVar330;
            auVar98._0_4_ = auVar26._0_4_ * fVar221;
            fVar204 = auVar160._8_4_;
            auVar98._8_4_ = auVar26._8_4_ * fVar204;
            fVar299 = auVar160._12_4_;
            auVar98._12_4_ = auVar26._12_4_ * fVar299;
            fVar153 = auVar160._16_4_;
            auVar98._16_4_ = auVar26._16_4_ * fVar153;
            fVar206 = auVar160._20_4_;
            auVar98._20_4_ = auVar26._20_4_ * fVar206;
            fVar300 = auVar160._24_4_;
            auVar98._24_4_ = auVar26._24_4_ * fVar300;
            auVar98._28_4_ = auVar141._28_4_;
            auVar140 = vsubps_avx(auVar98,auVar97);
            auVar141 = vsubps_avx(auVar23,auVar25);
            fVar227 = auVar141._0_4_;
            fVar170 = auVar141._4_4_;
            auVar99._4_4_ = auVar27._4_4_ * fVar170;
            auVar99._0_4_ = auVar27._0_4_ * fVar227;
            fVar281 = auVar141._8_4_;
            auVar99._8_4_ = auVar27._8_4_ * fVar281;
            fVar210 = auVar141._12_4_;
            auVar99._12_4_ = auVar27._12_4_ * fVar210;
            fVar248 = auVar141._16_4_;
            auVar99._16_4_ = auVar27._16_4_ * fVar248;
            fVar209 = auVar141._20_4_;
            auVar99._20_4_ = auVar27._20_4_ * fVar209;
            fVar315 = auVar141._24_4_;
            auVar99._24_4_ = auVar27._24_4_ * fVar315;
            auVar99._28_4_ = auVar27._28_4_;
            auVar100._4_4_ = fVar330 * auVar25._4_4_;
            auVar100._0_4_ = fVar221 * auVar25._0_4_;
            auVar100._8_4_ = fVar204 * auVar25._8_4_;
            auVar100._12_4_ = fVar299 * auVar25._12_4_;
            auVar100._16_4_ = fVar153 * auVar25._16_4_;
            auVar100._20_4_ = fVar206 * auVar25._20_4_;
            auVar100._24_4_ = fVar300 * auVar25._24_4_;
            auVar100._28_4_ = auVar29._28_4_;
            auVar27 = vsubps_avx(auVar99,auVar100);
            auVar101._4_4_ = auVar26._4_4_ * fVar170;
            auVar101._0_4_ = auVar26._0_4_ * fVar227;
            auVar101._8_4_ = auVar26._8_4_ * fVar281;
            auVar101._12_4_ = auVar26._12_4_ * fVar210;
            auVar101._16_4_ = auVar26._16_4_ * fVar248;
            auVar101._20_4_ = auVar26._20_4_ * fVar209;
            auVar101._24_4_ = auVar26._24_4_ * fVar315;
            auVar101._28_4_ = auVar26._28_4_;
            auVar102._4_4_ = fVar253 * auVar25._4_4_;
            auVar102._0_4_ = fVar205 * auVar25._0_4_;
            auVar102._8_4_ = fVar292 * auVar25._8_4_;
            auVar102._12_4_ = fVar297 * auVar25._12_4_;
            auVar102._16_4_ = fVar152 * auVar25._16_4_;
            auVar102._20_4_ = fVar203 * auVar25._20_4_;
            auVar102._24_4_ = fVar298 * auVar25._24_4_;
            auVar102._28_4_ = auVar25._28_4_;
            auVar25 = vsubps_avx(auVar102,auVar101);
            auVar148._0_4_ = auVar140._0_4_ * 0.0 + auVar25._0_4_ + auVar27._0_4_ * 0.0;
            auVar148._4_4_ = auVar140._4_4_ * 0.0 + auVar25._4_4_ + auVar27._4_4_ * 0.0;
            auVar148._8_4_ = auVar140._8_4_ * 0.0 + auVar25._8_4_ + auVar27._8_4_ * 0.0;
            auVar148._12_4_ = auVar140._12_4_ * 0.0 + auVar25._12_4_ + auVar27._12_4_ * 0.0;
            auVar148._16_4_ = auVar140._16_4_ * 0.0 + auVar25._16_4_ + auVar27._16_4_ * 0.0;
            auVar148._20_4_ = auVar140._20_4_ * 0.0 + auVar25._20_4_ + auVar27._20_4_ * 0.0;
            auVar148._24_4_ = auVar140._24_4_ * 0.0 + auVar25._24_4_ + auVar27._24_4_ * 0.0;
            auVar148._28_4_ = auVar27._28_4_ + auVar25._28_4_ + auVar27._28_4_;
            auVar149 = ZEXT3264(auVar148);
            auVar25 = vmaxps_avx(auVar320,auVar148);
            auVar25 = vcmpps_avx(auVar25,ZEXT1232(ZEXT412(0)) << 0x20,2);
            auVar26 = local_720 & auVar25;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar26 >> 0x7f,0) == '\0') &&
                  (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0xbf,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar26[0x1f]) {
LAB_0115cab0:
              auVar263 = ZEXT3264(auVar139);
              auVar165._8_8_ = uStack_4b8;
              auVar165._0_8_ = local_4c0;
              auVar165._16_8_ = uStack_4b0;
              auVar165._24_8_ = uStack_4a8;
            }
            else {
              auVar26 = vandps_avx(auVar25,local_720);
              auVar103._4_4_ = fVar330 * fVar250;
              auVar103._0_4_ = fVar221 * fVar231;
              auVar103._8_4_ = fVar204 * fVar286;
              auVar103._12_4_ = fVar299 * fVar293;
              auVar103._16_4_ = fVar153 * fVar181;
              auVar103._20_4_ = fVar206 * fVar183;
              auVar103._24_4_ = fVar300 * fVar285;
              auVar103._28_4_ = local_720._28_4_;
              auVar104._4_4_ = fVar253 * fVar309;
              auVar104._0_4_ = fVar205 * fVar301;
              auVar104._8_4_ = fVar292 * fVar310;
              auVar104._12_4_ = fVar297 * fVar311;
              auVar104._16_4_ = fVar152 * fVar312;
              auVar104._20_4_ = fVar203 * fVar313;
              auVar104._24_4_ = fVar298 * fVar314;
              auVar104._28_4_ = auVar25._28_4_;
              auVar27 = vsubps_avx(auVar104,auVar103);
              auVar105._4_4_ = fVar170 * fVar309;
              auVar105._0_4_ = fVar227 * fVar301;
              auVar105._8_4_ = fVar281 * fVar310;
              auVar105._12_4_ = fVar210 * fVar311;
              auVar105._16_4_ = fVar248 * fVar312;
              auVar105._20_4_ = fVar209 * fVar313;
              auVar105._24_4_ = fVar315 * fVar314;
              auVar105._28_4_ = auVar30._28_4_;
              auVar106._4_4_ = fVar330 * fVar329;
              auVar106._0_4_ = fVar221 * fVar198;
              auVar106._8_4_ = fVar204 * fVar291;
              auVar106._12_4_ = fVar299 * fVar283;
              auVar106._16_4_ = fVar153 * fVar151;
              auVar106._20_4_ = fVar206 * fVar200;
              auVar106._24_4_ = fVar300 * fVar296;
              auVar106._28_4_ = auVar160._28_4_;
              auVar29 = vsubps_avx(auVar106,auVar105);
              auVar107._4_4_ = fVar253 * fVar329;
              auVar107._0_4_ = fVar205 * fVar198;
              auVar107._8_4_ = fVar292 * fVar291;
              auVar107._12_4_ = fVar297 * fVar283;
              auVar107._16_4_ = fVar152 * fVar151;
              auVar107._20_4_ = fVar203 * fVar200;
              auVar107._24_4_ = fVar298 * fVar296;
              auVar107._28_4_ = auVar28._28_4_;
              auVar108._4_4_ = fVar170 * fVar250;
              auVar108._0_4_ = fVar227 * fVar231;
              auVar108._8_4_ = fVar281 * fVar286;
              auVar108._12_4_ = fVar210 * fVar293;
              auVar108._16_4_ = fVar248 * fVar181;
              auVar108._20_4_ = fVar209 * fVar183;
              auVar108._24_4_ = fVar315 * fVar285;
              auVar108._28_4_ = auVar158._28_4_;
              auVar30 = vsubps_avx(auVar108,auVar107);
              auVar164._0_4_ = auVar27._0_4_ * 0.0 + auVar30._0_4_ + auVar29._0_4_ * 0.0;
              auVar164._4_4_ = auVar27._4_4_ * 0.0 + auVar30._4_4_ + auVar29._4_4_ * 0.0;
              auVar164._8_4_ = auVar27._8_4_ * 0.0 + auVar30._8_4_ + auVar29._8_4_ * 0.0;
              auVar164._12_4_ = auVar27._12_4_ * 0.0 + auVar30._12_4_ + auVar29._12_4_ * 0.0;
              auVar164._16_4_ = auVar27._16_4_ * 0.0 + auVar30._16_4_ + auVar29._16_4_ * 0.0;
              auVar164._20_4_ = auVar27._20_4_ * 0.0 + auVar30._20_4_ + auVar29._20_4_ * 0.0;
              auVar164._24_4_ = auVar27._24_4_ * 0.0 + auVar30._24_4_ + auVar29._24_4_ * 0.0;
              auVar164._28_4_ = auVar158._28_4_ + auVar30._28_4_ + auVar28._28_4_;
              auVar25 = vrcpps_avx(auVar164);
              fVar198 = auVar25._0_4_;
              fVar205 = auVar25._4_4_;
              auVar109._4_4_ = auVar164._4_4_ * fVar205;
              auVar109._0_4_ = auVar164._0_4_ * fVar198;
              fVar221 = auVar25._8_4_;
              auVar109._8_4_ = auVar164._8_4_ * fVar221;
              fVar227 = auVar25._12_4_;
              auVar109._12_4_ = auVar164._12_4_ * fVar227;
              fVar250 = auVar25._16_4_;
              auVar109._16_4_ = auVar164._16_4_ * fVar250;
              fVar329 = auVar25._20_4_;
              auVar109._20_4_ = auVar164._20_4_ * fVar329;
              fVar253 = auVar25._24_4_;
              auVar109._24_4_ = auVar164._24_4_ * fVar253;
              auVar109._28_4_ = auVar160._28_4_;
              auVar337._8_4_ = 0x3f800000;
              auVar337._0_8_ = &DAT_3f8000003f800000;
              auVar337._12_4_ = 0x3f800000;
              auVar337._16_4_ = 0x3f800000;
              auVar337._20_4_ = 0x3f800000;
              auVar337._24_4_ = 0x3f800000;
              auVar337._28_4_ = 0x3f800000;
              auVar25 = vsubps_avx(auVar337,auVar109);
              fVar198 = auVar25._0_4_ * fVar198 + fVar198;
              fVar205 = auVar25._4_4_ * fVar205 + fVar205;
              fVar221 = auVar25._8_4_ * fVar221 + fVar221;
              fVar227 = auVar25._12_4_ * fVar227 + fVar227;
              fVar250 = auVar25._16_4_ * fVar250 + fVar250;
              fVar329 = auVar25._20_4_ * fVar329 + fVar329;
              fVar253 = auVar25._24_4_ * fVar253 + fVar253;
              auVar110._4_4_ =
                   (fVar338 * auVar27._4_4_ + auVar29._4_4_ * fVar328 + auVar30._4_4_ * fVar276) *
                   fVar205;
              auVar110._0_4_ =
                   (fVar252 * auVar27._0_4_ + auVar29._0_4_ * fVar246 + auVar30._0_4_ * fVar343) *
                   fVar198;
              auVar110._8_4_ =
                   (fVar279 * auVar27._8_4_ + auVar29._8_4_ * fVar201 + auVar30._8_4_ * fVar277) *
                   fVar221;
              auVar110._12_4_ =
                   (fVar207 * auVar27._12_4_ + auVar29._12_4_ * fVar295 + auVar30._12_4_ * fVar278)
                   * fVar227;
              auVar110._16_4_ =
                   (fVar211 * auVar27._16_4_ + auVar29._16_4_ * fVar230 + auVar30._16_4_ * fVar280)
                   * fVar250;
              auVar110._20_4_ =
                   (fVar265 * auVar27._20_4_ + auVar29._20_4_ * fVar197 + auVar30._20_4_ * fVar282)
                   * fVar329;
              auVar110._24_4_ =
                   (fVar294 * auVar27._24_4_ + auVar29._24_4_ * fVar264 + auVar30._24_4_ * fVar284)
                   * fVar253;
              auVar110._28_4_ = auVar23._28_4_ + auVar139._28_4_ + auVar24._28_4_;
              auVar195 = ZEXT3264(auVar110);
              fVar231 = local_7e8->tfar;
              auVar220._4_4_ = fVar231;
              auVar220._0_4_ = fVar231;
              auVar220._8_4_ = fVar231;
              auVar220._12_4_ = fVar231;
              auVar220._16_4_ = fVar231;
              auVar220._20_4_ = fVar231;
              auVar220._24_4_ = fVar231;
              auVar220._28_4_ = fVar231;
              auVar139 = vcmpps_avx(local_100,auVar110,2);
              auVar23 = vcmpps_avx(auVar110,auVar220,2);
              auVar139 = vandps_avx(auVar139,auVar23);
              auVar24 = auVar26 & auVar139;
              if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar24 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar24 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar24 >> 0x7f,0) == '\0') &&
                    (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar24 >> 0xbf,0) == '\0') &&
                  (auVar24 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar24[0x1f]) goto LAB_0115cab0;
              auVar139 = vandps_avx(auVar26,auVar139);
              auVar263 = ZEXT3264(auVar139);
              auVar24 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar164,4);
              auVar25 = auVar139 & auVar24;
              auVar165._8_8_ = uStack_4b8;
              auVar165._0_8_ = local_4c0;
              auVar165._16_8_ = uStack_4b0;
              auVar165._24_8_ = uStack_4a8;
              if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar25 >> 0x7f,0) != '\0') ||
                    (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar25 >> 0xbf,0) != '\0') ||
                  (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar25[0x1f] < '\0') {
                auVar165 = vandps_avx(auVar24,auVar139);
                auVar111._4_4_ = auVar320._4_4_ * fVar205;
                auVar111._0_4_ = auVar320._0_4_ * fVar198;
                auVar111._8_4_ = auVar320._8_4_ * fVar221;
                auVar111._12_4_ = auVar320._12_4_ * fVar227;
                auVar111._16_4_ = auVar320._16_4_ * fVar250;
                auVar111._20_4_ = auVar320._20_4_ * fVar329;
                auVar111._24_4_ = auVar320._24_4_ * fVar253;
                auVar111._28_4_ = auVar23._28_4_;
                auVar112._4_4_ = auVar148._4_4_ * fVar205;
                auVar112._0_4_ = auVar148._0_4_ * fVar198;
                auVar112._8_4_ = auVar148._8_4_ * fVar221;
                auVar112._12_4_ = auVar148._12_4_ * fVar227;
                auVar112._16_4_ = auVar148._16_4_ * fVar250;
                auVar112._20_4_ = auVar148._20_4_ * fVar329;
                auVar112._24_4_ = auVar148._24_4_ * fVar253;
                auVar112._28_4_ = auVar148._28_4_;
                auVar262._8_4_ = 0x3f800000;
                auVar262._0_8_ = &DAT_3f8000003f800000;
                auVar262._12_4_ = 0x3f800000;
                auVar262._16_4_ = 0x3f800000;
                auVar262._20_4_ = 0x3f800000;
                auVar262._24_4_ = 0x3f800000;
                auVar262._28_4_ = 0x3f800000;
                auVar263 = ZEXT3264(auVar262);
                auVar139 = vsubps_avx(auVar262,auVar111);
                local_1a0 = vblendvps_avx(auVar139,auVar111,auVar21);
                auVar139 = vsubps_avx(auVar262,auVar112);
                _local_400 = vblendvps_avx(auVar139,auVar112,auVar21);
                auVar149 = ZEXT3264(_local_400);
                local_1c0 = auVar110;
              }
            }
            auVar327 = ZEXT3264(_local_760);
            auVar118._4_4_ = fVar150;
            auVar118._0_4_ = fVar136;
            auVar118._8_4_ = fStack_6f8;
            auVar118._12_4_ = fStack_6f4;
            auVar118._16_4_ = fStack_6f0;
            auVar118._20_4_ = fStack_6ec;
            auVar118._24_4_ = fStack_6e8;
            auVar118._28_4_ = fStack_6e4;
            if ((((((((auVar165 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar165 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar165 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar165 >> 0x7f,0) != '\0') ||
                  (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar165 >> 0xbf,0) != '\0') ||
                (auVar165 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar165[0x1f] < '\0') {
              auVar139 = vsubps_avx(auVar274,auVar118);
              auVar195 = ZEXT3264(local_1a0);
              fVar136 = fVar136 + auVar139._0_4_ * local_1a0._0_4_;
              fVar150 = fVar150 + auVar139._4_4_ * local_1a0._4_4_;
              fVar246 = fStack_6f8 + auVar139._8_4_ * local_1a0._8_4_;
              fVar252 = fStack_6f4 + auVar139._12_4_ * local_1a0._12_4_;
              fVar198 = fStack_6f0 + auVar139._16_4_ * local_1a0._16_4_;
              fVar205 = fStack_6ec + auVar139._20_4_ * local_1a0._20_4_;
              fVar221 = fStack_6e8 + auVar139._24_4_ * local_1a0._24_4_;
              fVar227 = fStack_6e4 + auVar139._28_4_;
              fVar231 = local_7c8->depth_scale;
              auVar113._4_4_ = (fVar150 + fVar150) * fVar231;
              auVar113._0_4_ = (fVar136 + fVar136) * fVar231;
              auVar113._8_4_ = (fVar246 + fVar246) * fVar231;
              auVar113._12_4_ = (fVar252 + fVar252) * fVar231;
              auVar113._16_4_ = (fVar198 + fVar198) * fVar231;
              auVar113._20_4_ = (fVar205 + fVar205) * fVar231;
              auVar113._24_4_ = (fVar221 + fVar221) * fVar231;
              auVar113._28_4_ = fVar227 + fVar227;
              auVar139 = vcmpps_avx(local_1c0,auVar113,6);
              auVar149 = ZEXT3264(auVar139);
              auVar23 = auVar165 & auVar139;
              auVar275 = ZEXT3264(local_580);
              if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar23 >> 0x7f,0) != '\0') ||
                    (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar23 >> 0xbf,0) != '\0') ||
                  (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar23[0x1f] < '\0') {
                local_240 = vandps_avx(auVar139,auVar165);
                auVar149 = ZEXT3264(local_240);
                local_2e0 = (float)local_400._0_4_ + (float)local_400._0_4_ + -1.0;
                fStack_2dc = (float)local_400._4_4_ + (float)local_400._4_4_ + -1.0;
                fStack_2d8 = (float)uStack_3f8 + (float)uStack_3f8 + -1.0;
                fStack_2d4 = uStack_3f8._4_4_ + uStack_3f8._4_4_ + -1.0;
                fStack_2d0 = (float)uStack_3f0 + (float)uStack_3f0 + -1.0;
                fStack_2cc = uStack_3f0._4_4_ + uStack_3f0._4_4_ + -1.0;
                fStack_2c8 = (float)uStack_3e8 + (float)uStack_3e8 + -1.0;
                fStack_2c4 = uStack_3e8._4_4_ + uStack_3e8._4_4_ + -1.0;
                local_300 = local_1a0;
                local_2c0 = local_1c0;
                local_29c = uVar127;
                local_290 = local_7e0;
                uStack_288 = uStack_7d8;
                local_280 = local_6c0._0_8_;
                uStack_278 = local_6c0._8_8_;
                local_270 = local_6d0._0_8_;
                uStack_268 = local_6d0._8_8_;
                local_260 = local_4d0._0_8_;
                uStack_258 = local_4d0._8_8_;
                pGVar18 = (local_7f0->scene->geometries).items[local_768].ptr;
                local_400._4_4_ = fStack_2dc;
                local_400._0_4_ = local_2e0;
                uStack_3f8._0_4_ = fStack_2d8;
                uStack_3f8._4_4_ = fStack_2d4;
                uStack_3f0._0_4_ = fStack_2d0;
                uStack_3f0._4_4_ = fStack_2cc;
                auVar126 = _local_400;
                uStack_3e8._0_4_ = fStack_2c8;
                uStack_3e8._4_4_ = fStack_2c4;
                auVar139 = _local_400;
                if ((pGVar18->mask & local_7e8->mask) == 0) {
                  pRVar130 = (RTCIntersectArguments *)0x0;
                }
                else {
                  pRVar130 = local_7f0->args;
                  if ((pRVar130->filter != (RTCFilterFunctionN)0x0) ||
                     (pRVar130 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar130 >> 8),1),
                     pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    local_640 = (undefined1  [8])pGVar18;
                    local_5a0._4_28_ = auVar306._4_28_;
                    local_5a0._0_4_ = (int)p_Var133;
                    auVar174 = vshufps_avx(ZEXT416((uint)(float)(int)local_2a0),
                                           ZEXT416((uint)(float)(int)local_2a0),0);
                    local_220[0] = (auVar174._0_4_ + local_1a0._0_4_ + 0.0) * (float)local_120._0_4_
                    ;
                    local_220[1] = (auVar174._4_4_ + local_1a0._4_4_ + 1.0) * (float)local_120._4_4_
                    ;
                    local_220[2] = (auVar174._8_4_ + local_1a0._8_4_ + 2.0) * fStack_118;
                    local_220[3] = (auVar174._12_4_ + local_1a0._12_4_ + 3.0) * fStack_114;
                    fStack_210 = (auVar174._0_4_ + local_1a0._16_4_ + 4.0) * fStack_110;
                    fStack_20c = (auVar174._4_4_ + local_1a0._20_4_ + 5.0) * fStack_10c;
                    fStack_208 = (auVar174._8_4_ + local_1a0._24_4_ + 6.0) * fStack_108;
                    fStack_204 = auVar174._12_4_ + (float)local_1a0._28_4_ + 7.0;
                    uStack_3f0 = auVar126._16_8_;
                    uStack_3e8 = auVar139._24_8_;
                    local_200 = local_400;
                    uStack_1f8 = uStack_3f8;
                    uStack_1f0 = uStack_3f0;
                    uStack_1e8 = uStack_3e8;
                    local_1e0 = local_1c0;
                    iVar128 = vmovmskps_avx(local_240);
                    uVar132 = CONCAT44((int)((ulong)pRVar130 >> 0x20),iVar128);
                    lVar20 = 0;
                    if (uVar132 != 0) {
                      for (; (uVar132 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                      }
                    }
                    local_700 = (uint)lVar20;
                    uStack_6fc = (undefined4)((ulong)lVar20 >> 0x20);
                    local_720._0_8_ = uVar132;
                    _auStack_65c = auVar22._4_28_;
                    local_660 = (undefined1  [4])(int)CONCAT71((int7)(uVar132 >> 8),iVar128 != 0);
                    _local_400 = auVar139;
                    if (iVar128 != 0) {
                      _auStack_5d0 = auVar335._16_16_;
                      _local_5e0 = local_6c0;
                      _local_740 = local_6d0;
                      _auStack_670 = auVar274._16_16_;
                      _local_680 = local_4d0;
                      do {
                        lVar20 = CONCAT44(uStack_6fc,local_700);
                        local_534 = local_220[lVar20];
                        auVar149 = ZEXT464((uint)local_534);
                        local_530 = *(undefined4 *)((long)&local_200 + lVar20 * 4);
                        local_5c0._0_4_ = local_7e8->tfar;
                        local_7e8->tfar = *(float *)(local_1e0 + lVar20 * 4);
                        fVar242 = 1.0 - local_534;
                        fVar231 = local_534 * 3.0;
                        auVar263 = ZEXT464(0x3f000000);
                        auVar174 = ZEXT416((uint)((fVar242 * -2.0 * local_534 +
                                                  local_534 * local_534) * 0.5));
                        auVar174 = vshufps_avx(auVar174,auVar174,0);
                        auVar186 = ZEXT416((uint)(((fVar242 + fVar242) * (fVar231 + 2.0) +
                                                  fVar242 * fVar242 * -3.0) * 0.5));
                        auVar186 = vshufps_avx(auVar186,auVar186,0);
                        auVar169 = ZEXT416((uint)(((local_534 + local_534) * (fVar231 + -5.0) +
                                                  local_534 * fVar231) * 0.5));
                        auVar169 = vshufps_avx(auVar169,auVar169,0);
                        auVar187 = ZEXT416((uint)((local_534 * (fVar242 + fVar242) -
                                                  fVar242 * fVar242) * 0.5));
                        auVar187 = vshufps_avx(auVar187,auVar187,0);
                        auVar188._0_4_ = auVar187._0_4_ * (float)local_7e0._0_4_;
                        auVar188._4_4_ = auVar187._4_4_ * (float)local_7e0._4_4_;
                        auVar188._8_4_ = auVar187._8_4_ * (float)uStack_7d8;
                        auVar188._12_4_ = auVar187._12_4_ * uStack_7d8._4_4_;
                        auVar195 = ZEXT1664(auVar188);
                        auVar175._0_4_ =
                             auVar188._0_4_ +
                             auVar169._0_4_ * (float)local_5e0._0_4_ +
                             auVar174._0_4_ * (float)local_680._0_4_ +
                             auVar186._0_4_ * (float)local_740._0_4_;
                        auVar175._4_4_ =
                             auVar188._4_4_ +
                             auVar169._4_4_ * (float)local_5e0._4_4_ +
                             auVar174._4_4_ * (float)local_680._4_4_ +
                             auVar186._4_4_ * (float)local_740._4_4_;
                        auVar175._8_4_ =
                             auVar188._8_4_ +
                             auVar169._8_4_ * fStack_5d8 +
                             auVar174._8_4_ * fStack_678 + auVar186._8_4_ * fStack_738;
                        auVar175._12_4_ =
                             auVar188._12_4_ +
                             auVar169._12_4_ * fStack_5d4 +
                             auVar174._12_4_ * fStack_674 + auVar186._12_4_ * fStack_734;
                        local_6b0.context = local_7f0->user;
                        local_540 = vmovlps_avx(auVar175);
                        local_538 = vextractps_avx(auVar175,2);
                        local_52c = (int)local_508;
                        local_528 = (int)local_768;
                        local_524 = (local_6b0.context)->instID[0];
                        local_520 = (local_6b0.context)->instPrimID[0];
                        local_7f4 = -1;
                        local_6b0.valid = &local_7f4;
                        local_6b0.geometryUserPtr = *(void **)((long)local_640 + 0x18);
                        local_6b0.ray = (RTCRayN *)local_7e8;
                        local_6b0.hit = (RTCHitN *)&local_540;
                        local_6b0.N = 1;
                        if (*(code **)((long)local_640 + 0x48) == (code *)0x0) {
LAB_0115c9a4:
                          p_Var133 = local_7f0->args->filter;
                          if (p_Var133 == (RTCFilterFunctionN)0x0) break;
                          if (((local_7f0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                               != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             ((*(byte *)((long)local_640 + 0x3e) & 0x40) != 0)) {
                            auVar195 = ZEXT1664(auVar195._0_16_);
                            auVar263 = ZEXT1664(auVar263._0_16_);
                            auVar149._0_8_ = (*p_Var133)(&local_6b0);
                            auVar149._8_56_ = extraout_var_00;
                          }
                          if (*local_6b0.valid != 0) break;
                        }
                        else {
                          auVar195 = ZEXT1664(auVar188);
                          auVar263 = ZEXT1664(auVar263._0_16_);
                          auVar149._0_8_ = (**(code **)((long)local_640 + 0x48))(&local_6b0);
                          auVar149._8_56_ = extraout_var;
                          if (*local_6b0.valid != 0) goto LAB_0115c9a4;
                        }
                        auVar149 = ZEXT464((uint)local_5c0._0_4_);
                        local_7e8->tfar = (float)local_5c0._0_4_;
                        uVar132 = local_720._0_8_ ^ 1L << ((ulong)local_700 & 0x3f);
                        lVar20 = 0;
                        if (uVar132 != 0) {
                          for (; (uVar132 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
                          }
                        }
                        local_700 = (uint)lVar20;
                        uStack_6fc = (undefined4)((ulong)lVar20 >> 0x20);
                        local_720._0_8_ = uVar132;
                        local_660 = (undefined1  [4])
                                    (int)CONCAT71((int7)(uVar132 >> 8),uVar132 != 0);
                      } while (uVar132 != 0);
                    }
                    pRVar130 = (RTCIntersectArguments *)(ulong)(local_660[0] & 1);
                    auVar275 = ZEXT3264(local_580);
                    auVar327 = ZEXT3264(_local_760);
                    p_Var133 = (RTCFilterFunctionN)(ulong)(uint)local_5a0._0_4_;
                    fVar316 = (float)local_600._0_4_;
                    fVar321 = (float)local_600._4_4_;
                    fVar322 = fStack_5f8;
                    fVar323 = fStack_5f4;
                    fVar242 = fStack_5f0;
                    fVar244 = fStack_5ec;
                    fVar249 = fStack_5e8;
                    fVar251 = fStack_5e4;
                    fVar154 = (float)local_7a0._0_4_;
                    fVar166 = (float)local_7a0._4_4_;
                    fVar167 = fStack_798;
                    fVar168 = fStack_794;
                    fVar182 = fStack_790;
                    fVar196 = fStack_78c;
                    fVar199 = fStack_788;
                    fVar202 = fStack_784;
                    fVar232 = (float)local_7c0._0_4_;
                    fVar243 = (float)local_7c0._4_4_;
                    fVar245 = fStack_7b8;
                    fVar247 = fStack_7b4;
                    fVar208 = fStack_7b0;
                    fVar212 = fStack_7ac;
                    fVar223 = fStack_7a8;
                    fVar213 = (float)local_560._0_4_;
                    fVar222 = (float)local_560._4_4_;
                    fVar224 = fStack_558;
                    fVar226 = fStack_554;
                    fVar225 = fStack_550;
                    fVar228 = fStack_54c;
                    fVar229 = fStack_548;
                  }
                }
                p_Var133 = (RTCFilterFunctionN)
                           CONCAT71((int7)((ulong)p_Var133 >> 8),(byte)p_Var133 | (byte)pRVar130);
                goto LAB_0115c605;
              }
            }
            auVar275 = ZEXT3264(local_580);
          }
LAB_0115c605:
          lVar134 = lVar134 + 8;
        } while ((int)lVar134 < (int)uVar127);
      }
      if (((ulong)p_Var133 & 1) != 0) {
        return local_7f5;
      }
      fVar231 = local_7e8->tfar;
      auVar145._4_4_ = fVar231;
      auVar145._0_4_ = fVar231;
      auVar145._8_4_ = fVar231;
      auVar145._12_4_ = fVar231;
      auVar145._16_4_ = fVar231;
      auVar145._20_4_ = fVar231;
      auVar145._24_4_ = fVar231;
      auVar145._28_4_ = fVar231;
      auVar139 = vcmpps_avx(local_80,auVar145,2);
      uVar127 = vmovmskps_avx(auVar139);
      uVar127 = (uint)uVar135 & uVar127;
      local_7f5 = uVar127 != 0;
      context = local_7f0;
      ray = local_7e8;
      pre = local_7c8;
    } while (local_7f5);
  }
  return local_7f5;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }